

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx::CurveNiMBIntersectorK<4,4>::
     intersect_hn<embree::avx::OrientedCurve1IntersectorK<embree::HermiteCurveT,4>,embree::avx::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  undefined8 *puVar3;
  undefined4 uVar4;
  BBox1f BVar5;
  Primitive PVar6;
  uint uVar7;
  Geometry *pGVar8;
  __int_type_conflict _Var9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  long lVar12;
  __int_type_conflict _Var13;
  long lVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [16];
  undefined1 auVar58 [12];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined8 uVar61;
  undefined8 uVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  uint uVar70;
  uint uVar71;
  ulong uVar72;
  uint uVar73;
  long lVar74;
  long lVar75;
  byte bVar76;
  uint uVar77;
  float fVar118;
  vint4 bi_2;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar119;
  undefined1 auVar94 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar95 [16];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined8 extraout_XMM1_Qa;
  vint4 bi_1;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [32];
  undefined1 auVar136 [16];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 extraout_var [56];
  vint4 bi;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  float fVar191;
  float fVar210;
  float fVar211;
  vint4 ai_1;
  float fVar213;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  float fVar212;
  float fVar214;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [32];
  float fVar215;
  float fVar236;
  float fVar237;
  vint4 ai_2;
  undefined1 auVar216 [16];
  float fVar238;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  float fVar239;
  float fVar251;
  float fVar252;
  float fVar253;
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  float fVar262;
  vint4 ai;
  undefined1 auVar254 [16];
  float fVar263;
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [32];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [32];
  float fVar287;
  float fVar288;
  float fVar300;
  float fVar302;
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  float fVar304;
  float fVar305;
  float fVar306;
  undefined1 auVar298 [32];
  float fVar301;
  float fVar303;
  undefined1 auVar299 [32];
  undefined1 auVar307 [16];
  float fVar315;
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [32];
  float fVar316;
  float fVar326;
  float fVar327;
  undefined1 auVar317 [16];
  float fVar328;
  undefined1 auVar318 [16];
  undefined1 auVar324 [32];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar325 [64];
  float fVar329;
  float fVar335;
  float fVar336;
  float fVar337;
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  float fVar338;
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  float fVar339;
  float fVar340;
  float fVar341;
  float fVar342;
  float fVar343;
  float fVar351;
  float fVar352;
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  float fVar353;
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  float fVar354;
  float fVar355;
  float fVar364;
  float fVar365;
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  float fVar366;
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  float fVar367;
  float fVar368;
  float fVar374;
  float fVar376;
  vfloat4 a0;
  undefined1 auVar369 [16];
  float fVar379;
  undefined1 auVar370 [16];
  float fVar375;
  float fVar377;
  float fVar380;
  undefined1 auVar371 [16];
  float fVar378;
  undefined1 auVar372 [16];
  undefined1 auVar373 [64];
  undefined1 local_608 [8];
  float fStack_600;
  float fStack_5fc;
  undefined1 local_5e8 [8];
  float fStack_5e0;
  float fStack_5dc;
  float local_5c8;
  float fStack_5c4;
  float fStack_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float local_5a8;
  float fStack_5a4;
  float fStack_5a0;
  float fStack_59c;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  float local_528;
  float fStack_524;
  float fStack_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float local_508;
  float fStack_504;
  float fStack_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float local_468;
  float fStack_464;
  float fStack_460;
  float fStack_45c;
  undefined1 local_448 [16];
  undefined1 (*local_438) [16];
  Primitive *local_430;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  undefined8 local_398;
  undefined8 uStack_390;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  vfloat_impl<4> p03;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  BBox1f cu_stack [4];
  RTCHitN local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined1 local_1c8 [16];
  uint local_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint uStack_1a8;
  uint uStack_1a4;
  uint uStack_1a0;
  uint uStack_19c;
  undefined1 local_198 [32];
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  BBox1f cv_stack [4];
  undefined1 auVar261 [32];
  undefined1 auVar363 [32];
  
  PVar6 = prim[1];
  uVar72 = (ulong)(byte)PVar6;
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 4 + 6)));
  lVar74 = uVar72 * 0x25;
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 5 + 6)));
  auVar126 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 6 + 6)));
  auVar289 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 0xf + 6)));
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + 6)));
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 0x11 + 6)));
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 0x1a + 6)));
  auVar80 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 0x1b + 6)));
  auVar121 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 0x1c + 6)));
  auVar89 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar89 = vinsertps_avx(auVar89,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar125 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar125 = vinsertps_avx(auVar125,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar191 = *(float *)(prim + lVar74 + 0x12);
  auVar89 = vsubps_avx(auVar89,*(undefined1 (*) [16])(prim + lVar74 + 6));
  auVar99._0_4_ = fVar191 * auVar89._0_4_;
  auVar99._4_4_ = fVar191 * auVar89._4_4_;
  auVar99._8_4_ = fVar191 * auVar89._8_4_;
  auVar99._12_4_ = fVar191 * auVar89._12_4_;
  auVar356._0_4_ = fVar191 * auVar125._0_4_;
  auVar356._4_4_ = fVar191 * auVar125._4_4_;
  auVar356._8_4_ = fVar191 * auVar125._8_4_;
  auVar356._12_4_ = fVar191 * auVar125._12_4_;
  auVar16 = vcvtdq2ps_avx(auVar18);
  auVar202 = vcvtdq2ps_avx(auVar19);
  auVar17 = vcvtdq2ps_avx(auVar126);
  auVar88 = vcvtdq2ps_avx(auVar289);
  auVar268 = vcvtdq2ps_avx(auVar20);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar121 = vcvtdq2ps_avx(auVar121);
  auVar89 = vshufps_avx(auVar356,auVar356,0);
  auVar125 = vshufps_avx(auVar356,auVar356,0x55);
  auVar18 = vshufps_avx(auVar356,auVar356,0xaa);
  fVar239 = auVar18._0_4_;
  fVar251 = auVar18._4_4_;
  fVar252 = auVar18._8_4_;
  fVar253 = auVar18._12_4_;
  fVar191 = auVar125._0_4_;
  fVar210 = auVar125._4_4_;
  fVar211 = auVar125._8_4_;
  fVar213 = auVar125._12_4_;
  fVar215 = auVar89._0_4_;
  fVar236 = auVar89._4_4_;
  fVar237 = auVar89._8_4_;
  fVar238 = auVar89._12_4_;
  auVar279._0_4_ = fVar215 * auVar16._0_4_ + auVar202._0_4_ * fVar191 + fVar239 * auVar17._0_4_;
  auVar279._4_4_ = fVar236 * auVar16._4_4_ + auVar202._4_4_ * fVar210 + fVar251 * auVar17._4_4_;
  auVar279._8_4_ = fVar237 * auVar16._8_4_ + auVar202._8_4_ * fVar211 + fVar252 * auVar17._8_4_;
  auVar279._12_4_ = fVar238 * auVar16._12_4_ + auVar202._12_4_ * fVar213 + fVar253 * auVar17._12_4_;
  auVar344._0_4_ = fVar215 * auVar88._0_4_ + fVar191 * auVar268._0_4_ + fVar239 * auVar78._0_4_;
  auVar344._4_4_ = fVar236 * auVar88._4_4_ + fVar210 * auVar268._4_4_ + fVar251 * auVar78._4_4_;
  auVar344._8_4_ = fVar237 * auVar88._8_4_ + fVar211 * auVar268._8_4_ + fVar252 * auVar78._8_4_;
  auVar344._12_4_ = fVar238 * auVar88._12_4_ + fVar213 * auVar268._12_4_ + fVar253 * auVar78._12_4_;
  auVar150._0_4_ = fVar215 * auVar79._0_4_ + fVar239 * auVar121._0_4_ + fVar191 * auVar80._0_4_;
  auVar150._4_4_ = fVar236 * auVar79._4_4_ + fVar251 * auVar121._4_4_ + fVar210 * auVar80._4_4_;
  auVar150._8_4_ = fVar237 * auVar79._8_4_ + fVar252 * auVar121._8_4_ + fVar211 * auVar80._8_4_;
  auVar150._12_4_ = fVar238 * auVar79._12_4_ + fVar253 * auVar121._12_4_ + fVar213 * auVar80._12_4_;
  auVar369._8_4_ = 0x7fffffff;
  auVar369._0_8_ = 0x7fffffff7fffffff;
  auVar369._12_4_ = 0x7fffffff;
  auVar89 = vandps_avx(auVar279,auVar369);
  auVar357._8_4_ = 0x219392ef;
  auVar357._0_8_ = 0x219392ef219392ef;
  auVar357._12_4_ = 0x219392ef;
  auVar89 = vcmpps_avx(auVar89,auVar357,1);
  auVar126 = vblendvps_avx(auVar279,auVar357,auVar89);
  auVar89 = vandps_avx(auVar344,auVar369);
  auVar89 = vcmpps_avx(auVar89,auVar357,1);
  auVar289 = vblendvps_avx(auVar344,auVar357,auVar89);
  auVar89 = vandps_avx(auVar369,auVar150);
  auVar89 = vcmpps_avx(auVar89,auVar357,1);
  auVar20 = vblendvps_avx(auVar150,auVar357,auVar89);
  auVar89 = vshufps_avx(auVar99,auVar99,0x55);
  auVar125 = vshufps_avx(auVar99,auVar99,0xaa);
  fVar239 = auVar125._0_4_;
  fVar251 = auVar125._4_4_;
  fVar252 = auVar125._8_4_;
  fVar253 = auVar125._12_4_;
  fVar215 = auVar89._0_4_;
  fVar236 = auVar89._4_4_;
  fVar237 = auVar89._8_4_;
  fVar238 = auVar89._12_4_;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + uVar72 * 7 + 6);
  auVar89 = vpmovsxwd_avx(auVar89);
  auVar125._8_8_ = 0;
  auVar125._0_8_ = *(ulong *)(prim + uVar72 * 0xb + 6);
  auVar125 = vpmovsxwd_avx(auVar125);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar72 * 9 + 6);
  auVar18 = vpmovsxwd_avx(auVar18);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar72 * 0xd + 6);
  auVar19 = vpmovsxwd_avx(auVar19);
  auVar120 = vshufps_avx(auVar99,auVar99,0);
  fVar191 = auVar120._0_4_;
  fVar210 = auVar120._4_4_;
  fVar211 = auVar120._8_4_;
  fVar213 = auVar120._12_4_;
  auVar157._0_4_ = fVar215 * auVar202._0_4_ + fVar239 * auVar17._0_4_ + fVar191 * auVar16._0_4_;
  auVar157._4_4_ = fVar236 * auVar202._4_4_ + fVar251 * auVar17._4_4_ + fVar210 * auVar16._4_4_;
  auVar157._8_4_ = fVar237 * auVar202._8_4_ + fVar252 * auVar17._8_4_ + fVar211 * auVar16._8_4_;
  auVar157._12_4_ = fVar238 * auVar202._12_4_ + fVar253 * auVar17._12_4_ + fVar213 * auVar16._12_4_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar72 * 0x12 + 6);
  auVar16 = vpmovsxwd_avx(auVar16);
  auVar120._0_4_ = fVar239 * auVar78._0_4_ + fVar215 * auVar268._0_4_ + fVar191 * auVar88._0_4_;
  auVar120._4_4_ = fVar251 * auVar78._4_4_ + fVar236 * auVar268._4_4_ + fVar210 * auVar88._4_4_;
  auVar120._8_4_ = fVar252 * auVar78._8_4_ + fVar237 * auVar268._8_4_ + fVar211 * auVar88._8_4_;
  auVar120._12_4_ = fVar253 * auVar78._12_4_ + fVar238 * auVar268._12_4_ + fVar213 * auVar88._12_4_;
  auVar202._8_8_ = 0;
  auVar202._0_8_ = *(ulong *)(prim + uVar72 * 0x16 + 6);
  auVar202 = vpmovsxwd_avx(auVar202);
  auVar78._0_4_ = fVar239 * auVar121._0_4_ + fVar215 * auVar80._0_4_ + fVar191 * auVar79._0_4_;
  auVar78._4_4_ = fVar251 * auVar121._4_4_ + fVar236 * auVar80._4_4_ + fVar210 * auVar79._4_4_;
  auVar78._8_4_ = fVar252 * auVar121._8_4_ + fVar237 * auVar80._8_4_ + fVar211 * auVar79._8_4_;
  auVar78._12_4_ = fVar253 * auVar121._12_4_ + fVar238 * auVar80._12_4_ + fVar213 * auVar79._12_4_;
  auVar17 = vrcpps_avx(auVar126);
  fVar191 = auVar17._0_4_;
  auVar216._0_4_ = auVar126._0_4_ * fVar191;
  fVar210 = auVar17._4_4_;
  auVar216._4_4_ = auVar126._4_4_ * fVar210;
  fVar211 = auVar17._8_4_;
  auVar216._8_4_ = auVar126._8_4_ * fVar211;
  fVar213 = auVar17._12_4_;
  auVar216._12_4_ = auVar126._12_4_ * fVar213;
  auVar280._8_4_ = 0x3f800000;
  auVar280._0_8_ = 0x3f8000003f800000;
  auVar280._12_4_ = 0x3f800000;
  auVar126 = vsubps_avx(auVar280,auVar216);
  fVar191 = fVar191 + fVar191 * auVar126._0_4_;
  fVar210 = fVar210 + fVar210 * auVar126._4_4_;
  fVar211 = fVar211 + fVar211 * auVar126._8_4_;
  fVar213 = fVar213 + fVar213 * auVar126._12_4_;
  auVar126 = vrcpps_avx(auVar289);
  fVar215 = auVar126._0_4_;
  auVar174._0_4_ = fVar215 * auVar289._0_4_;
  fVar236 = auVar126._4_4_;
  auVar174._4_4_ = fVar236 * auVar289._4_4_;
  fVar237 = auVar126._8_4_;
  auVar174._8_4_ = fVar237 * auVar289._8_4_;
  fVar238 = auVar126._12_4_;
  auVar174._12_4_ = fVar238 * auVar289._12_4_;
  auVar126 = vsubps_avx(auVar280,auVar174);
  fVar215 = fVar215 + fVar215 * auVar126._0_4_;
  fVar236 = fVar236 + fVar236 * auVar126._4_4_;
  fVar237 = fVar237 + fVar237 * auVar126._8_4_;
  fVar238 = fVar238 + fVar238 * auVar126._12_4_;
  auVar126 = vrcpps_avx(auVar20);
  fVar239 = auVar126._0_4_;
  auVar138._0_4_ = fVar239 * auVar20._0_4_;
  fVar251 = auVar126._4_4_;
  auVar138._4_4_ = fVar251 * auVar20._4_4_;
  fVar252 = auVar126._8_4_;
  auVar138._8_4_ = fVar252 * auVar20._8_4_;
  fVar253 = auVar126._12_4_;
  auVar138._12_4_ = fVar253 * auVar20._12_4_;
  auVar126 = vsubps_avx(auVar280,auVar138);
  fVar239 = fVar239 + fVar239 * auVar126._0_4_;
  fVar251 = fVar251 + fVar251 * auVar126._4_4_;
  fVar252 = fVar252 + fVar252 * auVar126._8_4_;
  fVar253 = fVar253 + fVar253 * auVar126._12_4_;
  auVar126._8_8_ = 0;
  auVar126._0_8_ = *(ulong *)(prim + uVar72 * 0x14 + 6);
  auVar126 = vpmovsxwd_avx(auVar126);
  auVar289 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar74 + 0x16)) *
                           *(float *)(prim + lVar74 + 0x1a)));
  auVar289 = vshufps_avx(auVar289,auVar289,0);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar125 = vcvtdq2ps_avx(auVar125);
  auVar125 = vsubps_avx(auVar125,auVar89);
  fVar315 = auVar289._0_4_;
  fVar316 = auVar289._4_4_;
  fVar326 = auVar289._8_4_;
  fVar327 = auVar289._12_4_;
  auVar139._0_4_ = fVar315 * auVar125._0_4_ + auVar89._0_4_;
  auVar139._4_4_ = fVar316 * auVar125._4_4_ + auVar89._4_4_;
  auVar139._8_4_ = fVar326 * auVar125._8_4_ + auVar89._8_4_;
  auVar139._12_4_ = fVar327 * auVar125._12_4_ + auVar89._12_4_;
  auVar89 = vcvtdq2ps_avx(auVar18);
  auVar125 = vcvtdq2ps_avx(auVar19);
  auVar125 = vsubps_avx(auVar125,auVar89);
  auVar265._0_4_ = fVar315 * auVar125._0_4_ + auVar89._0_4_;
  auVar265._4_4_ = fVar316 * auVar125._4_4_ + auVar89._4_4_;
  auVar265._8_4_ = fVar326 * auVar125._8_4_ + auVar89._8_4_;
  auVar265._12_4_ = fVar327 * auVar125._12_4_ + auVar89._12_4_;
  auVar89 = vcvtdq2ps_avx(auVar16);
  auVar125 = vcvtdq2ps_avx(auVar202);
  auVar125 = vsubps_avx(auVar125,auVar89);
  auVar345._0_4_ = fVar315 * auVar125._0_4_ + auVar89._0_4_;
  auVar345._4_4_ = fVar316 * auVar125._4_4_ + auVar89._4_4_;
  auVar345._8_4_ = fVar326 * auVar125._8_4_ + auVar89._8_4_;
  auVar345._12_4_ = fVar327 * auVar125._12_4_ + auVar89._12_4_;
  auVar89 = vcvtdq2ps_avx(auVar126);
  auVar289._8_8_ = 0;
  auVar289._0_8_ = *(ulong *)(prim + uVar72 * 0x18 + 6);
  auVar125 = vpmovsxwd_avx(auVar289);
  auVar125 = vcvtdq2ps_avx(auVar125);
  auVar125 = vsubps_avx(auVar125,auVar89);
  auVar290._0_4_ = fVar315 * auVar125._0_4_ + auVar89._0_4_;
  auVar290._4_4_ = fVar316 * auVar125._4_4_ + auVar89._4_4_;
  auVar290._8_4_ = fVar326 * auVar125._8_4_ + auVar89._8_4_;
  auVar290._12_4_ = fVar327 * auVar125._12_4_ + auVar89._12_4_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar72 * 0x1d + 6);
  auVar89 = vpmovsxwd_avx(auVar20);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar72 * 0x21 + 6);
  auVar125 = vpmovsxwd_avx(auVar17);
  auVar125 = vcvtdq2ps_avx(auVar125);
  auVar18 = vsubps_avx(auVar125,auVar89);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar72 * 0x1f + 6);
  auVar125 = vpmovsxwd_avx(auVar88);
  auVar307._0_4_ = fVar315 * auVar18._0_4_ + auVar89._0_4_;
  auVar307._4_4_ = fVar316 * auVar18._4_4_ + auVar89._4_4_;
  auVar307._8_4_ = fVar326 * auVar18._8_4_ + auVar89._8_4_;
  auVar307._12_4_ = fVar327 * auVar18._12_4_ + auVar89._12_4_;
  auVar89 = vcvtdq2ps_avx(auVar125);
  auVar268._8_8_ = 0;
  auVar268._0_8_ = *(ulong *)(prim + uVar72 * 0x23 + 6);
  auVar125 = vpmovsxwd_avx(auVar268);
  auVar125 = vcvtdq2ps_avx(auVar125);
  auVar125 = vsubps_avx(auVar125,auVar89);
  auVar317._0_4_ = fVar315 * auVar125._0_4_ + auVar89._0_4_;
  auVar317._4_4_ = fVar316 * auVar125._4_4_ + auVar89._4_4_;
  auVar317._8_4_ = fVar326 * auVar125._8_4_ + auVar89._8_4_;
  auVar317._12_4_ = fVar327 * auVar125._12_4_ + auVar89._12_4_;
  auVar89 = vsubps_avx(auVar139,auVar157);
  auVar264._0_4_ = fVar191 * auVar89._0_4_;
  auVar264._4_4_ = fVar210 * auVar89._4_4_;
  auVar264._8_4_ = fVar211 * auVar89._8_4_;
  auVar264._12_4_ = fVar213 * auVar89._12_4_;
  auVar89 = vsubps_avx(auVar265,auVar157);
  auVar158._0_4_ = fVar191 * auVar89._0_4_;
  auVar158._4_4_ = fVar210 * auVar89._4_4_;
  auVar158._8_4_ = fVar211 * auVar89._8_4_;
  auVar158._12_4_ = fVar213 * auVar89._12_4_;
  auVar89 = vsubps_avx(auVar345,auVar120);
  auVar192._0_4_ = fVar215 * auVar89._0_4_;
  auVar192._4_4_ = fVar236 * auVar89._4_4_;
  auVar192._8_4_ = fVar237 * auVar89._8_4_;
  auVar192._12_4_ = fVar238 * auVar89._12_4_;
  auVar89 = vsubps_avx(auVar290,auVar120);
  auVar121._0_4_ = fVar215 * auVar89._0_4_;
  auVar121._4_4_ = fVar236 * auVar89._4_4_;
  auVar121._8_4_ = fVar237 * auVar89._8_4_;
  auVar121._12_4_ = fVar238 * auVar89._12_4_;
  auVar89 = vsubps_avx(auVar307,auVar78);
  auVar188._0_4_ = fVar239 * auVar89._0_4_;
  auVar188._4_4_ = fVar251 * auVar89._4_4_;
  auVar188._8_4_ = fVar252 * auVar89._8_4_;
  auVar188._12_4_ = fVar253 * auVar89._12_4_;
  auVar89 = vsubps_avx(auVar317,auVar78);
  auVar79._0_4_ = fVar239 * auVar89._0_4_;
  auVar79._4_4_ = fVar251 * auVar89._4_4_;
  auVar79._8_4_ = fVar252 * auVar89._8_4_;
  auVar79._12_4_ = fVar253 * auVar89._12_4_;
  auVar89 = vpminsd_avx(auVar264,auVar158);
  auVar125 = vpminsd_avx(auVar192,auVar121);
  auVar89 = vmaxps_avx(auVar89,auVar125);
  auVar125 = vpminsd_avx(auVar188,auVar79);
  uVar4 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar291._4_4_ = uVar4;
  auVar291._0_4_ = uVar4;
  auVar291._8_4_ = uVar4;
  auVar291._12_4_ = uVar4;
  auVar125 = vmaxps_avx(auVar125,auVar291);
  auVar89 = vmaxps_avx(auVar89,auVar125);
  auVar240._0_4_ = auVar89._0_4_ * 0.99999964;
  auVar240._4_4_ = auVar89._4_4_ * 0.99999964;
  auVar240._8_4_ = auVar89._8_4_ * 0.99999964;
  auVar240._12_4_ = auVar89._12_4_ * 0.99999964;
  auVar89 = vpmaxsd_avx(auVar264,auVar158);
  auVar125 = vpmaxsd_avx(auVar192,auVar121);
  auVar89 = vminps_avx(auVar89,auVar125);
  auVar125 = vpmaxsd_avx(auVar188,auVar79);
  uVar4 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar159._4_4_ = uVar4;
  auVar159._0_4_ = uVar4;
  auVar159._8_4_ = uVar4;
  auVar159._12_4_ = uVar4;
  auVar125 = vminps_avx(auVar125,auVar159);
  auVar89 = vminps_avx(auVar89,auVar125);
  auVar80._0_4_ = auVar89._0_4_ * 1.0000004;
  auVar80._4_4_ = auVar89._4_4_ * 1.0000004;
  auVar80._8_4_ = auVar89._8_4_ * 1.0000004;
  auVar80._12_4_ = auVar89._12_4_ * 1.0000004;
  auVar89 = vpshufd_avx(ZEXT116((byte)PVar6),0);
  auVar125 = vpcmpgtd_avx(auVar89,_DAT_01f4ad30);
  auVar89 = vcmpps_avx(auVar240,auVar80,2);
  auVar89 = vandps_avx(auVar89,auVar125);
  uVar77 = vmovmskps_avx(auVar89);
  auVar112._16_16_ = mm_lookupmask_ps._240_16_;
  auVar112._0_16_ = mm_lookupmask_ps._240_16_;
  local_198 = vblendps_avx(auVar112,ZEXT832(0) << 0x20,0x80);
  local_438 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  auVar58 = ZEXT412(0);
  local_430 = prim;
LAB_00917276:
  auVar60._12_4_ = 0;
  auVar60._0_12_ = auVar58;
  if (uVar77 == 0) {
    return;
  }
  lVar74 = 0;
  if (uVar77 != 0) {
    for (; (uVar77 >> lVar74 & 1) == 0; lVar74 = lVar74 + 1) {
    }
  }
  uVar71 = *(uint *)(local_430 + 2);
  pGVar8 = (context->scene->geometries).items[uVar71].ptr;
  fVar191 = (pGVar8->time_range).lower;
  fVar191 = pGVar8->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar191) / ((pGVar8->time_range).upper - fVar191));
  auVar89 = vroundss_avx(ZEXT416((uint)fVar191),ZEXT416((uint)fVar191),9);
  auVar89 = vminss_avx(auVar89,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
  auVar18 = vmaxss_avx(auVar60 << 0x20,auVar89);
  uVar7 = *(uint *)(local_430 + lVar74 * 4 + 6);
  uVar72 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           (ulong)uVar7 *
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var9 = pGVar8[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar75 = (long)(int)auVar18._0_4_ * 0x38;
  lVar10 = *(long *)(_Var9 + 0x10 + lVar75);
  pfVar1 = (float *)(*(long *)(_Var9 + lVar75) + lVar10 * uVar72);
  fVar210 = *pfVar1;
  fVar211 = pfVar1[1];
  fVar213 = pfVar1[2];
  fVar215 = pfVar1[3];
  lVar74 = uVar72 + 1;
  auVar89 = *(undefined1 (*) [16])(*(long *)(_Var9 + lVar75) + lVar10 * lVar74);
  p_Var11 = pGVar8[4].occlusionFilterN;
  lVar10 = *(long *)&pGVar8[4].fnumTimeSegments;
  lVar12 = *(long *)(lVar10 + 0x10 + lVar75);
  pfVar1 = (float *)(*(long *)(lVar10 + lVar75) + lVar12 * uVar72);
  fVar236 = *pfVar1;
  fVar237 = pfVar1[1];
  fVar238 = pfVar1[2];
  fVar239 = pfVar1[3];
  auVar125 = *(undefined1 (*) [16])(*(long *)(lVar10 + lVar75) + lVar12 * lVar74);
  _Var13 = pGVar8[5].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  pfVar1 = (float *)(*(long *)(p_Var11 + lVar75) + *(long *)(p_Var11 + lVar75 + 0x10) * uVar72);
  pfVar2 = (float *)(*(long *)(p_Var11 + lVar75) + *(long *)(p_Var11 + lVar75 + 0x10) * lVar74);
  auVar266._0_4_ = *pfVar2 * 0.33333334;
  auVar266._4_4_ = pfVar2[1] * 0.33333334;
  auVar266._8_4_ = pfVar2[2] * 0.33333334;
  auVar266._12_4_ = pfVar2[3] * 0.33333334;
  lVar12 = *(long *)(_Var13 + 0x10 + lVar75);
  pfVar2 = (float *)(*(long *)(_Var13 + lVar75) + lVar12 * uVar72);
  fVar191 = fVar191 - auVar18._0_4_;
  fVar251 = fVar210 + *pfVar1 * 0.33333334;
  fVar252 = fVar211 + pfVar1[1] * 0.33333334;
  fVar253 = fVar213 + pfVar1[2] * 0.33333334;
  fVar315 = fVar215 + pfVar1[3] * 0.33333334;
  auVar18 = vsubps_avx(auVar89,auVar266);
  pfVar1 = (float *)(*(long *)(_Var13 + lVar75) + lVar12 * lVar74);
  auVar81._0_4_ = *pfVar1 * 0.33333334;
  auVar81._4_4_ = pfVar1[1] * 0.33333334;
  auVar81._8_4_ = pfVar1[2] * 0.33333334;
  auVar81._12_4_ = pfVar1[3] * 0.33333334;
  fVar316 = *pfVar2 * 0.33333334 + fVar236;
  fVar326 = pfVar2[1] * 0.33333334 + fVar237;
  fVar327 = pfVar2[2] * 0.33333334 + fVar238;
  fVar328 = pfVar2[3] * 0.33333334 + fVar239;
  auVar19 = vsubps_avx(auVar125,auVar81);
  fVar212 = auVar89._0_4_;
  fVar262 = auVar89._4_4_;
  fVar214 = auVar89._8_4_;
  fVar263 = auVar89._12_4_;
  fVar329 = auVar18._0_4_ * 0.0;
  fVar335 = auVar18._4_4_ * 0.0;
  fVar336 = auVar18._8_4_ * 0.0;
  fVar337 = auVar18._12_4_ * 0.0;
  fVar355 = fVar329 + fVar212 * 0.0;
  fVar364 = fVar335 + fVar262 * 0.0;
  fVar365 = fVar336 + fVar214 * 0.0;
  fVar366 = fVar337 + fVar263 * 0.0;
  auVar82._0_4_ = fVar355 + fVar251 * 3.0;
  auVar82._4_4_ = fVar364 + fVar252 * 3.0;
  auVar82._8_4_ = fVar365 + fVar253 * 3.0;
  auVar82._12_4_ = fVar366 + fVar315 * 3.0;
  auVar122._0_4_ = fVar210 * 3.0;
  auVar122._4_4_ = fVar211 * 3.0;
  auVar122._8_4_ = fVar213 * 3.0;
  auVar122._12_4_ = fVar215 * 3.0;
  auVar289 = vsubps_avx(auVar82,auVar122);
  fVar287 = auVar125._0_4_;
  fVar118 = auVar125._4_4_;
  fVar119 = auVar125._8_4_;
  fVar300 = auVar125._12_4_;
  fVar343 = auVar19._0_4_ * 0.0;
  fVar351 = auVar19._4_4_ * 0.0;
  fVar352 = auVar19._8_4_ * 0.0;
  fVar353 = auVar19._12_4_ * 0.0;
  fVar367 = fVar343 + fVar287 * 0.0;
  fVar374 = fVar351 + fVar118 * 0.0;
  fVar376 = fVar352 + fVar119 * 0.0;
  fVar379 = fVar353 + fVar300 * 0.0;
  auVar83._0_4_ = fVar367 + fVar316 * 3.0;
  auVar83._4_4_ = fVar374 + fVar326 * 3.0;
  auVar83._8_4_ = fVar376 + fVar327 * 3.0;
  auVar83._12_4_ = fVar379 + fVar328 * 3.0;
  auVar281._0_4_ = fVar236 * 3.0;
  auVar281._4_4_ = fVar237 * 3.0;
  auVar281._8_4_ = fVar238 * 3.0;
  auVar281._12_4_ = fVar239 * 3.0;
  auVar16 = vsubps_avx(auVar83,auVar281);
  lVar12 = *(long *)(_Var9 + 0x38 + lVar75);
  lVar14 = *(long *)(_Var9 + 0x48 + lVar75);
  puVar3 = (undefined8 *)(lVar12 + lVar14 * uVar72);
  uVar61 = *puVar3;
  uVar62 = puVar3[1];
  fVar251 = fVar251 * 0.0;
  fVar252 = fVar252 * 0.0;
  fVar253 = fVar253 * 0.0;
  fVar315 = fVar315 * 0.0;
  auVar358._0_4_ = fVar355 + fVar251 + fVar210;
  auVar358._4_4_ = fVar364 + fVar252 + fVar211;
  auVar358._8_4_ = fVar365 + fVar253 + fVar213;
  auVar358._12_4_ = fVar366 + fVar315 + fVar215;
  fVar316 = fVar316 * 0.0;
  fVar326 = fVar326 * 0.0;
  fVar327 = fVar327 * 0.0;
  fVar328 = fVar328 * 0.0;
  auVar370._0_4_ = fVar367 + fVar316 + fVar236;
  auVar370._4_4_ = fVar374 + fVar326 + fVar237;
  auVar370._8_4_ = fVar376 + fVar327 + fVar238;
  auVar370._12_4_ = fVar379 + fVar328 + fVar239;
  auVar160._0_4_ = fVar210 * 0.0;
  auVar160._4_4_ = fVar211 * 0.0;
  auVar160._8_4_ = fVar213 * 0.0;
  auVar160._12_4_ = fVar215 * 0.0;
  auVar308._0_4_ = fVar329 + fVar212 + fVar251 + auVar160._0_4_;
  auVar308._4_4_ = fVar335 + fVar262 + fVar252 + auVar160._4_4_;
  auVar308._8_4_ = fVar336 + fVar214 + fVar253 + auVar160._8_4_;
  auVar308._12_4_ = fVar337 + fVar263 + fVar315 + auVar160._12_4_;
  auVar193._0_4_ = fVar212 * 3.0;
  auVar193._4_4_ = fVar262 * 3.0;
  auVar193._8_4_ = fVar214 * 3.0;
  auVar193._12_4_ = fVar263 * 3.0;
  auVar267._0_4_ = auVar18._0_4_ * 3.0;
  auVar267._4_4_ = auVar18._4_4_ * 3.0;
  auVar267._8_4_ = auVar18._8_4_ * 3.0;
  auVar267._12_4_ = auVar18._12_4_ * 3.0;
  auVar89 = vsubps_avx(auVar193,auVar267);
  auVar84._0_4_ = fVar251 + auVar89._0_4_;
  auVar84._4_4_ = fVar252 + auVar89._4_4_;
  auVar84._8_4_ = fVar253 + auVar89._8_4_;
  auVar84._12_4_ = fVar315 + auVar89._12_4_;
  auVar20 = vsubps_avx(auVar84,auVar160);
  auVar161._0_4_ = fVar236 * 0.0;
  auVar161._4_4_ = fVar237 * 0.0;
  auVar161._8_4_ = fVar238 * 0.0;
  auVar161._12_4_ = fVar239 * 0.0;
  auVar85._0_4_ = auVar161._0_4_ + fVar316 + fVar343 + fVar287;
  auVar85._4_4_ = auVar161._4_4_ + fVar326 + fVar351 + fVar118;
  auVar85._8_4_ = auVar161._8_4_ + fVar327 + fVar352 + fVar119;
  auVar85._12_4_ = auVar161._12_4_ + fVar328 + fVar353 + fVar300;
  auVar194._0_4_ = fVar287 * 3.0;
  auVar194._4_4_ = fVar118 * 3.0;
  auVar194._8_4_ = fVar119 * 3.0;
  auVar194._12_4_ = fVar300 * 3.0;
  auVar217._0_4_ = auVar19._0_4_ * 3.0;
  auVar217._4_4_ = auVar19._4_4_ * 3.0;
  auVar217._8_4_ = auVar19._8_4_ * 3.0;
  auVar217._12_4_ = auVar19._12_4_ * 3.0;
  auVar89 = vsubps_avx(auVar194,auVar217);
  auVar123._0_4_ = fVar316 + auVar89._0_4_;
  auVar123._4_4_ = fVar326 + auVar89._4_4_;
  auVar123._8_4_ = fVar327 + auVar89._8_4_;
  auVar123._12_4_ = fVar328 + auVar89._12_4_;
  auVar202 = vsubps_avx(auVar123,auVar161);
  auVar89 = vshufps_avx(auVar289,auVar289,0xc9);
  auVar125 = vshufps_avx(auVar370,auVar370,0xc9);
  fVar118 = auVar289._0_4_;
  auVar195._0_4_ = fVar118 * auVar125._0_4_;
  fVar119 = auVar289._4_4_;
  auVar195._4_4_ = fVar119 * auVar125._4_4_;
  fVar335 = auVar289._8_4_;
  auVar195._8_4_ = fVar335 * auVar125._8_4_;
  fVar336 = auVar289._12_4_;
  auVar195._12_4_ = fVar336 * auVar125._12_4_;
  auVar218._0_4_ = auVar370._0_4_ * auVar89._0_4_;
  auVar218._4_4_ = auVar370._4_4_ * auVar89._4_4_;
  auVar218._8_4_ = auVar370._8_4_ * auVar89._8_4_;
  auVar218._12_4_ = auVar370._12_4_ * auVar89._12_4_;
  auVar125 = vsubps_avx(auVar218,auVar195);
  auVar18 = vshufps_avx(auVar125,auVar125,0xc9);
  auVar125 = vshufps_avx(auVar16,auVar16,0xc9);
  auVar196._0_4_ = fVar118 * auVar125._0_4_;
  auVar196._4_4_ = fVar119 * auVar125._4_4_;
  auVar196._8_4_ = fVar335 * auVar125._8_4_;
  auVar196._12_4_ = fVar336 * auVar125._12_4_;
  auVar162._0_4_ = auVar89._0_4_ * auVar16._0_4_;
  auVar162._4_4_ = auVar89._4_4_ * auVar16._4_4_;
  auVar162._8_4_ = auVar89._8_4_ * auVar16._8_4_;
  auVar162._12_4_ = auVar89._12_4_ * auVar16._12_4_;
  auVar89 = vsubps_avx(auVar162,auVar196);
  auVar19 = vshufps_avx(auVar89,auVar89,0xc9);
  auVar125 = vshufps_avx(auVar20,auVar20,0xc9);
  auVar89 = vshufps_avx(auVar85,auVar85,0xc9);
  fVar343 = auVar20._0_4_;
  auVar163._0_4_ = fVar343 * auVar89._0_4_;
  fVar352 = auVar20._4_4_;
  auVar163._4_4_ = fVar352 * auVar89._4_4_;
  fVar355 = auVar20._8_4_;
  auVar163._8_4_ = fVar355 * auVar89._8_4_;
  fVar365 = auVar20._12_4_;
  auVar163._12_4_ = fVar365 * auVar89._12_4_;
  auVar86._0_4_ = auVar125._0_4_ * auVar85._0_4_;
  auVar86._4_4_ = auVar125._4_4_ * auVar85._4_4_;
  auVar86._8_4_ = auVar125._8_4_ * auVar85._8_4_;
  auVar86._12_4_ = auVar125._12_4_ * auVar85._12_4_;
  auVar89 = vsubps_avx(auVar86,auVar163);
  auVar16 = vshufps_avx(auVar89,auVar89,0xc9);
  auVar89 = vshufps_avx(auVar202,auVar202,0xc9);
  auVar87._0_4_ = fVar343 * auVar89._0_4_;
  auVar87._4_4_ = fVar352 * auVar89._4_4_;
  auVar87._8_4_ = fVar355 * auVar89._8_4_;
  auVar87._12_4_ = fVar365 * auVar89._12_4_;
  auVar89 = vdpps_avx(auVar18,auVar18,0x7f);
  auVar124._0_4_ = auVar125._0_4_ * auVar202._0_4_;
  auVar124._4_4_ = auVar125._4_4_ * auVar202._4_4_;
  auVar124._8_4_ = auVar125._8_4_ * auVar202._8_4_;
  auVar124._12_4_ = auVar125._12_4_ * auVar202._12_4_;
  auVar126 = vsubps_avx(auVar124,auVar87);
  fVar211 = auVar89._0_4_;
  auVar88 = ZEXT416((uint)fVar211);
  auVar125 = vrsqrtss_avx(auVar88,auVar88);
  fVar210 = auVar125._0_4_;
  auVar125 = ZEXT416((uint)(fVar210 * 1.5 - fVar211 * 0.5 * fVar210 * fVar210 * fVar210));
  auVar202 = vshufps_avx(auVar125,auVar125,0);
  fVar236 = auVar202._0_4_ * auVar18._0_4_;
  fVar237 = auVar202._4_4_ * auVar18._4_4_;
  fVar238 = auVar202._8_4_ * auVar18._8_4_;
  fVar239 = auVar202._12_4_ * auVar18._12_4_;
  auVar125 = vdpps_avx(auVar18,auVar19,0x7f);
  auVar89 = vshufps_avx(auVar89,auVar89,0);
  auVar254._0_4_ = auVar89._0_4_ * auVar19._0_4_;
  auVar254._4_4_ = auVar89._4_4_ * auVar19._4_4_;
  auVar254._8_4_ = auVar89._8_4_ * auVar19._8_4_;
  auVar254._12_4_ = auVar89._12_4_ * auVar19._12_4_;
  auVar89 = vshufps_avx(auVar125,auVar125,0);
  auVar241._0_4_ = auVar89._0_4_ * auVar18._0_4_;
  auVar241._4_4_ = auVar89._4_4_ * auVar18._4_4_;
  auVar241._8_4_ = auVar89._8_4_ * auVar18._8_4_;
  auVar241._12_4_ = auVar89._12_4_ * auVar18._12_4_;
  auVar17 = vsubps_avx(auVar254,auVar241);
  auVar89 = vrcpss_avx(auVar88,auVar88);
  auVar89 = ZEXT416((uint)(auVar89._0_4_ * (2.0 - fVar211 * auVar89._0_4_)));
  auVar18 = vshufps_avx(auVar89,auVar89,0);
  auVar125 = vdpps_avx(auVar16,auVar16,0x7f);
  fVar251 = auVar125._0_4_;
  auVar268 = ZEXT416((uint)fVar251);
  auVar89 = vrsqrtss_avx(auVar268,auVar268);
  fVar210 = auVar89._0_4_;
  auVar89 = *(undefined1 (*) [16])(lVar12 + lVar14 * lVar74);
  pfVar1 = (float *)(*(long *)(p_Var11 + lVar75 + 0x38) +
                    *(long *)(p_Var11 + lVar75 + 0x48) * uVar72);
  auVar19 = vshufps_avx(auVar126,auVar126,0xc9);
  auVar126 = ZEXT416((uint)(fVar210 * 1.5 - fVar210 * fVar210 * fVar251 * 0.5 * fVar210));
  auVar126 = vshufps_avx(auVar126,auVar126,0);
  auVar125 = vshufps_avx(auVar125,auVar125,0);
  auVar346._0_4_ = auVar125._0_4_ * auVar19._0_4_;
  auVar346._4_4_ = auVar125._4_4_ * auVar19._4_4_;
  auVar346._8_4_ = auVar125._8_4_ * auVar19._8_4_;
  auVar346._12_4_ = auVar125._12_4_ * auVar19._12_4_;
  auVar125 = vdpps_avx(auVar16,auVar19,0x7f);
  auVar125 = vshufps_avx(auVar125,auVar125,0);
  auVar219._0_4_ = auVar125._0_4_ * auVar16._0_4_;
  auVar219._4_4_ = auVar125._4_4_ * auVar16._4_4_;
  auVar219._8_4_ = auVar125._8_4_ * auVar16._8_4_;
  auVar219._12_4_ = auVar125._12_4_ * auVar16._12_4_;
  fVar210 = auVar16._0_4_ * auVar126._0_4_;
  fVar211 = auVar16._4_4_ * auVar126._4_4_;
  fVar213 = auVar16._8_4_ * auVar126._8_4_;
  fVar215 = auVar16._12_4_ * auVar126._12_4_;
  auVar88 = vsubps_avx(auVar346,auVar219);
  auVar125 = vrcpss_avx(auVar268,auVar268);
  auVar125 = ZEXT416((uint)(auVar125._0_4_ * (2.0 - fVar251 * auVar125._0_4_)));
  auVar125 = vshufps_avx(auVar125,auVar125,0);
  auVar19 = vshufps_avx(auVar358,auVar358,0xff);
  auVar347._0_4_ = auVar19._0_4_ * fVar236;
  auVar347._4_4_ = auVar19._4_4_ * fVar237;
  auVar347._8_4_ = auVar19._8_4_ * fVar238;
  auVar347._12_4_ = auVar19._12_4_ * fVar239;
  auVar268 = vsubps_avx(auVar358,auVar347);
  auVar16 = vshufps_avx(auVar289,auVar289,0xff);
  auVar197._0_4_ =
       auVar16._0_4_ * fVar236 + auVar19._0_4_ * auVar202._0_4_ * auVar18._0_4_ * auVar17._0_4_;
  auVar197._4_4_ =
       auVar16._4_4_ * fVar237 + auVar19._4_4_ * auVar202._4_4_ * auVar18._4_4_ * auVar17._4_4_;
  auVar197._8_4_ =
       auVar16._8_4_ * fVar238 + auVar19._8_4_ * auVar202._8_4_ * auVar18._8_4_ * auVar17._8_4_;
  auVar197._12_4_ =
       auVar16._12_4_ * fVar239 + auVar19._12_4_ * auVar202._12_4_ * auVar18._12_4_ * auVar17._12_4_
  ;
  auVar289 = vsubps_avx(auVar289,auVar197);
  auVar18 = vshufps_avx(auVar308,auVar308,0xff);
  auVar292._0_4_ = auVar18._0_4_ * fVar210;
  auVar292._4_4_ = auVar18._4_4_ * fVar211;
  auVar292._8_4_ = auVar18._8_4_ * fVar213;
  auVar292._12_4_ = auVar18._12_4_ * fVar215;
  auVar17 = vsubps_avx(auVar308,auVar292);
  auVar19 = vshufps_avx(auVar20,auVar20,0xff);
  auVar127._0_4_ =
       auVar19._0_4_ * fVar210 + auVar18._0_4_ * auVar126._0_4_ * auVar88._0_4_ * auVar125._0_4_;
  auVar127._4_4_ =
       auVar19._4_4_ * fVar211 + auVar18._4_4_ * auVar126._4_4_ * auVar88._4_4_ * auVar125._4_4_;
  auVar127._8_4_ =
       auVar19._8_4_ * fVar213 + auVar18._8_4_ * auVar126._8_4_ * auVar88._8_4_ * auVar125._8_4_;
  auVar127._12_4_ =
       auVar19._12_4_ * fVar215 +
       auVar18._12_4_ * auVar126._12_4_ * auVar88._12_4_ * auVar125._12_4_;
  auVar126 = vsubps_avx(auVar20,auVar127);
  p01.field_0.v[1] = auVar308._4_4_ + auVar292._4_4_;
  p01.field_0.v[0] = auVar308._0_4_ + auVar292._0_4_;
  p01.field_0.v[2] = auVar308._8_4_ + auVar292._8_4_;
  p01.field_0.v[3] = auVar308._12_4_ + auVar292._12_4_;
  local_5e8._0_4_ = (undefined4)uVar61;
  local_5e8._4_4_ = (undefined4)((ulong)uVar61 >> 0x20);
  fStack_5e0 = (float)uVar62;
  fStack_5dc = (float)((ulong)uVar62 >> 0x20);
  fVar287 = (float)local_5e8._0_4_ + *pfVar1 * 0.33333334;
  fVar300 = (float)local_5e8._4_4_ + pfVar1[1] * 0.33333334;
  fVar329 = fStack_5e0 + pfVar1[2] * 0.33333334;
  fVar337 = fStack_5dc + pfVar1[3] * 0.33333334;
  pfVar1 = (float *)(*(long *)(p_Var11 + lVar75 + 0x38) +
                    *(long *)(p_Var11 + lVar75 + 0x48) * lVar74);
  auVar90._0_4_ = *pfVar1 * 0.33333334;
  auVar90._4_4_ = pfVar1[1] * 0.33333334;
  auVar90._8_4_ = pfVar1[2] * 0.33333334;
  auVar90._12_4_ = pfVar1[3] * 0.33333334;
  auVar125 = vsubps_avx(auVar89,auVar90);
  fVar367 = auVar89._0_4_;
  fVar374 = auVar89._4_4_;
  fVar376 = auVar89._8_4_;
  fVar379 = auVar89._12_4_;
  fVar316 = auVar125._0_4_ * 0.0;
  fVar327 = auVar125._4_4_ * 0.0;
  fVar212 = auVar125._8_4_ * 0.0;
  fVar214 = auVar125._12_4_ * 0.0;
  fVar368 = fVar367 * 0.0 + fVar316;
  fVar375 = fVar374 * 0.0 + fVar327;
  fVar377 = fVar376 * 0.0 + fVar212;
  fVar380 = fVar379 * 0.0 + fVar214;
  auVar128._0_4_ = fVar368 + fVar287 * 3.0;
  auVar128._4_4_ = fVar375 + fVar300 * 3.0;
  auVar128._8_4_ = fVar377 + fVar329 * 3.0;
  auVar128._12_4_ = fVar380 + fVar337 * 3.0;
  auVar164._0_4_ = (float)local_5e8._0_4_ * 3.0;
  auVar164._4_4_ = (float)local_5e8._4_4_ * 3.0;
  auVar164._8_4_ = fStack_5e0 * 3.0;
  auVar164._12_4_ = fStack_5dc * 3.0;
  auVar20 = vsubps_avx(auVar128,auVar164);
  lVar12 = *(long *)(lVar10 + 0x38 + lVar75);
  lVar10 = *(long *)(lVar10 + 0x48 + lVar75);
  lVar14 = *(long *)(_Var13 + 0x38 + lVar75);
  lVar75 = *(long *)(_Var13 + 0x48 + lVar75);
  pfVar1 = (float *)(lVar12 + lVar10 * uVar72);
  fVar210 = *pfVar1;
  fVar211 = pfVar1[1];
  fVar213 = pfVar1[2];
  fVar215 = pfVar1[3];
  pfVar1 = (float *)(lVar14 + uVar72 * lVar75);
  fVar326 = fVar210 + *pfVar1 * 0.33333334;
  fVar328 = fVar211 + pfVar1[1] * 0.33333334;
  fVar262 = fVar213 + pfVar1[2] * 0.33333334;
  fVar263 = fVar215 + pfVar1[3] * 0.33333334;
  auVar89 = *(undefined1 (*) [16])(lVar12 + lVar10 * lVar74);
  pfVar1 = (float *)(lVar14 + lVar75 * lVar74);
  auVar165._0_4_ = *pfVar1 * 0.33333334;
  auVar165._4_4_ = pfVar1[1] * 0.33333334;
  auVar165._8_4_ = pfVar1[2] * 0.33333334;
  auVar165._12_4_ = pfVar1[3] * 0.33333334;
  auVar18 = vsubps_avx(auVar89,auVar165);
  fVar351 = auVar89._0_4_;
  fVar353 = auVar89._4_4_;
  fVar364 = auVar89._8_4_;
  fVar366 = auVar89._12_4_;
  fVar236 = auVar18._0_4_ * 0.0;
  fVar237 = auVar18._4_4_ * 0.0;
  fVar238 = auVar18._8_4_ * 0.0;
  fVar239 = auVar18._12_4_ * 0.0;
  fVar251 = fVar351 * 0.0 + fVar236;
  fVar252 = fVar353 * 0.0 + fVar237;
  fVar253 = fVar364 * 0.0 + fVar238;
  fVar315 = fVar366 * 0.0 + fVar239;
  auVar242._0_4_ = fVar326 * 3.0 + fVar251;
  auVar242._4_4_ = fVar328 * 3.0 + fVar252;
  auVar242._8_4_ = fVar262 * 3.0 + fVar253;
  auVar242._12_4_ = fVar263 * 3.0 + fVar315;
  auVar269._0_4_ = fVar210 * 3.0;
  auVar269._4_4_ = fVar211 * 3.0;
  auVar269._8_4_ = fVar213 * 3.0;
  auVar269._12_4_ = fVar215 * 3.0;
  auVar19 = vsubps_avx(auVar242,auVar269);
  auVar270._0_4_ = fVar367 * 3.0;
  auVar270._4_4_ = fVar374 * 3.0;
  auVar270._8_4_ = fVar376 * 3.0;
  auVar270._12_4_ = fVar379 * 3.0;
  auVar330._0_4_ = auVar125._0_4_ * 3.0;
  auVar330._4_4_ = auVar125._4_4_ * 3.0;
  auVar330._8_4_ = auVar125._8_4_ * 3.0;
  auVar330._12_4_ = auVar125._12_4_ * 3.0;
  auVar89 = vsubps_avx(auVar270,auVar330);
  fVar287 = fVar287 * 0.0;
  fVar300 = fVar300 * 0.0;
  fVar329 = fVar329 * 0.0;
  fVar337 = fVar337 * 0.0;
  auVar271._0_4_ = fVar287 + auVar89._0_4_;
  auVar271._4_4_ = fVar300 + auVar89._4_4_;
  auVar271._8_4_ = fVar329 + auVar89._8_4_;
  auVar271._12_4_ = fVar337 + auVar89._12_4_;
  auVar331._0_4_ = (float)local_5e8._0_4_ + fVar287 + fVar368;
  auVar331._4_4_ = (float)local_5e8._4_4_ + fVar300 + fVar375;
  auVar331._8_4_ = fStack_5e0 + fVar329 + fVar377;
  auVar331._12_4_ = fStack_5dc + fVar337 + fVar380;
  auVar293._0_4_ = (float)local_5e8._0_4_ * 0.0;
  auVar293._4_4_ = (float)local_5e8._4_4_ * 0.0;
  auVar293._8_4_ = fStack_5e0 * 0.0;
  auVar293._12_4_ = fStack_5dc * 0.0;
  local_5e8._0_4_ = auVar293._0_4_ + fVar287 + fVar367 + fVar316;
  local_5e8._4_4_ = auVar293._4_4_ + fVar300 + fVar374 + fVar327;
  fStack_5e0 = auVar293._8_4_ + fVar329 + fVar376 + fVar212;
  fStack_5dc = auVar293._12_4_ + fVar337 + fVar379 + fVar214;
  auVar88 = vsubps_avx(auVar271,auVar293);
  auVar198._0_4_ = fVar351 * 3.0;
  auVar198._4_4_ = fVar353 * 3.0;
  auVar198._8_4_ = fVar364 * 3.0;
  auVar198._12_4_ = fVar366 * 3.0;
  auVar129._0_4_ = auVar18._0_4_ * 3.0;
  auVar129._4_4_ = auVar18._4_4_ * 3.0;
  auVar129._8_4_ = auVar18._8_4_ * 3.0;
  auVar129._12_4_ = auVar18._12_4_ * 3.0;
  auVar89 = vsubps_avx(auVar198,auVar129);
  fVar326 = fVar326 * 0.0;
  fVar328 = fVar328 * 0.0;
  fVar262 = fVar262 * 0.0;
  fVar263 = fVar263 * 0.0;
  auVar130._0_4_ = fVar326 + auVar89._0_4_;
  auVar130._4_4_ = fVar328 + auVar89._4_4_;
  auVar130._8_4_ = fVar262 + auVar89._8_4_;
  auVar130._12_4_ = fVar263 + auVar89._12_4_;
  auVar166._0_4_ = fVar210 + fVar326 + fVar251;
  auVar166._4_4_ = fVar211 + fVar328 + fVar252;
  auVar166._8_4_ = fVar213 + fVar262 + fVar253;
  auVar166._12_4_ = fVar215 + fVar263 + fVar315;
  auVar199._0_4_ = fVar210 * 0.0;
  auVar199._4_4_ = fVar211 * 0.0;
  auVar199._8_4_ = fVar213 * 0.0;
  auVar199._12_4_ = fVar215 * 0.0;
  auVar91._0_4_ = auVar199._0_4_ + fVar326 + fVar351 + fVar236;
  auVar91._4_4_ = auVar199._4_4_ + fVar328 + fVar353 + fVar237;
  auVar91._8_4_ = auVar199._8_4_ + fVar262 + fVar364 + fVar238;
  auVar91._12_4_ = auVar199._12_4_ + fVar263 + fVar366 + fVar239;
  auVar125 = vsubps_avx(auVar130,auVar199);
  auVar89 = vshufps_avx(auVar166,auVar166,0xc9);
  fVar326 = auVar20._0_4_;
  auVar200._0_4_ = fVar326 * auVar89._0_4_;
  fVar327 = auVar20._4_4_;
  auVar200._4_4_ = fVar327 * auVar89._4_4_;
  fVar262 = auVar20._8_4_;
  auVar200._8_4_ = fVar262 * auVar89._8_4_;
  fVar214 = auVar20._12_4_;
  auVar200._12_4_ = fVar214 * auVar89._12_4_;
  auVar89 = vshufps_avx(auVar20,auVar20,0xc9);
  auVar167._0_4_ = auVar89._0_4_ * auVar166._0_4_;
  auVar167._4_4_ = auVar89._4_4_ * auVar166._4_4_;
  auVar167._8_4_ = auVar89._8_4_ * auVar166._8_4_;
  auVar167._12_4_ = auVar89._12_4_ * auVar166._12_4_;
  auVar18 = vsubps_avx(auVar167,auVar200);
  auVar201._0_4_ = auVar89._0_4_ * auVar19._0_4_;
  auVar201._4_4_ = auVar89._4_4_ * auVar19._4_4_;
  auVar201._8_4_ = auVar89._8_4_ * auVar19._8_4_;
  auVar201._12_4_ = auVar89._12_4_ * auVar19._12_4_;
  auVar89 = vshufps_avx(auVar19,auVar19,0xc9);
  auVar220._0_4_ = fVar326 * auVar89._0_4_;
  auVar220._4_4_ = fVar327 * auVar89._4_4_;
  auVar220._8_4_ = fVar262 * auVar89._8_4_;
  auVar220._12_4_ = fVar214 * auVar89._12_4_;
  auVar19 = vsubps_avx(auVar201,auVar220);
  auVar89 = vshufps_avx(auVar91,auVar91,0xc9);
  fVar251 = auVar88._0_4_;
  auVar221._0_4_ = fVar251 * auVar89._0_4_;
  fVar252 = auVar88._4_4_;
  auVar221._4_4_ = fVar252 * auVar89._4_4_;
  fVar253 = auVar88._8_4_;
  auVar221._8_4_ = fVar253 * auVar89._8_4_;
  fVar316 = auVar88._12_4_;
  auVar221._12_4_ = fVar316 * auVar89._12_4_;
  auVar89 = vshufps_avx(auVar88,auVar88,0xc9);
  auVar92._0_4_ = auVar89._0_4_ * auVar91._0_4_;
  auVar92._4_4_ = auVar89._4_4_ * auVar91._4_4_;
  auVar92._8_4_ = auVar89._8_4_ * auVar91._8_4_;
  auVar92._12_4_ = auVar89._12_4_ * auVar91._12_4_;
  auVar16 = vsubps_avx(auVar92,auVar221);
  auVar18 = vshufps_avx(auVar18,auVar18,0xc9);
  auVar168._0_4_ = auVar89._0_4_ * auVar125._0_4_;
  auVar168._4_4_ = auVar89._4_4_ * auVar125._4_4_;
  auVar168._8_4_ = auVar89._8_4_ * auVar125._8_4_;
  auVar168._12_4_ = auVar89._12_4_ * auVar125._12_4_;
  auVar125 = vshufps_avx(auVar125,auVar125,0xc9);
  auVar89 = vdpps_avx(auVar18,auVar18,0x7f);
  auVar131._0_4_ = fVar251 * auVar125._0_4_;
  auVar131._4_4_ = fVar252 * auVar125._4_4_;
  auVar131._8_4_ = fVar253 * auVar125._8_4_;
  auVar131._12_4_ = fVar316 * auVar125._12_4_;
  auVar78 = vsubps_avx(auVar168,auVar131);
  auVar19 = vshufps_avx(auVar19,auVar19,0xc9);
  fVar210 = auVar89._0_4_;
  auVar202 = ZEXT416((uint)fVar210);
  auVar125 = vrsqrtss_avx(auVar202,auVar202);
  fVar211 = auVar125._0_4_;
  auVar125 = vdpps_avx(auVar18,auVar19,0x7f);
  auVar89 = vshufps_avx(auVar89,auVar89,0);
  auVar132._0_4_ = auVar89._0_4_ * auVar19._0_4_;
  auVar132._4_4_ = auVar89._4_4_ * auVar19._4_4_;
  auVar132._8_4_ = auVar89._8_4_ * auVar19._8_4_;
  auVar132._12_4_ = auVar89._12_4_ * auVar19._12_4_;
  auVar89 = vshufps_avx(auVar125,auVar125,0);
  auVar272._0_4_ = auVar89._0_4_ * auVar18._0_4_;
  auVar272._4_4_ = auVar89._4_4_ * auVar18._4_4_;
  auVar272._8_4_ = auVar89._8_4_ * auVar18._8_4_;
  auVar272._12_4_ = auVar89._12_4_ * auVar18._12_4_;
  auVar79 = vsubps_avx(auVar132,auVar272);
  auVar89 = vrcpss_avx(auVar202,auVar202);
  auVar89 = ZEXT416((uint)(auVar89._0_4_ * (2.0 - fVar210 * auVar89._0_4_)));
  auVar19 = vshufps_avx(auVar89,auVar89,0);
  auVar16 = vshufps_avx(auVar16,auVar16,0xc9);
  auVar89 = ZEXT416((uint)(fVar211 * 1.5 - fVar211 * fVar211 * fVar210 * 0.5 * fVar211));
  auVar202 = vshufps_avx(auVar89,auVar89,0);
  auVar89 = vdpps_avx(auVar16,auVar16,0x7f);
  fVar210 = auVar202._0_4_ * auVar18._0_4_;
  fVar211 = auVar202._4_4_ * auVar18._4_4_;
  fVar213 = auVar202._8_4_ * auVar18._8_4_;
  fVar215 = auVar202._12_4_ * auVar18._12_4_;
  auVar18 = vshufps_avx(auVar78,auVar78,0xc9);
  fVar237 = auVar89._0_4_;
  auVar80 = ZEXT416((uint)fVar237);
  auVar125 = vrsqrtss_avx(auVar80,auVar80);
  fVar236 = auVar125._0_4_;
  auVar125 = vdpps_avx(auVar16,auVar18,0x7f);
  auVar89 = vshufps_avx(auVar89,auVar89,0);
  auVar169._0_4_ = auVar89._0_4_ * auVar18._0_4_;
  auVar169._4_4_ = auVar89._4_4_ * auVar18._4_4_;
  auVar169._8_4_ = auVar89._8_4_ * auVar18._8_4_;
  auVar169._12_4_ = auVar89._12_4_ * auVar18._12_4_;
  auVar89 = vshufps_avx(auVar125,auVar125,0);
  auVar273._0_4_ = auVar89._0_4_ * auVar16._0_4_;
  auVar273._4_4_ = auVar89._4_4_ * auVar16._4_4_;
  auVar273._8_4_ = auVar89._8_4_ * auVar16._8_4_;
  auVar273._12_4_ = auVar89._12_4_ * auVar16._12_4_;
  auVar78 = vsubps_avx(auVar169,auVar273);
  auVar89 = vrcpss_avx(auVar80,auVar80);
  auVar89 = ZEXT416((uint)(auVar89._0_4_ * (2.0 - fVar237 * auVar89._0_4_)));
  auVar89 = vshufps_avx(auVar89,auVar89,0);
  auVar125 = ZEXT416((uint)(fVar236 * 1.5 - fVar236 * fVar236 * fVar237 * 0.5 * fVar236));
  auVar125 = vshufps_avx(auVar125,auVar125,0);
  fVar236 = auVar16._0_4_ * auVar125._0_4_;
  fVar237 = auVar16._4_4_ * auVar125._4_4_;
  fVar238 = auVar16._8_4_ * auVar125._8_4_;
  fVar239 = auVar16._12_4_ * auVar125._12_4_;
  auVar18 = vshufps_avx(auVar20,auVar20,0xff);
  auVar16 = vshufps_avx(auVar331,auVar331,0xff);
  auVar93._0_4_ = auVar16._0_4_ * fVar210;
  auVar93._4_4_ = auVar16._4_4_ * fVar211;
  auVar93._8_4_ = auVar16._8_4_ * fVar213;
  auVar93._12_4_ = auVar16._12_4_ * fVar215;
  auVar203._0_4_ =
       auVar18._0_4_ * fVar210 + auVar202._0_4_ * auVar19._0_4_ * auVar79._0_4_ * auVar16._0_4_;
  auVar203._4_4_ =
       auVar18._4_4_ * fVar211 + auVar202._4_4_ * auVar19._4_4_ * auVar79._4_4_ * auVar16._4_4_;
  auVar203._8_4_ =
       auVar18._8_4_ * fVar213 + auVar202._8_4_ * auVar19._8_4_ * auVar79._8_4_ * auVar16._8_4_;
  auVar203._12_4_ =
       auVar18._12_4_ * fVar215 + auVar202._12_4_ * auVar19._12_4_ * auVar79._12_4_ * auVar16._12_4_
  ;
  auVar16 = vsubps_avx(auVar331,auVar93);
  auVar202 = vsubps_avx(auVar20,auVar203);
  auVar18 = vshufps_avx(auVar88,auVar88,0xff);
  auVar19 = vshufps_avx(_local_5e8,_local_5e8,0xff);
  auVar133._0_4_ = auVar19._0_4_ * fVar236;
  auVar133._4_4_ = auVar19._4_4_ * fVar237;
  auVar133._8_4_ = auVar19._8_4_ * fVar238;
  auVar133._12_4_ = auVar19._12_4_ * fVar239;
  auVar170._0_4_ =
       auVar18._0_4_ * fVar236 + auVar19._0_4_ * auVar125._0_4_ * auVar78._0_4_ * auVar89._0_4_;
  auVar170._4_4_ =
       auVar18._4_4_ * fVar237 + auVar19._4_4_ * auVar125._4_4_ * auVar78._4_4_ * auVar89._4_4_;
  auVar170._8_4_ =
       auVar18._8_4_ * fVar238 + auVar19._8_4_ * auVar125._8_4_ * auVar78._8_4_ * auVar89._8_4_;
  auVar170._12_4_ =
       auVar18._12_4_ * fVar239 + auVar19._12_4_ * auVar125._12_4_ * auVar78._12_4_ * auVar89._12_4_
  ;
  auVar18 = vsubps_avx(_local_5e8,auVar133);
  auVar348._0_4_ = (float)local_5e8._0_4_ + auVar133._0_4_;
  auVar348._4_4_ = (float)local_5e8._4_4_ + auVar133._4_4_;
  auVar348._8_4_ = fStack_5e0 + auVar133._8_4_;
  auVar348._12_4_ = fStack_5dc + auVar133._12_4_;
  auVar19 = vsubps_avx(auVar88,auVar170);
  local_528 = auVar289._0_4_;
  fStack_524 = auVar289._4_4_;
  fStack_520 = auVar289._8_4_;
  fStack_51c = auVar289._12_4_;
  local_468 = auVar268._0_4_;
  fStack_464 = auVar268._4_4_;
  fStack_460 = auVar268._8_4_;
  fStack_45c = auVar268._12_4_;
  auVar89 = vshufps_avx(ZEXT416((uint)fVar191),ZEXT416((uint)fVar191),0);
  auVar125 = vshufps_avx(ZEXT416((uint)(1.0 - fVar191)),ZEXT416((uint)(1.0 - fVar191)),0);
  fVar191 = auVar89._0_4_;
  fVar210 = auVar89._4_4_;
  fVar211 = auVar89._8_4_;
  fVar213 = auVar89._12_4_;
  fVar215 = auVar125._0_4_;
  fVar236 = auVar125._4_4_;
  fVar237 = auVar125._8_4_;
  fVar238 = auVar125._12_4_;
  auVar309._0_4_ = fVar215 * local_468 + fVar191 * auVar16._0_4_;
  auVar309._4_4_ = fVar236 * fStack_464 + fVar210 * auVar16._4_4_;
  auVar309._8_4_ = fVar237 * fStack_460 + fVar211 * auVar16._8_4_;
  auVar309._12_4_ = fVar238 * fStack_45c + fVar213 * auVar16._12_4_;
  fVar315 = fVar215 * (local_468 + local_528 * 0.33333334) +
            fVar191 * (auVar16._0_4_ + auVar202._0_4_ * 0.33333334);
  fVar328 = fVar236 * (fStack_464 + fStack_524 * 0.33333334) +
            fVar210 * (auVar16._4_4_ + auVar202._4_4_ * 0.33333334);
  fVar263 = fVar237 * (fStack_460 + fStack_520 * 0.33333334) +
            fVar211 * (auVar16._8_4_ + auVar202._8_4_ * 0.33333334);
  fVar300 = fVar238 * (fStack_45c + fStack_51c * 0.33333334) +
            fVar213 * (auVar16._12_4_ + auVar202._12_4_ * 0.33333334);
  local_5a8 = auVar126._0_4_;
  fStack_5a4 = auVar126._4_4_;
  fStack_5a0 = auVar126._8_4_;
  fStack_59c = auVar126._12_4_;
  auVar222._0_4_ = local_5a8 * 0.33333334;
  auVar222._4_4_ = fStack_5a4 * 0.33333334;
  auVar222._8_4_ = fStack_5a0 * 0.33333334;
  auVar222._12_4_ = fStack_59c * 0.33333334;
  auVar89 = vsubps_avx(auVar17,auVar222);
  auVar274._0_4_ = (fVar343 + auVar127._0_4_) * 0.33333334;
  auVar274._4_4_ = (fVar352 + auVar127._4_4_) * 0.33333334;
  auVar274._8_4_ = (fVar355 + auVar127._8_4_) * 0.33333334;
  auVar274._12_4_ = (fVar365 + auVar127._12_4_) * 0.33333334;
  auVar125 = vsubps_avx((undefined1  [16])p01.field_0,auVar274);
  auVar204._0_4_ = auVar19._0_4_ * 0.33333334;
  auVar204._4_4_ = auVar19._4_4_ * 0.33333334;
  auVar204._8_4_ = auVar19._8_4_ * 0.33333334;
  auVar204._12_4_ = auVar19._12_4_ * 0.33333334;
  auVar19 = vsubps_avx(auVar18,auVar204);
  auVar134._0_4_ = (fVar251 + auVar170._0_4_) * 0.33333334;
  auVar134._4_4_ = (fVar252 + auVar170._4_4_) * 0.33333334;
  auVar134._8_4_ = (fVar253 + auVar170._8_4_) * 0.33333334;
  auVar134._12_4_ = (fVar316 + auVar170._12_4_) * 0.33333334;
  auVar16 = vsubps_avx(auVar348,auVar134);
  auVar318._0_4_ = fVar215 * auVar89._0_4_ + fVar191 * auVar19._0_4_;
  auVar318._4_4_ = fVar236 * auVar89._4_4_ + fVar210 * auVar19._4_4_;
  auVar318._8_4_ = fVar237 * auVar89._8_4_ + fVar211 * auVar19._8_4_;
  auVar318._12_4_ = fVar238 * auVar89._12_4_ + fVar213 * auVar19._12_4_;
  auVar371._0_4_ = auVar18._0_4_ * fVar191 + fVar215 * auVar17._0_4_;
  auVar371._4_4_ = auVar18._4_4_ * fVar210 + fVar236 * auVar17._4_4_;
  auVar371._8_4_ = auVar18._8_4_ * fVar211 + fVar237 * auVar17._8_4_;
  auVar371._12_4_ = auVar18._12_4_ * fVar213 + fVar238 * auVar17._12_4_;
  fVar316 = fVar215 * (auVar358._0_4_ + auVar347._0_4_) + fVar191 * (auVar331._0_4_ + auVar93._0_4_)
  ;
  fVar212 = fVar236 * (auVar358._4_4_ + auVar347._4_4_) + fVar210 * (auVar331._4_4_ + auVar93._4_4_)
  ;
  fVar287 = fVar237 * (auVar358._8_4_ + auVar347._8_4_) + fVar211 * (auVar331._8_4_ + auVar93._8_4_)
  ;
  fVar329 = fVar238 * (auVar358._12_4_ + auVar347._12_4_) +
            fVar213 * (auVar331._12_4_ + auVar93._12_4_);
  auVar332._0_4_ =
       fVar215 * (auVar358._0_4_ + auVar347._0_4_ + (fVar118 + auVar197._0_4_) * 0.33333334) +
       ((fVar326 + auVar203._0_4_) * 0.33333334 + auVar331._0_4_ + auVar93._0_4_) * fVar191;
  auVar332._4_4_ =
       fVar236 * (auVar358._4_4_ + auVar347._4_4_ + (fVar119 + auVar197._4_4_) * 0.33333334) +
       ((fVar327 + auVar203._4_4_) * 0.33333334 + auVar331._4_4_ + auVar93._4_4_) * fVar210;
  auVar332._8_4_ =
       fVar237 * (auVar358._8_4_ + auVar347._8_4_ + (fVar335 + auVar197._8_4_) * 0.33333334) +
       ((fVar262 + auVar203._8_4_) * 0.33333334 + auVar331._8_4_ + auVar93._8_4_) * fVar211;
  auVar332._12_4_ =
       fVar238 * (auVar358._12_4_ + auVar347._12_4_ + (fVar336 + auVar197._12_4_) * 0.33333334) +
       ((fVar214 + auVar203._12_4_) * 0.33333334 + auVar331._12_4_ + auVar93._12_4_) * fVar213;
  fVar326 = fVar215 * auVar125._0_4_ + fVar191 * auVar16._0_4_;
  fVar262 = fVar236 * auVar125._4_4_ + fVar210 * auVar16._4_4_;
  fVar118 = fVar237 * auVar125._8_4_ + fVar211 * auVar16._8_4_;
  fVar335 = fVar238 * auVar125._12_4_ + fVar213 * auVar16._12_4_;
  auVar89 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar89 = vinsertps_avx(auVar89,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar327 = fVar215 * (auVar308._0_4_ + auVar292._0_4_) + auVar348._0_4_ * fVar191;
  fVar214 = fVar236 * (auVar308._4_4_ + auVar292._4_4_) + auVar348._4_4_ * fVar210;
  fVar119 = fVar237 * (auVar308._8_4_ + auVar292._8_4_) + auVar348._8_4_ * fVar211;
  fVar336 = fVar238 * (auVar308._12_4_ + auVar292._12_4_) + auVar348._12_4_ * fVar213;
  auVar289 = vsubps_avx(auVar309,auVar89);
  auVar18 = vmovsldup_avx(auVar289);
  auVar125 = vmovshdup_avx(auVar289);
  auVar19 = vshufps_avx(auVar289,auVar289,0xaa);
  fVar191 = pre->ray_space[k].vx.field_0.m128[0];
  fVar210 = pre->ray_space[k].vx.field_0.m128[1];
  fVar211 = pre->ray_space[k].vx.field_0.m128[2];
  fVar213 = pre->ray_space[k].vx.field_0.m128[3];
  fVar215 = pre->ray_space[k].vy.field_0.m128[0];
  fVar236 = pre->ray_space[k].vy.field_0.m128[1];
  fVar237 = pre->ray_space[k].vy.field_0.m128[2];
  fVar238 = pre->ray_space[k].vy.field_0.m128[3];
  fVar239 = pre->ray_space[k].vz.field_0.m128[0];
  fVar251 = pre->ray_space[k].vz.field_0.m128[1];
  fVar252 = pre->ray_space[k].vz.field_0.m128[2];
  fVar253 = pre->ray_space[k].vz.field_0.m128[3];
  local_608._0_4_ = fVar191 * auVar18._0_4_ + fVar215 * auVar125._0_4_ + fVar239 * auVar19._0_4_;
  local_608._4_4_ = fVar210 * auVar18._4_4_ + fVar236 * auVar125._4_4_ + fVar251 * auVar19._4_4_;
  fStack_600 = fVar211 * auVar18._8_4_ + fVar237 * auVar125._8_4_ + fVar252 * auVar19._8_4_;
  fStack_5fc = fVar213 * auVar18._12_4_ + fVar238 * auVar125._12_4_ + fVar253 * auVar19._12_4_;
  auVar67._4_4_ = fVar328;
  auVar67._0_4_ = fVar315;
  auVar67._8_4_ = fVar263;
  auVar67._12_4_ = fVar300;
  auVar20 = vsubps_avx(auVar67,auVar89);
  auVar19 = vshufps_avx(auVar20,auVar20,0xaa);
  auVar125 = vmovshdup_avx(auVar20);
  auVar18 = vmovsldup_avx(auVar20);
  auVar349._0_4_ = fVar191 * auVar18._0_4_ + fVar215 * auVar125._0_4_ + fVar239 * auVar19._0_4_;
  auVar349._4_4_ = fVar210 * auVar18._4_4_ + fVar236 * auVar125._4_4_ + fVar251 * auVar19._4_4_;
  auVar349._8_4_ = fVar211 * auVar18._8_4_ + fVar237 * auVar125._8_4_ + fVar252 * auVar19._8_4_;
  auVar349._12_4_ = fVar213 * auVar18._12_4_ + fVar238 * auVar125._12_4_ + fVar253 * auVar19._12_4_;
  auVar17 = vsubps_avx(auVar318,auVar89);
  auVar19 = vshufps_avx(auVar17,auVar17,0xaa);
  auVar125 = vmovshdup_avx(auVar17);
  auVar18 = vmovsldup_avx(auVar17);
  auVar359._0_4_ = fVar191 * auVar18._0_4_ + fVar215 * auVar125._0_4_ + fVar239 * auVar19._0_4_;
  auVar359._4_4_ = fVar210 * auVar18._4_4_ + fVar236 * auVar125._4_4_ + fVar251 * auVar19._4_4_;
  auVar359._8_4_ = fVar211 * auVar18._8_4_ + fVar237 * auVar125._8_4_ + fVar252 * auVar19._8_4_;
  auVar359._12_4_ = fVar213 * auVar18._12_4_ + fVar238 * auVar125._12_4_ + fVar253 * auVar19._12_4_;
  auVar88 = vsubps_avx(auVar371,auVar89);
  auVar19 = vshufps_avx(auVar88,auVar88,0xaa);
  auVar125 = vmovshdup_avx(auVar88);
  auVar18 = vmovsldup_avx(auVar88);
  auVar135._0_4_ = auVar18._0_4_ * fVar191 + auVar125._0_4_ * fVar215 + fVar239 * auVar19._0_4_;
  auVar135._4_4_ = auVar18._4_4_ * fVar210 + auVar125._4_4_ * fVar236 + fVar251 * auVar19._4_4_;
  auVar135._8_4_ = auVar18._8_4_ * fVar211 + auVar125._8_4_ * fVar237 + fVar252 * auVar19._8_4_;
  auVar135._12_4_ = auVar18._12_4_ * fVar213 + auVar125._12_4_ * fVar238 + fVar253 * auVar19._12_4_;
  auVar65._4_4_ = fVar212;
  auVar65._0_4_ = fVar316;
  auVar65._8_4_ = fVar287;
  auVar65._12_4_ = fVar329;
  auVar268 = vsubps_avx(auVar65,auVar89);
  auVar19 = vshufps_avx(auVar268,auVar268,0xaa);
  auVar125 = vmovshdup_avx(auVar268);
  auVar18 = vmovsldup_avx(auVar268);
  auVar282._0_4_ = auVar18._0_4_ * fVar191 + auVar125._0_4_ * fVar215 + auVar19._0_4_ * fVar239;
  auVar282._4_4_ = auVar18._4_4_ * fVar210 + auVar125._4_4_ * fVar236 + auVar19._4_4_ * fVar251;
  auVar282._8_4_ = auVar18._8_4_ * fVar211 + auVar125._8_4_ * fVar237 + auVar19._8_4_ * fVar252;
  auVar282._12_4_ = auVar18._12_4_ * fVar213 + auVar125._12_4_ * fVar238 + auVar19._12_4_ * fVar253;
  auVar78 = vsubps_avx(auVar332,auVar89);
  auVar19 = vshufps_avx(auVar78,auVar78,0xaa);
  auVar125 = vmovshdup_avx(auVar78);
  auVar18 = vmovsldup_avx(auVar78);
  auVar294._0_4_ = auVar18._0_4_ * fVar191 + auVar125._0_4_ * fVar215 + auVar19._0_4_ * fVar239;
  auVar294._4_4_ = auVar18._4_4_ * fVar210 + auVar125._4_4_ * fVar236 + auVar19._4_4_ * fVar251;
  auVar294._8_4_ = auVar18._8_4_ * fVar211 + auVar125._8_4_ * fVar237 + auVar19._8_4_ * fVar252;
  auVar294._12_4_ = auVar18._12_4_ * fVar213 + auVar125._12_4_ * fVar238 + auVar19._12_4_ * fVar253;
  auVar63._4_4_ = fVar262;
  auVar63._0_4_ = fVar326;
  auVar63._8_4_ = fVar118;
  auVar63._12_4_ = fVar335;
  auVar79 = vsubps_avx(auVar63,auVar89);
  auVar19 = vshufps_avx(auVar79,auVar79,0xaa);
  auVar125 = vmovshdup_avx(auVar79);
  auVar18 = vmovsldup_avx(auVar79);
  auVar310._0_4_ = auVar18._0_4_ * fVar191 + auVar125._0_4_ * fVar215 + auVar19._0_4_ * fVar239;
  auVar310._4_4_ = auVar18._4_4_ * fVar210 + auVar125._4_4_ * fVar236 + auVar19._4_4_ * fVar251;
  auVar310._8_4_ = auVar18._8_4_ * fVar211 + auVar125._8_4_ * fVar237 + auVar19._8_4_ * fVar252;
  auVar310._12_4_ = auVar18._12_4_ * fVar213 + auVar125._12_4_ * fVar238 + auVar19._12_4_ * fVar253;
  auVar69._4_4_ = fVar214;
  auVar69._0_4_ = fVar327;
  auVar69._8_4_ = fVar119;
  auVar69._12_4_ = fVar336;
  auVar80 = vsubps_avx(auVar69,auVar89);
  auVar18 = vshufps_avx(auVar80,auVar80,0xaa);
  auVar89 = vmovshdup_avx(auVar80);
  auVar125 = vmovsldup_avx(auVar80);
  auVar94._0_4_ = fVar191 * auVar125._0_4_ + fVar215 * auVar89._0_4_ + fVar239 * auVar18._0_4_;
  auVar94._4_4_ = fVar210 * auVar125._4_4_ + fVar236 * auVar89._4_4_ + fVar251 * auVar18._4_4_;
  auVar94._8_4_ = fVar211 * auVar125._8_4_ + fVar237 * auVar89._8_4_ + fVar252 * auVar18._8_4_;
  auVar94._12_4_ = fVar213 * auVar125._12_4_ + fVar238 * auVar89._12_4_ + fVar253 * auVar18._12_4_;
  auVar19 = vmovlhps_avx(_local_608,auVar282);
  auVar16 = vmovlhps_avx(auVar349,auVar294);
  auVar202 = vmovlhps_avx(auVar359,auVar310);
  auVar126 = vmovlhps_avx(auVar135,auVar94);
  auVar89 = vminps_avx(auVar19,auVar16);
  auVar125 = vminps_avx(auVar202,auVar126);
  auVar18 = vminps_avx(auVar89,auVar125);
  auVar89 = vmaxps_avx(auVar19,auVar16);
  auVar125 = vmaxps_avx(auVar202,auVar126);
  auVar89 = vmaxps_avx(auVar89,auVar125);
  auVar125 = vshufpd_avx(auVar18,auVar18,3);
  auVar18 = vminps_avx(auVar18,auVar125);
  auVar125 = vshufpd_avx(auVar89,auVar89,3);
  auVar125 = vmaxps_avx(auVar89,auVar125);
  auVar255._8_4_ = 0x7fffffff;
  auVar255._0_8_ = 0x7fffffff7fffffff;
  auVar255._12_4_ = 0x7fffffff;
  auVar89 = vandps_avx(auVar18,auVar255);
  auVar125 = vandps_avx(auVar125,auVar255);
  auVar89 = vmaxps_avx(auVar89,auVar125);
  auVar125 = vmovshdup_avx(auVar89);
  auVar89 = vmaxss_avx(auVar125,auVar89);
  fVar210 = auVar89._0_4_ * 9.536743e-07;
  auVar89 = vshufps_avx(ZEXT416((uint)fVar210),ZEXT416((uint)fVar210),0);
  local_78._16_16_ = auVar89;
  local_78._0_16_ = auVar89;
  auVar95._0_8_ = auVar89._0_8_ ^ 0x8000000080000000;
  auVar95._8_4_ = auVar89._8_4_ ^ 0x80000000;
  auVar95._12_4_ = auVar89._12_4_ ^ 0x80000000;
  local_98._16_16_ = auVar95;
  local_98._0_16_ = auVar95;
  auVar89 = vpshufd_avx(ZEXT416(uVar71),0);
  auVar125 = vpshufd_avx(ZEXT416(uVar7),0);
  uVar72 = 0;
  fVar191 = *(float *)(ray + k * 4 + 0x30);
  auVar18 = vsubps_avx(auVar16,auVar19);
  auVar121 = vsubps_avx(auVar202,auVar16);
  auVar120 = vsubps_avx(auVar126,auVar202);
  auVar66._4_4_ = fVar212;
  auVar66._0_4_ = fVar316;
  auVar66._8_4_ = fVar287;
  auVar66._12_4_ = fVar329;
  auVar157 = vsubps_avx(auVar66,auVar309);
  auVar68._4_4_ = fVar328;
  auVar68._0_4_ = fVar315;
  auVar68._8_4_ = fVar263;
  auVar68._12_4_ = fVar300;
  auVar158 = vsubps_avx(auVar332,auVar68);
  auVar64._4_4_ = fVar262;
  auVar64._0_4_ = fVar326;
  auVar64._8_4_ = fVar118;
  auVar64._12_4_ = fVar335;
  auVar159 = vsubps_avx(auVar64,auVar318);
  auVar192 = vsubps_avx(auVar69,auVar371);
  auVar325 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar373 = ZEXT1664(ZEXT816(0x3f80000000000000));
LAB_00917edf:
  do {
    auVar290 = auVar373._0_16_;
    auVar280 = auVar325._0_16_;
    auVar99 = vshufps_avx(auVar280,auVar280,0x50);
    auVar360._8_4_ = 0x3f800000;
    auVar360._0_8_ = 0x3f8000003f800000;
    auVar360._12_4_ = 0x3f800000;
    auVar363._16_4_ = 0x3f800000;
    auVar363._0_16_ = auVar360;
    auVar363._20_4_ = 0x3f800000;
    auVar363._24_4_ = 0x3f800000;
    auVar363._28_4_ = 0x3f800000;
    auVar216 = vsubps_avx(auVar360,auVar99);
    fVar211 = auVar99._0_4_;
    fVar213 = auVar99._4_4_;
    fVar215 = auVar99._8_4_;
    fVar236 = auVar99._12_4_;
    fVar237 = auVar216._0_4_;
    fVar238 = auVar216._4_4_;
    fVar239 = auVar216._8_4_;
    fVar251 = auVar216._12_4_;
    auVar205._0_4_ = auVar282._0_4_ * fVar211 + fVar237 * (float)local_608._0_4_;
    auVar205._4_4_ = auVar282._4_4_ * fVar213 + fVar238 * (float)local_608._4_4_;
    auVar205._8_4_ = auVar282._0_4_ * fVar215 + fVar239 * (float)local_608._0_4_;
    auVar205._12_4_ = auVar282._4_4_ * fVar236 + fVar251 * (float)local_608._4_4_;
    auVar171._0_4_ = auVar294._0_4_ * fVar211 + auVar349._0_4_ * fVar237;
    auVar171._4_4_ = auVar294._4_4_ * fVar213 + auVar349._4_4_ * fVar238;
    auVar171._8_4_ = auVar294._0_4_ * fVar215 + auVar349._0_4_ * fVar239;
    auVar171._12_4_ = auVar294._4_4_ * fVar236 + auVar349._4_4_ * fVar251;
    auVar275._0_4_ = auVar310._0_4_ * fVar211 + auVar359._0_4_ * fVar237;
    auVar275._4_4_ = auVar310._4_4_ * fVar213 + auVar359._4_4_ * fVar238;
    auVar275._8_4_ = auVar310._0_4_ * fVar215 + auVar359._0_4_ * fVar239;
    auVar275._12_4_ = auVar310._4_4_ * fVar236 + auVar359._4_4_ * fVar251;
    auVar223._0_4_ = auVar94._0_4_ * fVar211 + auVar135._0_4_ * fVar237;
    auVar223._4_4_ = auVar94._4_4_ * fVar213 + auVar135._4_4_ * fVar238;
    auVar223._8_4_ = auVar94._0_4_ * fVar215 + auVar135._0_4_ * fVar239;
    auVar223._12_4_ = auVar94._4_4_ * fVar236 + auVar135._4_4_ * fVar251;
    auVar99 = vmovshdup_avx(auVar290);
    auVar216 = vshufps_avx(auVar290,auVar290,0);
    auVar298._16_16_ = auVar216;
    auVar298._0_16_ = auVar216;
    auVar188 = vshufps_avx(auVar290,auVar290,0x55);
    auVar113._16_16_ = auVar188;
    auVar113._0_16_ = auVar188;
    auVar112 = vsubps_avx(auVar113,auVar298);
    auVar188 = vshufps_avx(auVar205,auVar205,0);
    auVar150 = vshufps_avx(auVar205,auVar205,0x55);
    auVar138 = vshufps_avx(auVar171,auVar171,0);
    auVar174 = vshufps_avx(auVar171,auVar171,0x55);
    auVar139 = vshufps_avx(auVar275,auVar275,0);
    auVar264 = vshufps_avx(auVar275,auVar275,0x55);
    auVar265 = vshufps_avx(auVar223,auVar223,0);
    auVar279 = vshufps_avx(auVar223,auVar223,0x55);
    auVar99 = ZEXT416((uint)((auVar99._0_4_ - auVar373._0_4_) * 0.04761905));
    auVar99 = vshufps_avx(auVar99,auVar99,0);
    auVar314._0_4_ = auVar216._0_4_ + auVar112._0_4_ * 0.0;
    auVar314._4_4_ = auVar216._4_4_ + auVar112._4_4_ * 0.14285715;
    auVar314._8_4_ = auVar216._8_4_ + auVar112._8_4_ * 0.2857143;
    auVar314._12_4_ = auVar216._12_4_ + auVar112._12_4_ * 0.42857146;
    auVar314._16_4_ = auVar216._0_4_ + auVar112._16_4_ * 0.5714286;
    auVar314._20_4_ = auVar216._4_4_ + auVar112._20_4_ * 0.71428573;
    auVar314._24_4_ = auVar216._8_4_ + auVar112._24_4_ * 0.8571429;
    auVar314._28_4_ = auVar216._12_4_ + auVar112._28_4_;
    auVar21 = vsubps_avx(auVar363,auVar314);
    fVar211 = auVar138._0_4_;
    fVar215 = auVar138._4_4_;
    fVar237 = auVar138._8_4_;
    fVar239 = auVar138._12_4_;
    fVar288 = auVar21._0_4_;
    fVar301 = auVar21._4_4_;
    fVar302 = auVar21._8_4_;
    fVar303 = auVar21._12_4_;
    fVar304 = auVar21._16_4_;
    fVar305 = auVar21._20_4_;
    fVar306 = auVar21._24_4_;
    fVar374 = auVar174._0_4_;
    fVar379 = auVar174._4_4_;
    fVar375 = auVar174._8_4_;
    fVar380 = auVar174._12_4_;
    fVar354 = auVar150._12_4_ + 1.0;
    fVar364 = auVar139._0_4_;
    fVar365 = auVar139._4_4_;
    fVar366 = auVar139._8_4_;
    fVar367 = auVar139._12_4_;
    fVar252 = fVar364 * auVar314._0_4_ + fVar288 * fVar211;
    fVar253 = fVar365 * auVar314._4_4_ + fVar301 * fVar215;
    fVar337 = fVar366 * auVar314._8_4_ + fVar302 * fVar237;
    fVar343 = fVar367 * auVar314._12_4_ + fVar303 * fVar239;
    fVar351 = fVar364 * auVar314._16_4_ + fVar304 * fVar211;
    fVar352 = fVar365 * auVar314._20_4_ + fVar305 * fVar215;
    fVar353 = fVar366 * auVar314._24_4_ + fVar306 * fVar237;
    fVar213 = auVar264._0_4_;
    fVar236 = auVar264._4_4_;
    fVar238 = auVar264._8_4_;
    fVar251 = auVar264._12_4_;
    fVar376 = fVar374 * fVar288 + auVar314._0_4_ * fVar213;
    fVar368 = fVar379 * fVar301 + auVar314._4_4_ * fVar236;
    fVar377 = fVar375 * fVar302 + auVar314._8_4_ * fVar238;
    fVar338 = fVar380 * fVar303 + auVar314._12_4_ * fVar251;
    fVar339 = fVar374 * fVar304 + auVar314._16_4_ * fVar213;
    fVar340 = fVar379 * fVar305 + auVar314._20_4_ * fVar236;
    fVar341 = fVar375 * fVar306 + auVar314._24_4_ * fVar238;
    fVar342 = fVar380 + fVar239;
    auVar216 = vshufps_avx(auVar205,auVar205,0xaa);
    auVar138 = vshufps_avx(auVar205,auVar205,0xff);
    fVar355 = fVar367 + 0.0;
    auVar174 = vshufps_avx(auVar171,auVar171,0xaa);
    auVar139 = vshufps_avx(auVar171,auVar171,0xff);
    auVar234._0_4_ =
         fVar288 * (auVar314._0_4_ * fVar211 + fVar288 * auVar188._0_4_) + auVar314._0_4_ * fVar252;
    auVar234._4_4_ =
         fVar301 * (auVar314._4_4_ * fVar215 + fVar301 * auVar188._4_4_) + auVar314._4_4_ * fVar253;
    auVar234._8_4_ =
         fVar302 * (auVar314._8_4_ * fVar237 + fVar302 * auVar188._8_4_) + auVar314._8_4_ * fVar337;
    auVar234._12_4_ =
         fVar303 * (auVar314._12_4_ * fVar239 + fVar303 * auVar188._12_4_) +
         auVar314._12_4_ * fVar343;
    auVar234._16_4_ =
         fVar304 * (auVar314._16_4_ * fVar211 + fVar304 * auVar188._0_4_) +
         auVar314._16_4_ * fVar351;
    auVar234._20_4_ =
         fVar305 * (auVar314._20_4_ * fVar215 + fVar305 * auVar188._4_4_) +
         auVar314._20_4_ * fVar352;
    auVar234._24_4_ =
         fVar306 * (auVar314._24_4_ * fVar237 + fVar306 * auVar188._8_4_) +
         auVar314._24_4_ * fVar353;
    auVar234._28_4_ = auVar188._12_4_ + 1.0 + fVar251;
    auVar249._0_4_ =
         fVar288 * (fVar374 * auVar314._0_4_ + auVar150._0_4_ * fVar288) + auVar314._0_4_ * fVar376;
    auVar249._4_4_ =
         fVar301 * (fVar379 * auVar314._4_4_ + auVar150._4_4_ * fVar301) + auVar314._4_4_ * fVar368;
    auVar249._8_4_ =
         fVar302 * (fVar375 * auVar314._8_4_ + auVar150._8_4_ * fVar302) + auVar314._8_4_ * fVar377;
    auVar249._12_4_ =
         fVar303 * (fVar380 * auVar314._12_4_ + auVar150._12_4_ * fVar303) +
         auVar314._12_4_ * fVar338;
    auVar249._16_4_ =
         fVar304 * (fVar374 * auVar314._16_4_ + auVar150._0_4_ * fVar304) +
         auVar314._16_4_ * fVar339;
    auVar249._20_4_ =
         fVar305 * (fVar379 * auVar314._20_4_ + auVar150._4_4_ * fVar305) +
         auVar314._20_4_ * fVar340;
    auVar249._24_4_ =
         fVar306 * (fVar375 * auVar314._24_4_ + auVar150._8_4_ * fVar306) +
         auVar314._24_4_ * fVar341;
    auVar249._28_4_ = auVar279._12_4_ + fVar251;
    auVar114._0_4_ =
         fVar288 * fVar252 + auVar314._0_4_ * (fVar364 * fVar288 + auVar265._0_4_ * auVar314._0_4_);
    auVar114._4_4_ =
         fVar301 * fVar253 + auVar314._4_4_ * (fVar365 * fVar301 + auVar265._4_4_ * auVar314._4_4_);
    auVar114._8_4_ =
         fVar302 * fVar337 + auVar314._8_4_ * (fVar366 * fVar302 + auVar265._8_4_ * auVar314._8_4_);
    auVar114._12_4_ =
         fVar303 * fVar343 +
         auVar314._12_4_ * (fVar367 * fVar303 + auVar265._12_4_ * auVar314._12_4_);
    auVar114._16_4_ =
         fVar304 * fVar351 +
         auVar314._16_4_ * (fVar364 * fVar304 + auVar265._0_4_ * auVar314._16_4_);
    auVar114._20_4_ =
         fVar305 * fVar352 +
         auVar314._20_4_ * (fVar365 * fVar305 + auVar265._4_4_ * auVar314._20_4_);
    auVar114._24_4_ =
         fVar306 * fVar353 +
         auVar314._24_4_ * (fVar366 * fVar306 + auVar265._8_4_ * auVar314._24_4_);
    auVar114._28_4_ = fVar239 + 1.0 + fVar355;
    auVar324._0_4_ =
         fVar288 * fVar376 + auVar314._0_4_ * (auVar279._0_4_ * auVar314._0_4_ + fVar288 * fVar213);
    auVar324._4_4_ =
         fVar301 * fVar368 + auVar314._4_4_ * (auVar279._4_4_ * auVar314._4_4_ + fVar301 * fVar236);
    auVar324._8_4_ =
         fVar302 * fVar377 + auVar314._8_4_ * (auVar279._8_4_ * auVar314._8_4_ + fVar302 * fVar238);
    auVar324._12_4_ =
         fVar303 * fVar338 +
         auVar314._12_4_ * (auVar279._12_4_ * auVar314._12_4_ + fVar303 * fVar251);
    auVar324._16_4_ =
         fVar304 * fVar339 +
         auVar314._16_4_ * (auVar279._0_4_ * auVar314._16_4_ + fVar304 * fVar213);
    auVar324._20_4_ =
         fVar305 * fVar340 +
         auVar314._20_4_ * (auVar279._4_4_ * auVar314._20_4_ + fVar305 * fVar236);
    auVar324._24_4_ =
         fVar306 * fVar341 +
         auVar314._24_4_ * (auVar279._8_4_ * auVar314._24_4_ + fVar306 * fVar238);
    auVar324._28_4_ = fVar355 + fVar251 + 0.0;
    local_d8._0_4_ = fVar288 * auVar234._0_4_ + auVar314._0_4_ * auVar114._0_4_;
    local_d8._4_4_ = fVar301 * auVar234._4_4_ + auVar314._4_4_ * auVar114._4_4_;
    local_d8._8_4_ = fVar302 * auVar234._8_4_ + auVar314._8_4_ * auVar114._8_4_;
    local_d8._12_4_ = fVar303 * auVar234._12_4_ + auVar314._12_4_ * auVar114._12_4_;
    local_d8._16_4_ = fVar304 * auVar234._16_4_ + auVar314._16_4_ * auVar114._16_4_;
    local_d8._20_4_ = fVar305 * auVar234._20_4_ + auVar314._20_4_ * auVar114._20_4_;
    local_d8._24_4_ = fVar306 * auVar234._24_4_ + auVar314._24_4_ * auVar114._24_4_;
    local_d8._28_4_ = fVar342 + fVar251 + 0.0;
    auVar209._0_4_ = fVar288 * auVar249._0_4_ + auVar314._0_4_ * auVar324._0_4_;
    auVar209._4_4_ = fVar301 * auVar249._4_4_ + auVar314._4_4_ * auVar324._4_4_;
    auVar209._8_4_ = fVar302 * auVar249._8_4_ + auVar314._8_4_ * auVar324._8_4_;
    auVar209._12_4_ = fVar303 * auVar249._12_4_ + auVar314._12_4_ * auVar324._12_4_;
    auVar209._16_4_ = fVar304 * auVar249._16_4_ + auVar314._16_4_ * auVar324._16_4_;
    auVar209._20_4_ = fVar305 * auVar249._20_4_ + auVar314._20_4_ * auVar324._20_4_;
    auVar209._24_4_ = fVar306 * auVar249._24_4_ + auVar314._24_4_ * auVar324._24_4_;
    auVar209._28_4_ = fVar342 + fVar355;
    auVar22 = vsubps_avx(auVar114,auVar234);
    auVar112 = vsubps_avx(auVar324,auVar249);
    local_528 = auVar99._0_4_;
    fStack_524 = auVar99._4_4_;
    fStack_520 = auVar99._8_4_;
    fStack_51c = auVar99._12_4_;
    local_118 = local_528 * auVar22._0_4_ * 3.0;
    fStack_114 = fStack_524 * auVar22._4_4_ * 3.0;
    auVar23._4_4_ = fStack_114;
    auVar23._0_4_ = local_118;
    fStack_110 = fStack_520 * auVar22._8_4_ * 3.0;
    auVar23._8_4_ = fStack_110;
    fStack_10c = fStack_51c * auVar22._12_4_ * 3.0;
    auVar23._12_4_ = fStack_10c;
    fStack_108 = local_528 * auVar22._16_4_ * 3.0;
    auVar23._16_4_ = fStack_108;
    fStack_104 = fStack_524 * auVar22._20_4_ * 3.0;
    auVar23._20_4_ = fStack_104;
    fStack_100 = fStack_520 * auVar22._24_4_ * 3.0;
    auVar23._24_4_ = fStack_100;
    auVar23._28_4_ = auVar22._28_4_;
    local_138 = local_528 * auVar112._0_4_ * 3.0;
    fStack_134 = fStack_524 * auVar112._4_4_ * 3.0;
    auVar24._4_4_ = fStack_134;
    auVar24._0_4_ = local_138;
    fStack_130 = fStack_520 * auVar112._8_4_ * 3.0;
    auVar24._8_4_ = fStack_130;
    fStack_12c = fStack_51c * auVar112._12_4_ * 3.0;
    auVar24._12_4_ = fStack_12c;
    fStack_128 = local_528 * auVar112._16_4_ * 3.0;
    auVar24._16_4_ = fStack_128;
    fStack_124 = fStack_524 * auVar112._20_4_ * 3.0;
    auVar24._20_4_ = fStack_124;
    fStack_120 = fStack_520 * auVar112._24_4_ * 3.0;
    auVar24._24_4_ = fStack_120;
    auVar24._28_4_ = fVar342;
    auVar23 = vsubps_avx(local_d8,auVar23);
    auVar112 = vperm2f128_avx(auVar23,auVar23,1);
    auVar112 = vshufps_avx(auVar112,auVar23,0x30);
    auVar112 = vshufps_avx(auVar23,auVar112,0x29);
    auVar24 = vsubps_avx(auVar209,auVar24);
    auVar23 = vperm2f128_avx(auVar24,auVar24,1);
    auVar23 = vshufps_avx(auVar23,auVar24,0x30);
    auVar24 = vshufps_avx(auVar24,auVar23,0x29);
    fVar340 = auVar174._0_4_;
    fVar341 = auVar174._4_4_;
    fVar378 = auVar174._8_4_;
    fVar239 = auVar216._12_4_;
    fVar365 = auVar139._0_4_;
    fVar367 = auVar139._4_4_;
    fVar376 = auVar139._8_4_;
    fVar368 = auVar139._12_4_;
    auVar99 = vshufps_avx(auVar275,auVar275,0xaa);
    fVar211 = auVar99._0_4_;
    fVar215 = auVar99._4_4_;
    fVar237 = auVar99._8_4_;
    fVar251 = auVar99._12_4_;
    fVar337 = auVar314._0_4_ * fVar211 + fVar340 * fVar288;
    fVar343 = auVar314._4_4_ * fVar215 + fVar341 * fVar301;
    fVar351 = auVar314._8_4_ * fVar237 + fVar378 * fVar302;
    fVar352 = auVar314._12_4_ * fVar251 + auVar174._12_4_ * fVar303;
    fVar353 = auVar314._16_4_ * fVar211 + fVar340 * fVar304;
    fVar355 = auVar314._20_4_ * fVar215 + fVar341 * fVar305;
    fVar364 = auVar314._24_4_ * fVar237 + fVar378 * fVar306;
    auVar99 = vshufps_avx(auVar275,auVar275,0xff);
    fVar213 = auVar99._0_4_;
    fVar236 = auVar99._4_4_;
    fVar238 = auVar99._8_4_;
    fVar252 = auVar99._12_4_;
    fVar366 = auVar314._0_4_ * fVar213 + fVar365 * fVar288;
    fVar374 = auVar314._4_4_ * fVar236 + fVar367 * fVar301;
    fVar379 = auVar314._8_4_ * fVar238 + fVar376 * fVar302;
    fVar375 = auVar314._12_4_ * fVar252 + fVar368 * fVar303;
    fVar377 = auVar314._16_4_ * fVar213 + fVar365 * fVar304;
    fVar380 = auVar314._20_4_ * fVar236 + fVar367 * fVar305;
    fVar338 = auVar314._24_4_ * fVar238 + fVar376 * fVar306;
    auVar99 = vshufps_avx(auVar223,auVar223,0xaa);
    fVar339 = auVar99._12_4_ + fVar251;
    auVar188 = vshufps_avx(auVar223,auVar223,0xff);
    fVar253 = auVar188._12_4_;
    auVar115._0_4_ =
         fVar288 * (fVar340 * auVar314._0_4_ + fVar288 * auVar216._0_4_) + auVar314._0_4_ * fVar337;
    auVar115._4_4_ =
         fVar301 * (fVar341 * auVar314._4_4_ + fVar301 * auVar216._4_4_) + auVar314._4_4_ * fVar343;
    auVar115._8_4_ =
         fVar302 * (fVar378 * auVar314._8_4_ + fVar302 * auVar216._8_4_) + auVar314._8_4_ * fVar351;
    auVar115._12_4_ =
         fVar303 * (auVar174._12_4_ * auVar314._12_4_ + fVar303 * fVar239) +
         auVar314._12_4_ * fVar352;
    auVar115._16_4_ =
         fVar304 * (fVar340 * auVar314._16_4_ + fVar304 * auVar216._0_4_) +
         auVar314._16_4_ * fVar353;
    auVar115._20_4_ =
         fVar305 * (fVar341 * auVar314._20_4_ + fVar305 * auVar216._4_4_) +
         auVar314._20_4_ * fVar355;
    auVar115._24_4_ =
         fVar306 * (fVar378 * auVar314._24_4_ + fVar306 * auVar216._8_4_) +
         auVar314._24_4_ * fVar364;
    auVar115._28_4_ = auVar24._28_4_ + fVar239 + fVar253;
    auVar153._0_4_ =
         fVar288 * (fVar365 * auVar314._0_4_ + auVar138._0_4_ * fVar288) + auVar314._0_4_ * fVar366;
    auVar153._4_4_ =
         fVar301 * (fVar367 * auVar314._4_4_ + auVar138._4_4_ * fVar301) + auVar314._4_4_ * fVar374;
    auVar153._8_4_ =
         fVar302 * (fVar376 * auVar314._8_4_ + auVar138._8_4_ * fVar302) + auVar314._8_4_ * fVar379;
    auVar153._12_4_ =
         fVar303 * (fVar368 * auVar314._12_4_ + auVar138._12_4_ * fVar303) +
         auVar314._12_4_ * fVar375;
    auVar153._16_4_ =
         fVar304 * (fVar365 * auVar314._16_4_ + auVar138._0_4_ * fVar304) +
         auVar314._16_4_ * fVar377;
    auVar153._20_4_ =
         fVar305 * (fVar367 * auVar314._20_4_ + auVar138._4_4_ * fVar305) +
         auVar314._20_4_ * fVar380;
    auVar153._24_4_ =
         fVar306 * (fVar376 * auVar314._24_4_ + auVar138._8_4_ * fVar306) +
         auVar314._24_4_ * fVar338;
    auVar153._28_4_ = fVar239 + auVar23._28_4_ + fVar253;
    auVar23 = vperm2f128_avx(local_d8,local_d8,1);
    auVar23 = vshufps_avx(auVar23,local_d8,0x30);
    auVar113 = vshufps_avx(local_d8,auVar23,0x29);
    auVar250._0_4_ =
         auVar314._0_4_ * (auVar99._0_4_ * auVar314._0_4_ + fVar288 * fVar211) + fVar288 * fVar337;
    auVar250._4_4_ =
         auVar314._4_4_ * (auVar99._4_4_ * auVar314._4_4_ + fVar301 * fVar215) + fVar301 * fVar343;
    auVar250._8_4_ =
         auVar314._8_4_ * (auVar99._8_4_ * auVar314._8_4_ + fVar302 * fVar237) + fVar302 * fVar351;
    auVar250._12_4_ =
         auVar314._12_4_ * (auVar99._12_4_ * auVar314._12_4_ + fVar303 * fVar251) +
         fVar303 * fVar352;
    auVar250._16_4_ =
         auVar314._16_4_ * (auVar99._0_4_ * auVar314._16_4_ + fVar304 * fVar211) + fVar304 * fVar353
    ;
    auVar250._20_4_ =
         auVar314._20_4_ * (auVar99._4_4_ * auVar314._20_4_ + fVar305 * fVar215) + fVar305 * fVar355
    ;
    auVar250._24_4_ =
         auVar314._24_4_ * (auVar99._8_4_ * auVar314._24_4_ + fVar306 * fVar237) + fVar306 * fVar364
    ;
    auVar250._28_4_ = fVar339 + fVar354 + auVar249._28_4_;
    auVar286._0_4_ =
         fVar288 * fVar366 + auVar314._0_4_ * (auVar314._0_4_ * auVar188._0_4_ + fVar288 * fVar213);
    auVar286._4_4_ =
         fVar301 * fVar374 + auVar314._4_4_ * (auVar314._4_4_ * auVar188._4_4_ + fVar301 * fVar236);
    auVar286._8_4_ =
         fVar302 * fVar379 + auVar314._8_4_ * (auVar314._8_4_ * auVar188._8_4_ + fVar302 * fVar238);
    auVar286._12_4_ =
         fVar303 * fVar375 + auVar314._12_4_ * (auVar314._12_4_ * fVar253 + fVar303 * fVar252);
    auVar286._16_4_ =
         fVar304 * fVar377 +
         auVar314._16_4_ * (auVar314._16_4_ * auVar188._0_4_ + fVar304 * fVar213);
    auVar286._20_4_ =
         fVar305 * fVar380 +
         auVar314._20_4_ * (auVar314._20_4_ * auVar188._4_4_ + fVar305 * fVar236);
    auVar286._24_4_ =
         fVar306 * fVar338 +
         auVar314._24_4_ * (auVar314._24_4_ * auVar188._8_4_ + fVar306 * fVar238);
    auVar286._28_4_ = fVar354 + fVar368 + fVar253 + fVar252;
    auVar278._0_4_ = fVar288 * auVar115._0_4_ + auVar314._0_4_ * auVar250._0_4_;
    auVar278._4_4_ = fVar301 * auVar115._4_4_ + auVar314._4_4_ * auVar250._4_4_;
    auVar278._8_4_ = fVar302 * auVar115._8_4_ + auVar314._8_4_ * auVar250._8_4_;
    auVar278._12_4_ = fVar303 * auVar115._12_4_ + auVar314._12_4_ * auVar250._12_4_;
    auVar278._16_4_ = fVar304 * auVar115._16_4_ + auVar314._16_4_ * auVar250._16_4_;
    auVar278._20_4_ = fVar305 * auVar115._20_4_ + auVar314._20_4_ * auVar250._20_4_;
    auVar278._24_4_ = fVar306 * auVar115._24_4_ + auVar314._24_4_ * auVar250._24_4_;
    auVar278._28_4_ = fVar339 + fVar253 + fVar252;
    auVar299._0_4_ = fVar288 * auVar153._0_4_ + auVar314._0_4_ * auVar286._0_4_;
    auVar299._4_4_ = fVar301 * auVar153._4_4_ + auVar314._4_4_ * auVar286._4_4_;
    auVar299._8_4_ = fVar302 * auVar153._8_4_ + auVar314._8_4_ * auVar286._8_4_;
    auVar299._12_4_ = fVar303 * auVar153._12_4_ + auVar314._12_4_ * auVar286._12_4_;
    auVar299._16_4_ = fVar304 * auVar153._16_4_ + auVar314._16_4_ * auVar286._16_4_;
    auVar299._20_4_ = fVar305 * auVar153._20_4_ + auVar314._20_4_ * auVar286._20_4_;
    auVar299._24_4_ = fVar306 * auVar153._24_4_ + auVar314._24_4_ * auVar286._24_4_;
    auVar299._28_4_ = auVar21._28_4_ + auVar314._28_4_;
    auVar25 = vsubps_avx(auVar250,auVar115);
    auVar23 = vsubps_avx(auVar286,auVar153);
    local_158 = local_528 * auVar25._0_4_ * 3.0;
    fStack_154 = fStack_524 * auVar25._4_4_ * 3.0;
    auVar21._4_4_ = fStack_154;
    auVar21._0_4_ = local_158;
    fStack_150 = fStack_520 * auVar25._8_4_ * 3.0;
    auVar21._8_4_ = fStack_150;
    fStack_14c = fStack_51c * auVar25._12_4_ * 3.0;
    auVar21._12_4_ = fStack_14c;
    fStack_148 = local_528 * auVar25._16_4_ * 3.0;
    auVar21._16_4_ = fStack_148;
    fStack_144 = fStack_524 * auVar25._20_4_ * 3.0;
    auVar21._20_4_ = fStack_144;
    fStack_140 = fStack_520 * auVar25._24_4_ * 3.0;
    auVar21._24_4_ = fStack_140;
    auVar21._28_4_ = auVar25._28_4_;
    local_178 = local_528 * auVar23._0_4_ * 3.0;
    fStack_174 = fStack_524 * auVar23._4_4_ * 3.0;
    auVar26._4_4_ = fStack_174;
    auVar26._0_4_ = local_178;
    fStack_170 = fStack_520 * auVar23._8_4_ * 3.0;
    auVar26._8_4_ = fStack_170;
    fStack_16c = fStack_51c * auVar23._12_4_ * 3.0;
    auVar26._12_4_ = fStack_16c;
    fStack_168 = local_528 * auVar23._16_4_ * 3.0;
    auVar26._16_4_ = fStack_168;
    fStack_164 = fStack_524 * auVar23._20_4_ * 3.0;
    auVar26._20_4_ = fStack_164;
    fStack_160 = fStack_520 * auVar23._24_4_ * 3.0;
    auVar26._24_4_ = fStack_160;
    auVar26._28_4_ = auVar250._28_4_;
    auVar23 = vperm2f128_avx(auVar278,auVar278,1);
    auVar23 = vshufps_avx(auVar23,auVar278,0x30);
    auVar114 = vshufps_avx(auVar278,auVar23,0x29);
    auVar21 = vsubps_avx(auVar278,auVar21);
    auVar23 = vperm2f128_avx(auVar21,auVar21,1);
    auVar23 = vshufps_avx(auVar23,auVar21,0x30);
    auVar23 = vshufps_avx(auVar21,auVar23,0x29);
    auVar26 = vsubps_avx(auVar299,auVar26);
    auVar21 = vperm2f128_avx(auVar26,auVar26,1);
    auVar21 = vshufps_avx(auVar21,auVar26,0x30);
    local_b8 = vshufps_avx(auVar26,auVar21,0x29);
    auVar27 = vsubps_avx(auVar278,local_d8);
    auVar115 = vsubps_avx(auVar114,auVar113);
    fVar211 = auVar115._0_4_ + auVar27._0_4_;
    fVar213 = auVar115._4_4_ + auVar27._4_4_;
    fVar215 = auVar115._8_4_ + auVar27._8_4_;
    fVar236 = auVar115._12_4_ + auVar27._12_4_;
    fVar237 = auVar115._16_4_ + auVar27._16_4_;
    fVar238 = auVar115._20_4_ + auVar27._20_4_;
    fVar239 = auVar115._24_4_ + auVar27._24_4_;
    auVar21 = vperm2f128_avx(auVar209,auVar209,1);
    auVar21 = vshufps_avx(auVar21,auVar209,0x30);
    local_f8 = vshufps_avx(auVar209,auVar21,0x29);
    auVar21 = vperm2f128_avx(auVar299,auVar299,1);
    auVar21 = vshufps_avx(auVar21,auVar299,0x30);
    auVar26 = vshufps_avx(auVar299,auVar21,0x29);
    auVar21 = vsubps_avx(auVar299,auVar209);
    auVar153 = vsubps_avx(auVar26,local_f8);
    fVar251 = auVar153._0_4_ + auVar21._0_4_;
    fVar252 = auVar153._4_4_ + auVar21._4_4_;
    fVar253 = auVar153._8_4_ + auVar21._8_4_;
    fVar337 = auVar153._12_4_ + auVar21._12_4_;
    fVar343 = auVar153._16_4_ + auVar21._16_4_;
    fVar351 = auVar153._20_4_ + auVar21._20_4_;
    fVar352 = auVar153._24_4_ + auVar21._24_4_;
    auVar28._4_4_ = fVar213 * auVar209._4_4_;
    auVar28._0_4_ = fVar211 * auVar209._0_4_;
    auVar28._8_4_ = fVar215 * auVar209._8_4_;
    auVar28._12_4_ = fVar236 * auVar209._12_4_;
    auVar28._16_4_ = fVar237 * auVar209._16_4_;
    auVar28._20_4_ = fVar238 * auVar209._20_4_;
    auVar28._24_4_ = fVar239 * auVar209._24_4_;
    auVar28._28_4_ = auVar21._28_4_;
    auVar29._4_4_ = fVar252 * local_d8._4_4_;
    auVar29._0_4_ = fVar251 * local_d8._0_4_;
    auVar29._8_4_ = fVar253 * local_d8._8_4_;
    auVar29._12_4_ = fVar337 * local_d8._12_4_;
    auVar29._16_4_ = fVar343 * local_d8._16_4_;
    auVar29._20_4_ = fVar351 * local_d8._20_4_;
    auVar29._24_4_ = fVar352 * local_d8._24_4_;
    auVar29._28_4_ = fVar339;
    auVar28 = vsubps_avx(auVar28,auVar29);
    local_118 = local_d8._0_4_ + local_118;
    fStack_114 = local_d8._4_4_ + fStack_114;
    fStack_110 = local_d8._8_4_ + fStack_110;
    fStack_10c = local_d8._12_4_ + fStack_10c;
    fStack_108 = local_d8._16_4_ + fStack_108;
    fStack_104 = local_d8._20_4_ + fStack_104;
    fStack_100 = local_d8._24_4_ + fStack_100;
    fStack_fc = local_d8._28_4_ + auVar22._28_4_;
    local_138 = local_138 + auVar209._0_4_;
    fStack_134 = fStack_134 + auVar209._4_4_;
    fStack_130 = fStack_130 + auVar209._8_4_;
    fStack_12c = fStack_12c + auVar209._12_4_;
    fStack_128 = fStack_128 + auVar209._16_4_;
    fStack_124 = fStack_124 + auVar209._20_4_;
    fStack_120 = fStack_120 + auVar209._24_4_;
    fStack_11c = fVar342 + auVar209._28_4_;
    auVar22._4_4_ = fVar213 * fStack_134;
    auVar22._0_4_ = fVar211 * local_138;
    auVar22._8_4_ = fVar215 * fStack_130;
    auVar22._12_4_ = fVar236 * fStack_12c;
    auVar22._16_4_ = fVar237 * fStack_128;
    auVar22._20_4_ = fVar238 * fStack_124;
    auVar22._24_4_ = fVar239 * fStack_120;
    auVar22._28_4_ = fVar342;
    auVar30._4_4_ = fVar252 * fStack_114;
    auVar30._0_4_ = fVar251 * local_118;
    auVar30._8_4_ = fVar253 * fStack_110;
    auVar30._12_4_ = fVar337 * fStack_10c;
    auVar30._16_4_ = fVar343 * fStack_108;
    auVar30._20_4_ = fVar351 * fStack_104;
    auVar30._24_4_ = fVar352 * fStack_100;
    auVar30._28_4_ = fVar342 + auVar209._28_4_;
    auVar22 = vsubps_avx(auVar22,auVar30);
    local_508 = auVar24._0_4_;
    fStack_504 = auVar24._4_4_;
    fStack_500 = auVar24._8_4_;
    fStack_4fc = auVar24._12_4_;
    fStack_4f8 = auVar24._16_4_;
    fStack_4f4 = auVar24._20_4_;
    fStack_4f0 = auVar24._24_4_;
    auVar31._4_4_ = fVar213 * fStack_504;
    auVar31._0_4_ = fVar211 * local_508;
    auVar31._8_4_ = fVar215 * fStack_500;
    auVar31._12_4_ = fVar236 * fStack_4fc;
    auVar31._16_4_ = fVar237 * fStack_4f8;
    auVar31._20_4_ = fVar238 * fStack_4f4;
    auVar31._24_4_ = fVar239 * fStack_4f0;
    auVar31._28_4_ = fVar342;
    local_5c8 = auVar112._0_4_;
    fStack_5c4 = auVar112._4_4_;
    fStack_5c0 = auVar112._8_4_;
    fStack_5bc = auVar112._12_4_;
    fStack_5b8 = auVar112._16_4_;
    fStack_5b4 = auVar112._20_4_;
    fStack_5b0 = auVar112._24_4_;
    auVar32._4_4_ = fVar252 * fStack_5c4;
    auVar32._0_4_ = fVar251 * local_5c8;
    auVar32._8_4_ = fVar253 * fStack_5c0;
    auVar32._12_4_ = fVar337 * fStack_5bc;
    auVar32._16_4_ = fVar343 * fStack_5b8;
    auVar32._20_4_ = fVar351 * fStack_5b4;
    auVar32._24_4_ = fVar352 * fStack_5b0;
    auVar32._28_4_ = local_d8._28_4_;
    auVar29 = vsubps_avx(auVar31,auVar32);
    auVar33._4_4_ = local_f8._4_4_ * fVar213;
    auVar33._0_4_ = local_f8._0_4_ * fVar211;
    auVar33._8_4_ = local_f8._8_4_ * fVar215;
    auVar33._12_4_ = local_f8._12_4_ * fVar236;
    auVar33._16_4_ = local_f8._16_4_ * fVar237;
    auVar33._20_4_ = local_f8._20_4_ * fVar238;
    auVar33._24_4_ = local_f8._24_4_ * fVar239;
    auVar33._28_4_ = fVar342;
    auVar34._4_4_ = auVar113._4_4_ * fVar252;
    auVar34._0_4_ = auVar113._0_4_ * fVar251;
    auVar34._8_4_ = auVar113._8_4_ * fVar253;
    auVar34._12_4_ = auVar113._12_4_ * fVar337;
    auVar34._16_4_ = auVar113._16_4_ * fVar343;
    auVar34._20_4_ = auVar113._20_4_ * fVar351;
    auVar34._24_4_ = auVar113._24_4_ * fVar352;
    auVar34._28_4_ = local_f8._28_4_;
    local_528 = auVar23._0_4_;
    fStack_524 = auVar23._4_4_;
    fStack_520 = auVar23._8_4_;
    fStack_51c = auVar23._12_4_;
    fStack_518 = auVar23._16_4_;
    fStack_514 = auVar23._20_4_;
    fStack_510 = auVar23._24_4_;
    auVar30 = vsubps_avx(auVar33,auVar34);
    auVar35._4_4_ = auVar299._4_4_ * fVar213;
    auVar35._0_4_ = auVar299._0_4_ * fVar211;
    auVar35._8_4_ = auVar299._8_4_ * fVar215;
    auVar35._12_4_ = auVar299._12_4_ * fVar236;
    auVar35._16_4_ = auVar299._16_4_ * fVar237;
    auVar35._20_4_ = auVar299._20_4_ * fVar238;
    auVar35._24_4_ = auVar299._24_4_ * fVar239;
    auVar35._28_4_ = fVar342;
    auVar36._4_4_ = fVar252 * auVar278._4_4_;
    auVar36._0_4_ = fVar251 * auVar278._0_4_;
    auVar36._8_4_ = fVar253 * auVar278._8_4_;
    auVar36._12_4_ = fVar337 * auVar278._12_4_;
    auVar36._16_4_ = fVar343 * auVar278._16_4_;
    auVar36._20_4_ = fVar351 * auVar278._20_4_;
    auVar36._24_4_ = fVar352 * auVar278._24_4_;
    auVar36._28_4_ = fStack_fc;
    auVar31 = vsubps_avx(auVar35,auVar36);
    local_158 = auVar278._0_4_ + local_158;
    fStack_154 = auVar278._4_4_ + fStack_154;
    fStack_150 = auVar278._8_4_ + fStack_150;
    fStack_14c = auVar278._12_4_ + fStack_14c;
    fStack_148 = auVar278._16_4_ + fStack_148;
    fStack_144 = auVar278._20_4_ + fStack_144;
    fStack_140 = auVar278._24_4_ + fStack_140;
    fStack_13c = auVar278._28_4_ + auVar25._28_4_;
    local_178 = auVar299._0_4_ + local_178;
    fStack_174 = auVar299._4_4_ + fStack_174;
    fStack_170 = auVar299._8_4_ + fStack_170;
    fStack_16c = auVar299._12_4_ + fStack_16c;
    fStack_168 = auVar299._16_4_ + fStack_168;
    fStack_164 = auVar299._20_4_ + fStack_164;
    fStack_160 = auVar299._24_4_ + fStack_160;
    fStack_15c = auVar299._28_4_ + auVar250._28_4_;
    auVar25._4_4_ = fVar213 * fStack_174;
    auVar25._0_4_ = fVar211 * local_178;
    auVar25._8_4_ = fVar215 * fStack_170;
    auVar25._12_4_ = fVar236 * fStack_16c;
    auVar25._16_4_ = fVar237 * fStack_168;
    auVar25._20_4_ = fVar238 * fStack_164;
    auVar25._24_4_ = fVar239 * fStack_160;
    auVar25._28_4_ = auVar299._28_4_ + auVar250._28_4_;
    auVar37._4_4_ = fStack_154 * fVar252;
    auVar37._0_4_ = local_158 * fVar251;
    auVar37._8_4_ = fStack_150 * fVar253;
    auVar37._12_4_ = fStack_14c * fVar337;
    auVar37._16_4_ = fStack_148 * fVar343;
    auVar37._20_4_ = fStack_144 * fVar351;
    auVar37._24_4_ = fStack_140 * fVar352;
    auVar37._28_4_ = fStack_13c;
    auVar25 = vsubps_avx(auVar25,auVar37);
    auVar38._4_4_ = fVar213 * local_b8._4_4_;
    auVar38._0_4_ = fVar211 * local_b8._0_4_;
    auVar38._8_4_ = fVar215 * local_b8._8_4_;
    auVar38._12_4_ = fVar236 * local_b8._12_4_;
    auVar38._16_4_ = fVar237 * local_b8._16_4_;
    auVar38._20_4_ = fVar238 * local_b8._20_4_;
    auVar38._24_4_ = fVar239 * local_b8._24_4_;
    auVar38._28_4_ = fStack_13c;
    auVar39._4_4_ = fVar252 * fStack_524;
    auVar39._0_4_ = fVar251 * local_528;
    auVar39._8_4_ = fVar253 * fStack_520;
    auVar39._12_4_ = fVar337 * fStack_51c;
    auVar39._16_4_ = fVar343 * fStack_518;
    auVar39._20_4_ = fVar351 * fStack_514;
    auVar39._24_4_ = fVar352 * fStack_510;
    auVar39._28_4_ = local_b8._28_4_;
    auVar32 = vsubps_avx(auVar38,auVar39);
    auVar40._4_4_ = fVar213 * auVar26._4_4_;
    auVar40._0_4_ = fVar211 * auVar26._0_4_;
    auVar40._8_4_ = fVar215 * auVar26._8_4_;
    auVar40._12_4_ = fVar236 * auVar26._12_4_;
    auVar40._16_4_ = fVar237 * auVar26._16_4_;
    auVar40._20_4_ = fVar238 * auVar26._20_4_;
    auVar40._24_4_ = fVar239 * auVar26._24_4_;
    auVar40._28_4_ = auVar115._28_4_ + auVar27._28_4_;
    auVar27._4_4_ = auVar114._4_4_ * fVar252;
    auVar27._0_4_ = auVar114._0_4_ * fVar251;
    auVar27._8_4_ = auVar114._8_4_ * fVar253;
    auVar27._12_4_ = auVar114._12_4_ * fVar337;
    auVar27._16_4_ = auVar114._16_4_ * fVar343;
    auVar27._20_4_ = auVar114._20_4_ * fVar351;
    auVar27._24_4_ = auVar114._24_4_ * fVar352;
    auVar27._28_4_ = auVar153._28_4_ + auVar21._28_4_;
    auVar27 = vsubps_avx(auVar40,auVar27);
    auVar23 = vminps_avx(auVar28,auVar22);
    auVar112 = vmaxps_avx(auVar28,auVar22);
    auVar24 = vminps_avx(auVar29,auVar30);
    auVar24 = vminps_avx(auVar23,auVar24);
    auVar23 = vmaxps_avx(auVar29,auVar30);
    auVar112 = vmaxps_avx(auVar112,auVar23);
    auVar21 = vminps_avx(auVar31,auVar25);
    auVar23 = vmaxps_avx(auVar31,auVar25);
    auVar22 = vminps_avx(auVar32,auVar27);
    auVar22 = vminps_avx(auVar21,auVar22);
    auVar22 = vminps_avx(auVar24,auVar22);
    auVar24 = vmaxps_avx(auVar32,auVar27);
    auVar23 = vmaxps_avx(auVar23,auVar24);
    auVar23 = vmaxps_avx(auVar112,auVar23);
    auVar112 = vcmpps_avx(auVar22,local_78,2);
    auVar23 = vcmpps_avx(auVar23,local_98,5);
    auVar112 = vandps_avx(auVar23,auVar112);
    auVar23 = local_198 & auVar112;
    if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar23 >> 0x7f,0) != '\0') ||
          (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar23 >> 0xbf,0) != '\0') ||
        (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar23[0x1f] < '\0')
    {
      auVar23 = vsubps_avx(auVar113,local_d8);
      auVar24 = vsubps_avx(auVar114,auVar278);
      fVar213 = auVar23._0_4_ + auVar24._0_4_;
      fVar215 = auVar23._4_4_ + auVar24._4_4_;
      fVar236 = auVar23._8_4_ + auVar24._8_4_;
      fVar237 = auVar23._12_4_ + auVar24._12_4_;
      fVar238 = auVar23._16_4_ + auVar24._16_4_;
      fVar239 = auVar23._20_4_ + auVar24._20_4_;
      fVar251 = auVar23._24_4_ + auVar24._24_4_;
      auVar22 = vsubps_avx(local_f8,auVar209);
      auVar25 = vsubps_avx(auVar26,auVar299);
      fVar252 = auVar22._0_4_ + auVar25._0_4_;
      fVar253 = auVar22._4_4_ + auVar25._4_4_;
      fVar337 = auVar22._8_4_ + auVar25._8_4_;
      fVar343 = auVar22._12_4_ + auVar25._12_4_;
      fVar351 = auVar22._16_4_ + auVar25._16_4_;
      fVar352 = auVar22._20_4_ + auVar25._20_4_;
      fVar353 = auVar22._24_4_ + auVar25._24_4_;
      fVar211 = auVar25._28_4_;
      auVar41._4_4_ = auVar209._4_4_ * fVar215;
      auVar41._0_4_ = auVar209._0_4_ * fVar213;
      auVar41._8_4_ = auVar209._8_4_ * fVar236;
      auVar41._12_4_ = auVar209._12_4_ * fVar237;
      auVar41._16_4_ = auVar209._16_4_ * fVar238;
      auVar41._20_4_ = auVar209._20_4_ * fVar239;
      auVar41._24_4_ = auVar209._24_4_ * fVar251;
      auVar41._28_4_ = auVar209._28_4_;
      auVar42._4_4_ = local_d8._4_4_ * fVar253;
      auVar42._0_4_ = local_d8._0_4_ * fVar252;
      auVar42._8_4_ = local_d8._8_4_ * fVar337;
      auVar42._12_4_ = local_d8._12_4_ * fVar343;
      auVar42._16_4_ = local_d8._16_4_ * fVar351;
      auVar42._20_4_ = local_d8._20_4_ * fVar352;
      auVar42._24_4_ = local_d8._24_4_ * fVar353;
      auVar42._28_4_ = local_d8._28_4_;
      auVar25 = vsubps_avx(auVar41,auVar42);
      auVar43._4_4_ = fVar215 * fStack_134;
      auVar43._0_4_ = fVar213 * local_138;
      auVar43._8_4_ = fVar236 * fStack_130;
      auVar43._12_4_ = fVar237 * fStack_12c;
      auVar43._16_4_ = fVar238 * fStack_128;
      auVar43._20_4_ = fVar239 * fStack_124;
      auVar43._24_4_ = fVar251 * fStack_120;
      auVar43._28_4_ = auVar209._28_4_;
      auVar44._4_4_ = fVar253 * fStack_114;
      auVar44._0_4_ = fVar252 * local_118;
      auVar44._8_4_ = fVar337 * fStack_110;
      auVar44._12_4_ = fVar343 * fStack_10c;
      auVar44._16_4_ = fVar351 * fStack_108;
      auVar44._20_4_ = fVar352 * fStack_104;
      auVar44._24_4_ = fVar353 * fStack_100;
      auVar44._28_4_ = fVar211;
      auVar27 = vsubps_avx(auVar43,auVar44);
      auVar45._4_4_ = fVar215 * fStack_504;
      auVar45._0_4_ = fVar213 * local_508;
      auVar45._8_4_ = fVar236 * fStack_500;
      auVar45._12_4_ = fVar237 * fStack_4fc;
      auVar45._16_4_ = fVar238 * fStack_4f8;
      auVar45._20_4_ = fVar239 * fStack_4f4;
      auVar45._24_4_ = fVar251 * fStack_4f0;
      auVar45._28_4_ = fVar211;
      auVar46._4_4_ = fVar253 * fStack_5c4;
      auVar46._0_4_ = fVar252 * local_5c8;
      auVar46._8_4_ = fVar337 * fStack_5c0;
      auVar46._12_4_ = fVar343 * fStack_5bc;
      auVar46._16_4_ = fVar351 * fStack_5b8;
      auVar46._20_4_ = fVar352 * fStack_5b4;
      auVar46._24_4_ = fVar353 * fStack_5b0;
      auVar46._28_4_ = auVar21._28_4_;
      auVar115 = vsubps_avx(auVar45,auVar46);
      auVar47._4_4_ = local_f8._4_4_ * fVar215;
      auVar47._0_4_ = local_f8._0_4_ * fVar213;
      auVar47._8_4_ = local_f8._8_4_ * fVar236;
      auVar47._12_4_ = local_f8._12_4_ * fVar237;
      auVar47._16_4_ = local_f8._16_4_ * fVar238;
      auVar47._20_4_ = local_f8._20_4_ * fVar239;
      auVar47._24_4_ = local_f8._24_4_ * fVar251;
      auVar47._28_4_ = auVar21._28_4_;
      auVar48._4_4_ = auVar113._4_4_ * fVar253;
      auVar48._0_4_ = auVar113._0_4_ * fVar252;
      auVar48._8_4_ = auVar113._8_4_ * fVar337;
      auVar48._12_4_ = auVar113._12_4_ * fVar343;
      auVar48._16_4_ = auVar113._16_4_ * fVar351;
      auVar48._20_4_ = auVar113._20_4_ * fVar352;
      uVar4 = auVar113._28_4_;
      auVar48._24_4_ = auVar113._24_4_ * fVar353;
      auVar48._28_4_ = uVar4;
      auVar113 = vsubps_avx(auVar47,auVar48);
      auVar49._4_4_ = auVar299._4_4_ * fVar215;
      auVar49._0_4_ = auVar299._0_4_ * fVar213;
      auVar49._8_4_ = auVar299._8_4_ * fVar236;
      auVar49._12_4_ = auVar299._12_4_ * fVar237;
      auVar49._16_4_ = auVar299._16_4_ * fVar238;
      auVar49._20_4_ = auVar299._20_4_ * fVar239;
      auVar49._24_4_ = auVar299._24_4_ * fVar251;
      auVar49._28_4_ = uVar4;
      auVar50._4_4_ = auVar278._4_4_ * fVar253;
      auVar50._0_4_ = auVar278._0_4_ * fVar252;
      auVar50._8_4_ = auVar278._8_4_ * fVar337;
      auVar50._12_4_ = auVar278._12_4_ * fVar343;
      auVar50._16_4_ = auVar278._16_4_ * fVar351;
      auVar50._20_4_ = auVar278._20_4_ * fVar352;
      auVar50._24_4_ = auVar278._24_4_ * fVar353;
      auVar50._28_4_ = auVar278._28_4_;
      auVar153 = vsubps_avx(auVar49,auVar50);
      auVar51._4_4_ = fVar215 * fStack_174;
      auVar51._0_4_ = fVar213 * local_178;
      auVar51._8_4_ = fVar236 * fStack_170;
      auVar51._12_4_ = fVar237 * fStack_16c;
      auVar51._16_4_ = fVar238 * fStack_168;
      auVar51._20_4_ = fVar239 * fStack_164;
      auVar51._24_4_ = fVar251 * fStack_160;
      auVar51._28_4_ = uVar4;
      auVar52._4_4_ = fVar253 * fStack_154;
      auVar52._0_4_ = fVar252 * local_158;
      auVar52._8_4_ = fVar337 * fStack_150;
      auVar52._12_4_ = fVar343 * fStack_14c;
      auVar52._16_4_ = fVar351 * fStack_148;
      auVar52._20_4_ = fVar352 * fStack_144;
      auVar52._24_4_ = fVar353 * fStack_140;
      auVar52._28_4_ = auVar299._28_4_;
      auVar28 = vsubps_avx(auVar51,auVar52);
      auVar53._4_4_ = fVar215 * local_b8._4_4_;
      auVar53._0_4_ = fVar213 * local_b8._0_4_;
      auVar53._8_4_ = fVar236 * local_b8._8_4_;
      auVar53._12_4_ = fVar237 * local_b8._12_4_;
      auVar53._16_4_ = fVar238 * local_b8._16_4_;
      auVar53._20_4_ = fVar239 * local_b8._20_4_;
      auVar53._24_4_ = fVar251 * local_b8._24_4_;
      auVar53._28_4_ = auVar299._28_4_;
      auVar54._4_4_ = fStack_524 * fVar253;
      auVar54._0_4_ = local_528 * fVar252;
      auVar54._8_4_ = fStack_520 * fVar337;
      auVar54._12_4_ = fStack_51c * fVar343;
      auVar54._16_4_ = fStack_518 * fVar351;
      auVar54._20_4_ = fStack_514 * fVar352;
      auVar54._24_4_ = fStack_510 * fVar353;
      auVar54._28_4_ = local_f8._28_4_;
      auVar29 = vsubps_avx(auVar53,auVar54);
      auVar55._4_4_ = fVar215 * auVar26._4_4_;
      auVar55._0_4_ = fVar213 * auVar26._0_4_;
      auVar55._8_4_ = fVar236 * auVar26._8_4_;
      auVar55._12_4_ = fVar237 * auVar26._12_4_;
      auVar55._16_4_ = fVar238 * auVar26._16_4_;
      auVar55._20_4_ = fVar239 * auVar26._20_4_;
      auVar55._24_4_ = fVar251 * auVar26._24_4_;
      auVar55._28_4_ = auVar23._28_4_ + auVar24._28_4_;
      auVar56._4_4_ = auVar114._4_4_ * fVar253;
      auVar56._0_4_ = auVar114._0_4_ * fVar252;
      auVar56._8_4_ = auVar114._8_4_ * fVar337;
      auVar56._12_4_ = auVar114._12_4_ * fVar343;
      auVar56._16_4_ = auVar114._16_4_ * fVar351;
      auVar56._20_4_ = auVar114._20_4_ * fVar352;
      auVar56._24_4_ = auVar114._24_4_ * fVar353;
      auVar56._28_4_ = auVar22._28_4_ + fVar211;
      auVar114 = vsubps_avx(auVar55,auVar56);
      auVar24 = vminps_avx(auVar25,auVar27);
      auVar23 = vmaxps_avx(auVar25,auVar27);
      auVar21 = vminps_avx(auVar115,auVar113);
      auVar21 = vminps_avx(auVar24,auVar21);
      auVar24 = vmaxps_avx(auVar115,auVar113);
      auVar23 = vmaxps_avx(auVar23,auVar24);
      auVar22 = vminps_avx(auVar153,auVar28);
      auVar24 = vmaxps_avx(auVar153,auVar28);
      auVar113 = vminps_avx(auVar29,auVar114);
      auVar22 = vminps_avx(auVar22,auVar113);
      auVar22 = vminps_avx(auVar21,auVar22);
      auVar21 = vmaxps_avx(auVar29,auVar114);
      auVar24 = vmaxps_avx(auVar24,auVar21);
      auVar24 = vmaxps_avx(auVar23,auVar24);
      auVar23 = vcmpps_avx(auVar22,local_78,2);
      auVar24 = vcmpps_avx(auVar24,local_98,5);
      auVar23 = vandps_avx(auVar24,auVar23);
      auVar112 = vandps_avx(local_198,auVar112);
      auVar24 = auVar112 & auVar23;
      if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar24 >> 0x7f,0) != '\0') ||
            (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar24 >> 0xbf,0) != '\0') ||
          (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar24[0x1f] < '\0') {
        auVar112 = vandps_avx(auVar23,auVar112);
        uVar70 = vmovmskps_avx(auVar112);
        if (uVar70 != 0) {
          mask_stack[uVar72] = uVar70 & 0xff;
          BVar5 = (BBox1f)vmovlps_avx(auVar290);
          cu_stack[uVar72] = BVar5;
          BVar5 = (BBox1f)vmovlps_avx(auVar280);
          cv_stack[uVar72] = BVar5;
          uVar72 = (ulong)((int)uVar72 + 1);
        }
      }
    }
LAB_00918539:
    do {
      do {
        do {
          do {
            if ((int)uVar72 == 0) {
              uVar4 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar111._4_4_ = uVar4;
              auVar111._0_4_ = uVar4;
              auVar111._8_4_ = uVar4;
              auVar111._12_4_ = uVar4;
              auVar89 = vcmpps_avx(auVar240,auVar111,2);
              uVar71 = vmovmskps_avx(auVar89);
              uVar77 = uVar77 & uVar77 + 0xf & uVar71;
              auVar58 = ZEXT812(0) << 0x20;
              goto LAB_00917276;
            }
            uVar73 = (int)uVar72 - 1;
            uVar70 = mask_stack[uVar73];
            fVar211 = cu_stack[uVar73].lower;
            fVar213 = cu_stack[uVar73].upper;
            auVar319._8_8_ = 0;
            auVar319._0_4_ = cv_stack[uVar73].lower;
            auVar319._4_4_ = cv_stack[uVar73].upper;
            auVar325 = ZEXT1664(auVar319);
            uVar15 = 0;
            if (uVar70 != 0) {
              for (; (uVar70 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
              }
            }
            uVar70 = uVar70 - 1 & uVar70;
            mask_stack[uVar73] = uVar70;
            if (uVar70 == 0) {
              uVar72 = (ulong)uVar73;
            }
            fVar236 = (float)(uVar15 + 1) * 0.14285715;
            fVar215 = (1.0 - (float)uVar15 * 0.14285715) * fVar211 +
                      fVar213 * (float)uVar15 * 0.14285715;
            fVar211 = (1.0 - fVar236) * fVar211 + fVar213 * fVar236;
            fVar213 = fVar211 - fVar215;
            if (0.16666667 <= fVar213) {
              auVar99 = vinsertps_avx(ZEXT416((uint)fVar215),ZEXT416((uint)fVar211),0x10);
              auVar373 = ZEXT1664(auVar99);
              goto LAB_00917edf;
            }
            auVar99 = vshufps_avx(auVar319,auVar319,0x50);
            auVar136._8_4_ = 0x3f800000;
            auVar136._0_8_ = 0x3f8000003f800000;
            auVar136._12_4_ = 0x3f800000;
            auVar216 = vsubps_avx(auVar136,auVar99);
            fVar236 = auVar99._0_4_;
            fVar237 = auVar99._4_4_;
            fVar238 = auVar99._8_4_;
            fVar239 = auVar99._12_4_;
            fVar251 = auVar216._0_4_;
            fVar252 = auVar216._4_4_;
            fVar253 = auVar216._8_4_;
            fVar337 = auVar216._12_4_;
            auVar172._0_4_ = fVar236 * auVar282._0_4_ + fVar251 * (float)local_608._0_4_;
            auVar172._4_4_ = fVar237 * auVar282._4_4_ + fVar252 * (float)local_608._4_4_;
            auVar172._8_4_ = fVar238 * auVar282._0_4_ + fVar253 * (float)local_608._0_4_;
            auVar172._12_4_ = fVar239 * auVar282._4_4_ + fVar337 * (float)local_608._4_4_;
            auVar224._0_4_ = auVar294._0_4_ * fVar236 + auVar349._0_4_ * fVar251;
            auVar224._4_4_ = auVar294._4_4_ * fVar237 + auVar349._4_4_ * fVar252;
            auVar224._8_4_ = auVar294._0_4_ * fVar238 + auVar349._0_4_ * fVar253;
            auVar224._12_4_ = auVar294._4_4_ * fVar239 + auVar349._4_4_ * fVar337;
            auVar243._0_4_ = auVar310._0_4_ * fVar236 + auVar359._0_4_ * fVar251;
            auVar243._4_4_ = auVar310._4_4_ * fVar237 + auVar359._4_4_ * fVar252;
            auVar243._8_4_ = auVar310._0_4_ * fVar238 + auVar359._0_4_ * fVar253;
            auVar243._12_4_ = auVar310._4_4_ * fVar239 + auVar359._4_4_ * fVar337;
            auVar96._0_4_ = auVar94._0_4_ * fVar236 + auVar135._0_4_ * fVar251;
            auVar96._4_4_ = auVar94._4_4_ * fVar237 + auVar135._4_4_ * fVar252;
            auVar96._8_4_ = auVar94._0_4_ * fVar238 + auVar135._0_4_ * fVar253;
            auVar96._12_4_ = auVar94._4_4_ * fVar239 + auVar135._4_4_ * fVar337;
            auVar154._16_16_ = auVar172;
            auVar154._0_16_ = auVar172;
            auVar189._16_16_ = auVar224;
            auVar189._0_16_ = auVar224;
            auVar235._16_16_ = auVar243;
            auVar235._0_16_ = auVar243;
            auVar112 = ZEXT2032(CONCAT416(fVar211,ZEXT416((uint)fVar215)));
            auVar112 = vshufps_avx(auVar112,auVar112,0);
            auVar23 = vsubps_avx(auVar189,auVar154);
            fVar236 = auVar112._0_4_;
            fVar237 = auVar112._4_4_;
            fVar238 = auVar112._8_4_;
            fVar239 = auVar112._12_4_;
            fVar251 = auVar112._16_4_;
            fVar252 = auVar112._20_4_;
            fVar253 = auVar112._24_4_;
            auVar155._0_4_ = auVar172._0_4_ + auVar23._0_4_ * fVar236;
            auVar155._4_4_ = auVar172._4_4_ + auVar23._4_4_ * fVar237;
            auVar155._8_4_ = auVar172._8_4_ + auVar23._8_4_ * fVar238;
            auVar155._12_4_ = auVar172._12_4_ + auVar23._12_4_ * fVar239;
            auVar155._16_4_ = auVar172._0_4_ + auVar23._16_4_ * fVar251;
            auVar155._20_4_ = auVar172._4_4_ + auVar23._20_4_ * fVar252;
            auVar155._24_4_ = auVar172._8_4_ + auVar23._24_4_ * fVar253;
            auVar155._28_4_ = auVar172._12_4_ + auVar23._28_4_;
            auVar112 = vsubps_avx(auVar235,auVar189);
            auVar190._0_4_ = auVar224._0_4_ + auVar112._0_4_ * fVar236;
            auVar190._4_4_ = auVar224._4_4_ + auVar112._4_4_ * fVar237;
            auVar190._8_4_ = auVar224._8_4_ + auVar112._8_4_ * fVar238;
            auVar190._12_4_ = auVar224._12_4_ + auVar112._12_4_ * fVar239;
            auVar190._16_4_ = auVar224._0_4_ + auVar112._16_4_ * fVar251;
            auVar190._20_4_ = auVar224._4_4_ + auVar112._20_4_ * fVar252;
            auVar190._24_4_ = auVar224._8_4_ + auVar112._24_4_ * fVar253;
            auVar190._28_4_ = auVar224._12_4_ + auVar112._28_4_;
            auVar99 = vsubps_avx(auVar96,auVar243);
            auVar116._0_4_ = auVar243._0_4_ + auVar99._0_4_ * fVar236;
            auVar116._4_4_ = auVar243._4_4_ + auVar99._4_4_ * fVar237;
            auVar116._8_4_ = auVar243._8_4_ + auVar99._8_4_ * fVar238;
            auVar116._12_4_ = auVar243._12_4_ + auVar99._12_4_ * fVar239;
            auVar116._16_4_ = auVar243._0_4_ + auVar99._0_4_ * fVar251;
            auVar116._20_4_ = auVar243._4_4_ + auVar99._4_4_ * fVar252;
            auVar116._24_4_ = auVar243._8_4_ + auVar99._8_4_ * fVar253;
            auVar116._28_4_ = auVar243._12_4_ + auVar99._12_4_;
            auVar112 = vsubps_avx(auVar190,auVar155);
            auVar156._0_4_ = auVar155._0_4_ + fVar236 * auVar112._0_4_;
            auVar156._4_4_ = auVar155._4_4_ + fVar237 * auVar112._4_4_;
            auVar156._8_4_ = auVar155._8_4_ + fVar238 * auVar112._8_4_;
            auVar156._12_4_ = auVar155._12_4_ + fVar239 * auVar112._12_4_;
            auVar156._16_4_ = auVar155._16_4_ + fVar251 * auVar112._16_4_;
            auVar156._20_4_ = auVar155._20_4_ + fVar252 * auVar112._20_4_;
            auVar156._24_4_ = auVar155._24_4_ + fVar253 * auVar112._24_4_;
            auVar156._28_4_ = auVar155._28_4_ + auVar112._28_4_;
            auVar112 = vsubps_avx(auVar116,auVar190);
            auVar117._0_4_ = auVar190._0_4_ + fVar236 * auVar112._0_4_;
            auVar117._4_4_ = auVar190._4_4_ + fVar237 * auVar112._4_4_;
            auVar117._8_4_ = auVar190._8_4_ + fVar238 * auVar112._8_4_;
            auVar117._12_4_ = auVar190._12_4_ + fVar239 * auVar112._12_4_;
            auVar117._16_4_ = auVar190._16_4_ + fVar251 * auVar112._16_4_;
            auVar117._20_4_ = auVar190._20_4_ + fVar252 * auVar112._20_4_;
            auVar117._24_4_ = auVar190._24_4_ + fVar253 * auVar112._24_4_;
            auVar117._28_4_ = auVar190._28_4_ + auVar112._28_4_;
            auVar112 = vsubps_avx(auVar117,auVar156);
            auVar256._0_4_ = auVar156._0_4_ + fVar236 * auVar112._0_4_;
            auVar256._4_4_ = auVar156._4_4_ + fVar237 * auVar112._4_4_;
            auVar256._8_4_ = auVar156._8_4_ + fVar238 * auVar112._8_4_;
            auVar256._12_4_ = auVar156._12_4_ + fVar239 * auVar112._12_4_;
            auVar261._16_4_ = auVar156._16_4_ + fVar251 * auVar112._16_4_;
            auVar261._0_16_ = auVar256;
            auVar261._20_4_ = auVar156._20_4_ + fVar252 * auVar112._20_4_;
            auVar261._24_4_ = auVar156._24_4_ + fVar253 * auVar112._24_4_;
            auVar261._28_4_ = auVar156._28_4_ + auVar190._28_4_;
            auVar264 = auVar261._16_16_;
            auVar138 = vshufps_avx(ZEXT416((uint)(fVar213 * 0.33333334)),
                                   ZEXT416((uint)(fVar213 * 0.33333334)),0);
            auVar225._0_4_ = auVar256._0_4_ + auVar138._0_4_ * auVar112._0_4_ * 3.0;
            auVar225._4_4_ = auVar256._4_4_ + auVar138._4_4_ * auVar112._4_4_ * 3.0;
            auVar225._8_4_ = auVar256._8_4_ + auVar138._8_4_ * auVar112._8_4_ * 3.0;
            auVar225._12_4_ = auVar256._12_4_ + auVar138._12_4_ * auVar112._12_4_ * 3.0;
            auVar188 = vshufpd_avx(auVar256,auVar256,3);
            auVar150 = vshufpd_avx(auVar264,auVar264,3);
            auVar99 = vsubps_avx(auVar188,auVar256);
            auVar216 = vsubps_avx(auVar150,auVar264);
            auVar97._0_4_ = auVar99._0_4_ + auVar216._0_4_;
            auVar97._4_4_ = auVar99._4_4_ + auVar216._4_4_;
            auVar97._8_4_ = auVar99._8_4_ + auVar216._8_4_;
            auVar97._12_4_ = auVar99._12_4_ + auVar216._12_4_;
            auVar99 = vmovshdup_avx(auVar256);
            auVar216 = vmovshdup_avx(auVar225);
            auVar174 = vshufps_avx(auVar97,auVar97,0);
            auVar139 = vshufps_avx(auVar97,auVar97,0x55);
            fVar236 = auVar139._0_4_;
            fVar237 = auVar139._4_4_;
            fVar238 = auVar139._8_4_;
            fVar239 = auVar139._12_4_;
            fVar251 = auVar174._0_4_;
            fVar252 = auVar174._4_4_;
            fVar253 = auVar174._8_4_;
            fVar337 = auVar174._12_4_;
            auVar98._0_4_ = fVar251 * auVar256._0_4_ + auVar99._0_4_ * fVar236;
            auVar98._4_4_ = fVar252 * auVar256._4_4_ + auVar99._4_4_ * fVar237;
            auVar98._8_4_ = fVar253 * auVar256._8_4_ + auVar99._8_4_ * fVar238;
            auVar98._12_4_ = fVar337 * auVar256._12_4_ + auVar99._12_4_ * fVar239;
            auVar320._0_4_ = fVar251 * auVar225._0_4_ + auVar216._0_4_ * fVar236;
            auVar320._4_4_ = fVar252 * auVar225._4_4_ + auVar216._4_4_ * fVar237;
            auVar320._8_4_ = fVar253 * auVar225._8_4_ + auVar216._8_4_ * fVar238;
            auVar320._12_4_ = fVar337 * auVar225._12_4_ + auVar216._12_4_ * fVar239;
            auVar216 = vshufps_avx(auVar98,auVar98,0xe8);
            auVar174 = vshufps_avx(auVar320,auVar320,0xe8);
            auVar99 = vcmpps_avx(auVar216,auVar174,1);
            uVar70 = vextractps_avx(auVar99,0);
            auVar139 = auVar320;
            if ((uVar70 & 1) == 0) {
              auVar139 = auVar98;
            }
            auVar137._0_4_ = auVar138._0_4_ * auVar112._16_4_ * 3.0;
            auVar137._4_4_ = auVar138._4_4_ * auVar112._20_4_ * 3.0;
            auVar137._8_4_ = auVar138._8_4_ * auVar112._24_4_ * 3.0;
            auVar137._12_4_ = auVar138._12_4_ * 0.0;
            auVar279 = vsubps_avx(auVar264,auVar137);
            auVar138 = vmovshdup_avx(auVar279);
            auVar264 = vmovshdup_avx(auVar264);
            fVar343 = auVar279._0_4_;
            fVar351 = auVar279._4_4_;
            auVar244._0_4_ = fVar343 * fVar251 + auVar138._0_4_ * fVar236;
            auVar244._4_4_ = fVar351 * fVar252 + auVar138._4_4_ * fVar237;
            auVar244._8_4_ = auVar279._8_4_ * fVar253 + auVar138._8_4_ * fVar238;
            auVar244._12_4_ = auVar279._12_4_ * fVar337 + auVar138._12_4_ * fVar239;
            auVar372._0_4_ = fVar251 * auVar261._16_4_ + auVar264._0_4_ * fVar236;
            auVar372._4_4_ = fVar252 * auVar261._20_4_ + auVar264._4_4_ * fVar237;
            auVar372._8_4_ = fVar253 * auVar261._24_4_ + auVar264._8_4_ * fVar238;
            auVar372._12_4_ = fVar337 * auVar261._28_4_ + auVar264._12_4_ * fVar239;
            auVar264 = vshufps_avx(auVar244,auVar244,0xe8);
            auVar265 = vshufps_avx(auVar372,auVar372,0xe8);
            auVar138 = vcmpps_avx(auVar264,auVar265,1);
            uVar70 = vextractps_avx(auVar138,0);
            auVar280 = auVar372;
            if ((uVar70 & 1) == 0) {
              auVar280 = auVar244;
            }
            auVar139 = vmaxss_avx(auVar280,auVar139);
            auVar216 = vminps_avx(auVar216,auVar174);
            auVar174 = vminps_avx(auVar264,auVar265);
            auVar174 = vminps_avx(auVar216,auVar174);
            auVar99 = vshufps_avx(auVar99,auVar99,0x55);
            auVar99 = vblendps_avx(auVar99,auVar138,2);
            auVar138 = vpslld_avx(auVar99,0x1f);
            auVar99 = vshufpd_avx(auVar320,auVar320,1);
            auVar99 = vinsertps_avx(auVar99,auVar372,0x9c);
            auVar216 = vshufpd_avx(auVar98,auVar98,1);
            auVar216 = vinsertps_avx(auVar216,auVar244,0x9c);
            auVar99 = vblendvps_avx(auVar216,auVar99,auVar138);
            auVar216 = vmovshdup_avx(auVar99);
            auVar99 = vmaxss_avx(auVar216,auVar99);
            fVar238 = auVar174._0_4_;
            auVar216 = vmovshdup_avx(auVar174);
            fVar237 = auVar99._0_4_;
            fVar239 = auVar216._0_4_;
            fVar236 = auVar139._0_4_;
            if ((fVar238 < 0.0001) && (-0.0001 < fVar237)) break;
            if ((fVar239 < 0.0001 && -0.0001 < fVar236) || (fVar238 < 0.0001 && -0.0001 < fVar236))
            break;
            auVar138 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar99,1);
            auVar216 = vcmpps_avx(auVar216,SUB6416(ZEXT464(0x38d1b717),0),1);
            auVar216 = vandps_avx(auVar216,auVar138);
          } while ((auVar216 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
          auVar138 = vcmpps_avx(auVar174,_DAT_01f45a50,1);
          auVar216 = vcmpss_avx(auVar139,ZEXT416(0) << 0x20,1);
          auVar173._8_4_ = 0x3f800000;
          auVar173._0_8_ = 0x3f8000003f800000;
          auVar173._12_4_ = 0x3f800000;
          auVar226._8_4_ = 0xbf800000;
          auVar226._0_8_ = 0xbf800000bf800000;
          auVar226._12_4_ = 0xbf800000;
          auVar216 = vblendvps_avx(auVar173,auVar226,auVar216);
          auVar138 = vblendvps_avx(auVar173,auVar226,auVar138);
          auVar174 = vcmpss_avx(auVar138,auVar216,4);
          auVar174 = vpshufd_avx(ZEXT416(auVar174._0_4_ & 1),0x50);
          auVar174 = vpslld_avx(auVar174,0x1f);
          auVar174 = vpsrad_avx(auVar174,0x1f);
          auVar174 = vpandn_avx(auVar174,_DAT_01f7afb0);
          auVar139 = vmovshdup_avx(auVar138);
          fVar251 = auVar139._0_4_;
          if ((auVar138._0_4_ != fVar251) || (NAN(auVar138._0_4_) || NAN(fVar251))) {
            if ((fVar239 != fVar238) || (NAN(fVar239) || NAN(fVar238))) {
              fVar238 = -fVar238 / (fVar239 - fVar238);
              auVar138 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar238) * 0.0 + fVar238)));
            }
            else {
              auVar138 = ZEXT816(0x3f80000000000000);
              if ((fVar238 != 0.0) || (NAN(fVar238))) {
                auVar138 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar264 = vcmpps_avx(auVar174,auVar138,1);
            auVar139 = vblendps_avx(auVar174,auVar138,2);
            auVar138 = vblendps_avx(auVar138,auVar174,2);
            auVar174 = vblendvps_avx(auVar138,auVar139,auVar264);
          }
          auVar99 = vcmpss_avx(auVar99,ZEXT416(0) << 0x20,1);
          auVar175._8_4_ = 0x3f800000;
          auVar175._0_8_ = 0x3f8000003f800000;
          auVar175._12_4_ = 0x3f800000;
          auVar227._8_4_ = 0xbf800000;
          auVar227._0_8_ = 0xbf800000bf800000;
          auVar227._12_4_ = 0xbf800000;
          auVar99 = vblendvps_avx(auVar175,auVar227,auVar99);
          fVar238 = auVar99._0_4_;
          if ((auVar216._0_4_ != fVar238) || (NAN(auVar216._0_4_) || NAN(fVar238))) {
            if ((fVar237 != fVar236) || (NAN(fVar237) || NAN(fVar236))) {
              fVar236 = -fVar236 / (fVar237 - fVar236);
              auVar99 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar236) * 0.0 + fVar236)));
            }
            else {
              auVar99 = ZEXT816(0x3f80000000000000);
              if ((fVar236 != 0.0) || (NAN(fVar236))) {
                auVar99 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar138 = vcmpps_avx(auVar174,auVar99,1);
            auVar216 = vblendps_avx(auVar174,auVar99,2);
            auVar99 = vblendps_avx(auVar99,auVar174,2);
            auVar174 = vblendvps_avx(auVar99,auVar216,auVar138);
          }
          if ((fVar251 != fVar238) || (NAN(fVar251) || NAN(fVar238))) {
            auVar100._8_4_ = 0x3f800000;
            auVar100._0_8_ = 0x3f8000003f800000;
            auVar100._12_4_ = 0x3f800000;
            auVar99 = vcmpps_avx(auVar174,auVar100,1);
            auVar216 = vinsertps_avx(auVar174,SUB6416(ZEXT464(0x3f800000),0),0x10);
            auVar176._4_12_ = auVar174._4_12_;
            auVar176._0_4_ = 0x3f800000;
            auVar174 = vblendvps_avx(auVar176,auVar216,auVar99);
          }
          auVar99 = vcmpps_avx(auVar174,_DAT_01f46740,1);
          auVar59._12_4_ = 0;
          auVar59._0_12_ = auVar174._4_12_;
          auVar216 = vinsertps_avx(auVar174,ZEXT416(0x3f800000),0x10);
          auVar99 = vblendvps_avx(auVar216,auVar59 << 0x20,auVar99);
          auVar216 = vmovshdup_avx(auVar99);
        } while (auVar216._0_4_ < auVar99._0_4_);
        auVar101._0_4_ = auVar99._0_4_ + -0.1;
        auVar101._4_4_ = auVar99._4_4_ + 0.1;
        auVar101._8_4_ = auVar99._8_4_ + 0.0;
        auVar101._12_4_ = auVar99._12_4_ + 0.0;
        auVar138 = vshufpd_avx(auVar225,auVar225,3);
        auVar257._8_8_ = 0x3f80000000000000;
        auVar257._0_8_ = 0x3f80000000000000;
        auVar99 = vcmpps_avx(auVar101,auVar257,1);
        auVar57._12_4_ = 0;
        auVar57._0_12_ = auVar101._4_12_;
        auVar216 = vinsertps_avx(auVar101,SUB6416(ZEXT464(0x3f800000),0),0x10);
        auVar99 = vblendvps_avx(auVar216,auVar57 << 0x20,auVar99);
        auVar216 = vshufpd_avx(auVar279,auVar279,3);
        auVar174 = vshufps_avx(auVar99,auVar99,0x50);
        auVar258._8_4_ = 0x3f800000;
        auVar258._0_8_ = 0x3f8000003f800000;
        auVar258._12_4_ = 0x3f800000;
        auVar139 = vsubps_avx(auVar258,auVar174);
        local_468 = auVar188._0_4_;
        fStack_464 = auVar188._4_4_;
        fStack_460 = auVar188._8_4_;
        fStack_45c = auVar188._12_4_;
        fVar236 = auVar174._0_4_;
        fVar237 = auVar174._4_4_;
        fVar238 = auVar174._8_4_;
        fVar239 = auVar174._12_4_;
        local_5a8 = auVar150._0_4_;
        fStack_5a4 = auVar150._4_4_;
        fStack_5a0 = auVar150._8_4_;
        fStack_59c = auVar150._12_4_;
        fVar251 = auVar139._0_4_;
        fVar252 = auVar139._4_4_;
        fVar253 = auVar139._8_4_;
        fVar337 = auVar139._12_4_;
        auVar102._0_4_ = fVar236 * local_468 + fVar251 * auVar256._0_4_;
        auVar102._4_4_ = fVar237 * fStack_464 + fVar252 * auVar256._4_4_;
        auVar102._8_4_ = fVar238 * fStack_460 + fVar253 * auVar256._0_4_;
        auVar102._12_4_ = fVar239 * fStack_45c + fVar337 * auVar256._4_4_;
        auVar245._0_4_ = auVar138._0_4_ * fVar236 + fVar251 * auVar225._0_4_;
        auVar245._4_4_ = auVar138._4_4_ * fVar237 + fVar252 * auVar225._4_4_;
        auVar245._8_4_ = auVar138._8_4_ * fVar238 + fVar253 * auVar225._0_4_;
        auVar245._12_4_ = auVar138._12_4_ * fVar239 + fVar337 * auVar225._4_4_;
        auVar276._0_4_ = auVar216._0_4_ * fVar236 + fVar251 * fVar343;
        auVar276._4_4_ = auVar216._4_4_ * fVar237 + fVar252 * fVar351;
        auVar276._8_4_ = auVar216._8_4_ * fVar238 + fVar253 * fVar343;
        auVar276._12_4_ = auVar216._12_4_ * fVar239 + fVar337 * fVar351;
        auVar311._0_4_ = fVar236 * local_5a8 + fVar251 * auVar261._16_4_;
        auVar311._4_4_ = fVar237 * fStack_5a4 + fVar252 * auVar261._20_4_;
        auVar311._8_4_ = fVar238 * fStack_5a0 + fVar253 * auVar261._16_4_;
        auVar311._12_4_ = fVar239 * fStack_59c + fVar337 * auVar261._20_4_;
        auVar150 = vsubps_avx(auVar258,auVar99);
        auVar216 = vmovshdup_avx(auVar319);
        auVar188 = vmovsldup_avx(auVar319);
        auVar259._0_4_ = auVar150._0_4_ * auVar188._0_4_ + auVar99._0_4_ * auVar216._0_4_;
        auVar259._4_4_ = auVar150._4_4_ * auVar188._4_4_ + auVar99._4_4_ * auVar216._4_4_;
        auVar259._8_4_ = auVar150._8_4_ * auVar188._8_4_ + auVar99._8_4_ * auVar216._8_4_;
        auVar259._12_4_ = auVar150._12_4_ * auVar188._12_4_ + auVar99._12_4_ * auVar216._12_4_;
        auVar279 = vmovshdup_avx(auVar259);
        auVar99 = vsubps_avx(auVar245,auVar102);
        auVar177._0_4_ = auVar99._0_4_ * 3.0;
        auVar177._4_4_ = auVar99._4_4_ * 3.0;
        auVar177._8_4_ = auVar99._8_4_ * 3.0;
        auVar177._12_4_ = auVar99._12_4_ * 3.0;
        auVar99 = vsubps_avx(auVar276,auVar245);
        auVar206._0_4_ = auVar99._0_4_ * 3.0;
        auVar206._4_4_ = auVar99._4_4_ * 3.0;
        auVar206._8_4_ = auVar99._8_4_ * 3.0;
        auVar206._12_4_ = auVar99._12_4_ * 3.0;
        auVar99 = vsubps_avx(auVar311,auVar276);
        auVar283._0_4_ = auVar99._0_4_ * 3.0;
        auVar283._4_4_ = auVar99._4_4_ * 3.0;
        auVar283._8_4_ = auVar99._8_4_ * 3.0;
        auVar283._12_4_ = auVar99._12_4_ * 3.0;
        auVar216 = vminps_avx(auVar206,auVar283);
        auVar99 = vmaxps_avx(auVar206,auVar283);
        auVar216 = vminps_avx(auVar177,auVar216);
        auVar99 = vmaxps_avx(auVar177,auVar99);
        auVar188 = vshufpd_avx(auVar216,auVar216,3);
        auVar150 = vshufpd_avx(auVar99,auVar99,3);
        auVar216 = vminps_avx(auVar216,auVar188);
        auVar99 = vmaxps_avx(auVar99,auVar150);
        auVar188 = vshufps_avx(ZEXT416((uint)(1.0 / fVar213)),ZEXT416((uint)(1.0 / fVar213)),0);
        auVar284._0_4_ = auVar188._0_4_ * auVar216._0_4_;
        auVar284._4_4_ = auVar188._4_4_ * auVar216._4_4_;
        auVar284._8_4_ = auVar188._8_4_ * auVar216._8_4_;
        auVar284._12_4_ = auVar188._12_4_ * auVar216._12_4_;
        auVar295._0_4_ = auVar188._0_4_ * auVar99._0_4_;
        auVar295._4_4_ = auVar188._4_4_ * auVar99._4_4_;
        auVar295._8_4_ = auVar188._8_4_ * auVar99._8_4_;
        auVar295._12_4_ = auVar188._12_4_ * auVar99._12_4_;
        auVar139 = ZEXT416((uint)(1.0 / (auVar279._0_4_ - auVar259._0_4_)));
        auVar99 = vshufpd_avx(auVar102,auVar102,3);
        auVar216 = vshufpd_avx(auVar245,auVar245,3);
        auVar188 = vshufpd_avx(auVar276,auVar276,3);
        auVar150 = vshufpd_avx(auVar311,auVar311,3);
        auVar99 = vsubps_avx(auVar99,auVar102);
        auVar138 = vsubps_avx(auVar216,auVar245);
        auVar174 = vsubps_avx(auVar188,auVar276);
        auVar150 = vsubps_avx(auVar150,auVar311);
        auVar216 = vminps_avx(auVar99,auVar138);
        auVar99 = vmaxps_avx(auVar99,auVar138);
        auVar188 = vminps_avx(auVar174,auVar150);
        auVar188 = vminps_avx(auVar216,auVar188);
        auVar216 = vmaxps_avx(auVar174,auVar150);
        auVar99 = vmaxps_avx(auVar99,auVar216);
        auVar216 = vshufps_avx(auVar139,auVar139,0);
        auVar350._0_4_ = auVar216._0_4_ * auVar188._0_4_;
        auVar350._4_4_ = auVar216._4_4_ * auVar188._4_4_;
        auVar350._8_4_ = auVar216._8_4_ * auVar188._8_4_;
        auVar350._12_4_ = auVar216._12_4_ * auVar188._12_4_;
        auVar361._0_4_ = auVar216._0_4_ * auVar99._0_4_;
        auVar361._4_4_ = auVar216._4_4_ * auVar99._4_4_;
        auVar361._8_4_ = auVar216._8_4_ * auVar99._8_4_;
        auVar361._12_4_ = auVar216._12_4_ * auVar99._12_4_;
        auVar99 = vmovsldup_avx(auVar259);
        auVar312._4_12_ = auVar99._4_12_;
        auVar312._0_4_ = fVar215;
        auVar321._4_12_ = auVar259._4_12_;
        auVar321._0_4_ = fVar211;
        auVar207._0_4_ = (fVar215 + fVar211) * 0.5;
        auVar207._4_4_ = (auVar99._4_4_ + auVar259._4_4_) * 0.5;
        auVar207._8_4_ = (auVar99._8_4_ + auVar259._8_4_) * 0.5;
        auVar207._12_4_ = (auVar99._12_4_ + auVar259._12_4_) * 0.5;
        auVar99 = vshufps_avx(auVar207,auVar207,0);
        local_258 = auVar18._0_4_;
        fStack_254 = auVar18._4_4_;
        fStack_250 = auVar18._8_4_;
        fStack_24c = auVar18._12_4_;
        fVar236 = auVar99._0_4_;
        fVar237 = auVar99._4_4_;
        fVar238 = auVar99._8_4_;
        fVar239 = auVar99._12_4_;
        p00.field_0.i[0] = auVar19._0_4_;
        p00.field_0.i[1] = auVar19._4_4_;
        p00.field_0.i[2] = auVar19._8_4_;
        p00.field_0.i[3] = auVar19._12_4_;
        auVar140._0_4_ = fVar236 * local_258 + p00.field_0.v[0];
        auVar140._4_4_ = fVar237 * fStack_254 + p00.field_0.v[1];
        auVar140._8_4_ = fVar238 * fStack_250 + p00.field_0.v[2];
        auVar140._12_4_ = fVar239 * fStack_24c + p00.field_0.v[3];
        local_268 = auVar121._0_4_;
        fStack_264 = auVar121._4_4_;
        fStack_260 = auVar121._8_4_;
        fStack_25c = auVar121._12_4_;
        p01.field_0.i[0] = auVar16._0_4_;
        p01.field_0.i[1] = auVar16._4_4_;
        p01.field_0.i[2] = auVar16._8_4_;
        p01.field_0.i[3] = auVar16._12_4_;
        auVar178._0_4_ = fVar236 * local_268 + p01.field_0.v[0];
        auVar178._4_4_ = fVar237 * fStack_264 + p01.field_0.v[1];
        auVar178._8_4_ = fVar238 * fStack_260 + p01.field_0.v[2];
        auVar178._12_4_ = fVar239 * fStack_25c + p01.field_0.v[3];
        local_278 = auVar120._0_4_;
        fStack_274 = auVar120._4_4_;
        fStack_270 = auVar120._8_4_;
        fStack_26c = auVar120._12_4_;
        p02.field_0.i[0] = auVar202._0_4_;
        p02.field_0.i[1] = auVar202._4_4_;
        p02.field_0.i[2] = auVar202._8_4_;
        p02.field_0.i[3] = auVar202._12_4_;
        auVar246._0_4_ = fVar236 * local_278 + p02.field_0.v[0];
        auVar246._4_4_ = fVar237 * fStack_274 + p02.field_0.v[1];
        auVar246._8_4_ = fVar238 * fStack_270 + p02.field_0.v[2];
        auVar246._12_4_ = fVar239 * fStack_26c + p02.field_0.v[3];
        auVar99 = vsubps_avx(auVar178,auVar140);
        auVar141._0_4_ = auVar140._0_4_ + fVar236 * auVar99._0_4_;
        auVar141._4_4_ = auVar140._4_4_ + fVar237 * auVar99._4_4_;
        auVar141._8_4_ = auVar140._8_4_ + fVar238 * auVar99._8_4_;
        auVar141._12_4_ = auVar140._12_4_ + fVar239 * auVar99._12_4_;
        auVar99 = vsubps_avx(auVar246,auVar178);
        auVar179._0_4_ = auVar178._0_4_ + fVar236 * auVar99._0_4_;
        auVar179._4_4_ = auVar178._4_4_ + fVar237 * auVar99._4_4_;
        auVar179._8_4_ = auVar178._8_4_ + fVar238 * auVar99._8_4_;
        auVar179._12_4_ = auVar178._12_4_ + fVar239 * auVar99._12_4_;
        auVar99 = vsubps_avx(auVar179,auVar141);
        fVar236 = auVar141._0_4_ + fVar236 * auVar99._0_4_;
        fVar237 = auVar141._4_4_ + fVar237 * auVar99._4_4_;
        auVar103._0_8_ = CONCAT44(fVar237,fVar236);
        auVar103._8_4_ = auVar141._8_4_ + fVar238 * auVar99._8_4_;
        auVar103._12_4_ = auVar141._12_4_ + fVar239 * auVar99._12_4_;
        fVar238 = auVar99._0_4_ * 3.0;
        fVar239 = auVar99._4_4_ * 3.0;
        auVar142._0_8_ = CONCAT44(fVar239,fVar238);
        auVar142._8_4_ = auVar99._8_4_ * 3.0;
        auVar142._12_4_ = auVar99._12_4_ * 3.0;
        auVar180._8_8_ = auVar103._0_8_;
        auVar180._0_8_ = auVar103._0_8_;
        auVar99 = vshufpd_avx(auVar103,auVar103,3);
        auVar216 = vshufps_avx(auVar207,auVar207,0x55);
        auVar174 = vsubps_avx(auVar99,auVar180);
        auVar333._0_4_ = auVar174._0_4_ * auVar216._0_4_ + fVar236;
        auVar333._4_4_ = auVar174._4_4_ * auVar216._4_4_ + fVar237;
        auVar333._8_4_ = auVar174._8_4_ * auVar216._8_4_ + fVar236;
        auVar333._12_4_ = auVar174._12_4_ * auVar216._12_4_ + fVar237;
        auVar181._8_8_ = auVar142._0_8_;
        auVar181._0_8_ = auVar142._0_8_;
        auVar99 = vshufpd_avx(auVar142,auVar142,1);
        auVar99 = vsubps_avx(auVar99,auVar181);
        auVar143._0_4_ = auVar99._0_4_ * auVar216._0_4_ + fVar238;
        auVar143._4_4_ = auVar99._4_4_ * auVar216._4_4_ + fVar239;
        auVar143._8_4_ = auVar99._8_4_ * auVar216._8_4_ + fVar238;
        auVar143._12_4_ = auVar99._12_4_ * auVar216._12_4_ + fVar239;
        auVar216 = vmovshdup_avx(auVar143);
        auVar247._0_8_ = auVar216._0_8_ ^ 0x8000000080000000;
        auVar247._8_4_ = auVar216._8_4_ ^ 0x80000000;
        auVar247._12_4_ = auVar216._12_4_ ^ 0x80000000;
        auVar188 = vmovshdup_avx(auVar174);
        auVar99 = vunpcklps_avx(auVar188,auVar247);
        auVar150 = vshufps_avx(auVar99,auVar247,4);
        auVar104._0_8_ = auVar174._0_8_ ^ 0x8000000080000000;
        auVar104._8_4_ = -auVar174._8_4_;
        auVar104._12_4_ = -auVar174._12_4_;
        auVar99 = vmovlhps_avx(auVar104,auVar143);
        auVar138 = vshufps_avx(auVar99,auVar143,8);
        auVar99 = ZEXT416((uint)(auVar143._0_4_ * auVar188._0_4_ - auVar174._0_4_ * auVar216._0_4_))
        ;
        auVar216 = vshufps_avx(auVar99,auVar99,0);
        auVar99 = vdivps_avx(auVar150,auVar216);
        auVar216 = vdivps_avx(auVar138,auVar216);
        auVar138 = vinsertps_avx(auVar284,auVar350,0x1c);
        auVar174 = vinsertps_avx(auVar295,auVar361,0x1c);
        auVar139 = vinsertps_avx(auVar350,auVar284,0x4c);
        auVar264 = vinsertps_avx(auVar361,auVar295,0x4c);
        auVar188 = vmovsldup_avx(auVar99);
        auVar182._0_4_ = auVar188._0_4_ * auVar138._0_4_;
        auVar182._4_4_ = auVar188._4_4_ * auVar138._4_4_;
        auVar182._8_4_ = auVar188._8_4_ * auVar138._8_4_;
        auVar182._12_4_ = auVar188._12_4_ * auVar138._12_4_;
        auVar144._0_4_ = auVar174._0_4_ * auVar188._0_4_;
        auVar144._4_4_ = auVar174._4_4_ * auVar188._4_4_;
        auVar144._8_4_ = auVar174._8_4_ * auVar188._8_4_;
        auVar144._12_4_ = auVar174._12_4_ * auVar188._12_4_;
        auVar150 = vminps_avx(auVar182,auVar144);
        auVar188 = vmaxps_avx(auVar144,auVar182);
        auVar265 = vmovsldup_avx(auVar216);
        auVar362._0_4_ = auVar139._0_4_ * auVar265._0_4_;
        auVar362._4_4_ = auVar139._4_4_ * auVar265._4_4_;
        auVar362._8_4_ = auVar139._8_4_ * auVar265._8_4_;
        auVar362._12_4_ = auVar139._12_4_ * auVar265._12_4_;
        auVar183._0_4_ = auVar264._0_4_ * auVar265._0_4_;
        auVar183._4_4_ = auVar264._4_4_ * auVar265._4_4_;
        auVar183._8_4_ = auVar264._8_4_ * auVar265._8_4_;
        auVar183._12_4_ = auVar264._12_4_ * auVar265._12_4_;
        auVar265 = vminps_avx(auVar362,auVar183);
        auVar228._0_4_ = auVar150._0_4_ + auVar265._0_4_;
        auVar228._4_4_ = auVar150._4_4_ + auVar265._4_4_;
        auVar228._8_4_ = auVar150._8_4_ + auVar265._8_4_;
        auVar228._12_4_ = auVar150._12_4_ + auVar265._12_4_;
        auVar150 = vmaxps_avx(auVar183,auVar362);
        auVar265 = vsubps_avx(auVar312,auVar207);
        auVar280 = vsubps_avx(auVar321,auVar207);
        auVar145._0_4_ = auVar188._0_4_ + auVar150._0_4_;
        auVar145._4_4_ = auVar188._4_4_ + auVar150._4_4_;
        auVar145._8_4_ = auVar188._8_4_ + auVar150._8_4_;
        auVar145._12_4_ = auVar188._12_4_ + auVar150._12_4_;
        auVar184._8_8_ = 0x3f800000;
        auVar184._0_8_ = 0x3f800000;
        auVar188 = vsubps_avx(auVar184,auVar145);
        auVar150 = vsubps_avx(auVar184,auVar228);
        fVar253 = auVar265._0_4_;
        auVar229._0_4_ = fVar253 * auVar188._0_4_;
        fVar337 = auVar265._4_4_;
        auVar229._4_4_ = fVar337 * auVar188._4_4_;
        fVar343 = auVar265._8_4_;
        auVar229._8_4_ = fVar343 * auVar188._8_4_;
        fVar351 = auVar265._12_4_;
        auVar229._12_4_ = fVar351 * auVar188._12_4_;
        fVar238 = auVar280._0_4_;
        auVar146._0_4_ = fVar238 * auVar188._0_4_;
        fVar239 = auVar280._4_4_;
        auVar146._4_4_ = fVar239 * auVar188._4_4_;
        fVar251 = auVar280._8_4_;
        auVar146._8_4_ = fVar251 * auVar188._8_4_;
        fVar252 = auVar280._12_4_;
        auVar146._12_4_ = fVar252 * auVar188._12_4_;
        auVar322._0_4_ = fVar253 * auVar150._0_4_;
        auVar322._4_4_ = fVar337 * auVar150._4_4_;
        auVar322._8_4_ = fVar343 * auVar150._8_4_;
        auVar322._12_4_ = fVar351 * auVar150._12_4_;
        auVar185._0_4_ = fVar238 * auVar150._0_4_;
        auVar185._4_4_ = fVar239 * auVar150._4_4_;
        auVar185._8_4_ = fVar251 * auVar150._8_4_;
        auVar185._12_4_ = fVar252 * auVar150._12_4_;
        auVar188 = vminps_avx(auVar229,auVar322);
        auVar150 = vminps_avx(auVar146,auVar185);
        auVar265 = vminps_avx(auVar188,auVar150);
        auVar188 = vmaxps_avx(auVar322,auVar229);
        auVar150 = vmaxps_avx(auVar185,auVar146);
        auVar280 = vshufps_avx(auVar207,auVar207,0x54);
        auVar150 = vmaxps_avx(auVar150,auVar188);
        auVar290 = vshufps_avx(auVar333,auVar333,0);
        auVar291 = vshufps_avx(auVar333,auVar333,0x55);
        auVar188 = vhaddps_avx(auVar265,auVar265);
        auVar150 = vhaddps_avx(auVar150,auVar150);
        auVar208._0_4_ = auVar290._0_4_ * auVar99._0_4_ + auVar291._0_4_ * auVar216._0_4_;
        auVar208._4_4_ = auVar290._4_4_ * auVar99._4_4_ + auVar291._4_4_ * auVar216._4_4_;
        auVar208._8_4_ = auVar290._8_4_ * auVar99._8_4_ + auVar291._8_4_ * auVar216._8_4_;
        auVar208._12_4_ = auVar290._12_4_ * auVar99._12_4_ + auVar291._12_4_ * auVar216._12_4_;
        auVar265 = vsubps_avx(auVar280,auVar208);
        fVar236 = auVar265._0_4_ + auVar188._0_4_;
        fVar237 = auVar265._0_4_ + auVar150._0_4_;
        auVar188 = vmaxss_avx(ZEXT416((uint)fVar215),ZEXT416((uint)fVar236));
        auVar150 = vminss_avx(ZEXT416((uint)fVar237),ZEXT416((uint)fVar211));
      } while (auVar150._0_4_ < auVar188._0_4_);
      auVar188 = vmovshdup_avx(auVar99);
      auVar105._0_4_ = auVar188._0_4_ * auVar138._0_4_;
      auVar105._4_4_ = auVar188._4_4_ * auVar138._4_4_;
      auVar105._8_4_ = auVar188._8_4_ * auVar138._8_4_;
      auVar105._12_4_ = auVar188._12_4_ * auVar138._12_4_;
      auVar147._0_4_ = auVar174._0_4_ * auVar188._0_4_;
      auVar147._4_4_ = auVar174._4_4_ * auVar188._4_4_;
      auVar147._8_4_ = auVar174._8_4_ * auVar188._8_4_;
      auVar147._12_4_ = auVar174._12_4_ * auVar188._12_4_;
      auVar150 = vminps_avx(auVar105,auVar147);
      auVar188 = vmaxps_avx(auVar147,auVar105);
      auVar138 = vmovshdup_avx(auVar216);
      auVar230._0_4_ = auVar139._0_4_ * auVar138._0_4_;
      auVar230._4_4_ = auVar139._4_4_ * auVar138._4_4_;
      auVar230._8_4_ = auVar139._8_4_ * auVar138._8_4_;
      auVar230._12_4_ = auVar139._12_4_ * auVar138._12_4_;
      auVar148._0_4_ = auVar264._0_4_ * auVar138._0_4_;
      auVar148._4_4_ = auVar264._4_4_ * auVar138._4_4_;
      auVar148._8_4_ = auVar264._8_4_ * auVar138._8_4_;
      auVar148._12_4_ = auVar264._12_4_ * auVar138._12_4_;
      auVar138 = vminps_avx(auVar230,auVar148);
      auVar186._0_4_ = auVar150._0_4_ + auVar138._0_4_;
      auVar186._4_4_ = auVar150._4_4_ + auVar138._4_4_;
      auVar186._8_4_ = auVar150._8_4_ + auVar138._8_4_;
      auVar186._12_4_ = auVar150._12_4_ + auVar138._12_4_;
      auVar150 = vmaxps_avx(auVar148,auVar230);
      auVar106._0_4_ = auVar188._0_4_ + auVar150._0_4_;
      auVar106._4_4_ = auVar188._4_4_ + auVar150._4_4_;
      auVar106._8_4_ = auVar188._8_4_ + auVar150._8_4_;
      auVar106._12_4_ = auVar188._12_4_ + auVar150._12_4_;
      auVar188 = vsubps_avx(auVar257,auVar106);
      auVar150 = vsubps_avx(auVar257,auVar186);
      auVar187._0_4_ = fVar253 * auVar188._0_4_;
      auVar187._4_4_ = fVar337 * auVar188._4_4_;
      auVar187._8_4_ = fVar343 * auVar188._8_4_;
      auVar187._12_4_ = fVar351 * auVar188._12_4_;
      auVar231._0_4_ = fVar253 * auVar150._0_4_;
      auVar231._4_4_ = fVar337 * auVar150._4_4_;
      auVar231._8_4_ = fVar343 * auVar150._8_4_;
      auVar231._12_4_ = fVar351 * auVar150._12_4_;
      auVar107._0_4_ = fVar238 * auVar188._0_4_;
      auVar107._4_4_ = fVar239 * auVar188._4_4_;
      auVar107._8_4_ = fVar251 * auVar188._8_4_;
      auVar107._12_4_ = fVar252 * auVar188._12_4_;
      auVar149._0_4_ = fVar238 * auVar150._0_4_;
      auVar149._4_4_ = fVar239 * auVar150._4_4_;
      auVar149._8_4_ = fVar251 * auVar150._8_4_;
      auVar149._12_4_ = fVar252 * auVar150._12_4_;
      auVar188 = vminps_avx(auVar187,auVar231);
      auVar150 = vminps_avx(auVar107,auVar149);
      auVar188 = vminps_avx(auVar188,auVar150);
      auVar150 = vmaxps_avx(auVar231,auVar187);
      auVar138 = vmaxps_avx(auVar149,auVar107);
      auVar188 = vhaddps_avx(auVar188,auVar188);
      auVar150 = vmaxps_avx(auVar138,auVar150);
      auVar150 = vhaddps_avx(auVar150,auVar150);
      auVar138 = vmovshdup_avx(auVar265);
      auVar174 = ZEXT416((uint)(auVar138._0_4_ + auVar188._0_4_));
      auVar188 = vmaxss_avx(auVar259,auVar174);
      auVar138 = ZEXT416((uint)(auVar138._0_4_ + auVar150._0_4_));
      auVar150 = vminss_avx(auVar138,auVar279);
    } while (auVar150._0_4_ < auVar188._0_4_);
    bVar76 = 0;
    if ((fVar215 < fVar236) && (fVar237 < fVar211)) {
      auVar188 = vcmpps_avx(auVar138,auVar279,1);
      auVar150 = vcmpps_avx(auVar259,auVar174,1);
      auVar188 = vandps_avx(auVar150,auVar188);
      bVar76 = auVar188[0];
    }
    auVar285._8_4_ = 0x7fffffff;
    auVar285._0_8_ = 0x7fffffff7fffffff;
    auVar285._12_4_ = 0x7fffffff;
    p03.field_0.i[0] = auVar126._0_4_;
    p03.field_0.i[1] = auVar126._4_4_;
    p03.field_0.i[2] = auVar126._8_4_;
    p03.field_0.i[3] = auVar126._12_4_;
    if ((3 < (uint)uVar72 || fVar213 < 0.001) || (bVar76 & 1) != 0) {
      lVar74 = 0xc9;
      do {
        lVar74 = lVar74 + -1;
        if (lVar74 == 0) goto LAB_00918539;
        fVar213 = auVar265._0_4_;
        fVar211 = 1.0 - fVar213;
        auVar188 = ZEXT416((uint)(fVar211 * fVar211 * fVar211));
        auVar188 = vshufps_avx(auVar188,auVar188,0);
        auVar150 = ZEXT416((uint)(fVar213 * 3.0 * fVar211 * fVar211));
        auVar150 = vshufps_avx(auVar150,auVar150,0);
        auVar138 = ZEXT416((uint)(fVar211 * fVar213 * fVar213 * 3.0));
        auVar138 = vshufps_avx(auVar138,auVar138,0);
        auVar174 = ZEXT416((uint)(fVar213 * fVar213 * fVar213));
        auVar174 = vshufps_avx(auVar174,auVar174,0);
        fVar211 = p00.field_0.v[0] * auVar188._0_4_ +
                  p01.field_0.v[0] * auVar150._0_4_ +
                  p03.field_0.v[0] * auVar174._0_4_ + p02.field_0.v[0] * auVar138._0_4_;
        fVar213 = p00.field_0.v[1] * auVar188._4_4_ +
                  p01.field_0.v[1] * auVar150._4_4_ +
                  p03.field_0.v[1] * auVar174._4_4_ + p02.field_0.v[1] * auVar138._4_4_;
        auVar108._0_8_ = CONCAT44(fVar213,fVar211);
        auVar108._8_4_ =
             p00.field_0.v[2] * auVar188._8_4_ +
             p01.field_0.v[2] * auVar150._8_4_ +
             p03.field_0.v[2] * auVar174._8_4_ + p02.field_0.v[2] * auVar138._8_4_;
        auVar108._12_4_ =
             p00.field_0.v[3] * auVar188._12_4_ +
             p01.field_0.v[3] * auVar150._12_4_ +
             p03.field_0.v[3] * auVar174._12_4_ + p02.field_0.v[3] * auVar138._12_4_;
        auVar151._8_8_ = auVar108._0_8_;
        auVar151._0_8_ = auVar108._0_8_;
        auVar150 = vshufpd_avx(auVar108,auVar108,1);
        auVar188 = vmovshdup_avx(auVar265);
        auVar150 = vsubps_avx(auVar150,auVar151);
        auVar109._0_4_ = auVar188._0_4_ * auVar150._0_4_ + fVar211;
        auVar109._4_4_ = auVar188._4_4_ * auVar150._4_4_ + fVar213;
        auVar109._8_4_ = auVar188._8_4_ * auVar150._8_4_ + fVar211;
        auVar109._12_4_ = auVar188._12_4_ * auVar150._12_4_ + fVar213;
        auVar188 = vshufps_avx(auVar109,auVar109,0);
        auVar150 = vshufps_avx(auVar109,auVar109,0x55);
        auVar152._0_4_ = auVar99._0_4_ * auVar188._0_4_ + auVar216._0_4_ * auVar150._0_4_;
        auVar152._4_4_ = auVar99._4_4_ * auVar188._4_4_ + auVar216._4_4_ * auVar150._4_4_;
        auVar152._8_4_ = auVar99._8_4_ * auVar188._8_4_ + auVar216._8_4_ * auVar150._8_4_;
        auVar152._12_4_ = auVar99._12_4_ * auVar188._12_4_ + auVar216._12_4_ * auVar150._12_4_;
        auVar265 = vsubps_avx(auVar265,auVar152);
        auVar188 = vandps_avx(auVar285,auVar109);
        auVar150 = vshufps_avx(auVar188,auVar188,0xf5);
        auVar188 = vmaxss_avx(auVar150,auVar188);
      } while (fVar210 <= auVar188._0_4_);
      fVar211 = auVar265._0_4_;
      if ((0.0 <= fVar211) && (fVar211 <= 1.0)) {
        auVar99 = vmovshdup_avx(auVar265);
        fVar213 = auVar99._0_4_;
        if ((0.0 <= fVar213) && (fVar213 <= 1.0)) {
          auVar99 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                  ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
          auVar264 = vinsertps_avx(auVar99,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28)
          ;
          auVar99 = vdpps_avx(auVar264,auVar289,0x7f);
          auVar216 = vdpps_avx(auVar264,auVar20,0x7f);
          auVar188 = vdpps_avx(auVar264,auVar17,0x7f);
          auVar150 = vdpps_avx(auVar264,auVar88,0x7f);
          auVar138 = vdpps_avx(auVar264,auVar268,0x7f);
          auVar174 = vdpps_avx(auVar264,auVar78,0x7f);
          auVar139 = vdpps_avx(auVar264,auVar79,0x7f);
          auVar264 = vdpps_avx(auVar264,auVar80,0x7f);
          fVar239 = 1.0 - fVar213;
          fVar251 = 1.0 - fVar211;
          fVar215 = auVar265._4_4_;
          fVar236 = auVar265._8_4_;
          fVar237 = auVar265._12_4_;
          fVar238 = fVar251 * fVar211 * fVar211 * 3.0;
          auVar277._0_4_ = fVar211 * fVar211 * fVar211;
          auVar277._4_4_ = fVar215 * fVar215 * fVar215;
          auVar277._8_4_ = fVar236 * fVar236 * fVar236;
          auVar277._12_4_ = fVar237 * fVar237 * fVar237;
          fVar236 = fVar251 * fVar251 * fVar211 * 3.0;
          fVar237 = fVar251 * fVar251 * fVar251;
          fVar215 = fVar237 * (fVar239 * auVar99._0_4_ + fVar213 * auVar138._0_4_) +
                    (fVar239 * auVar216._0_4_ + auVar174._0_4_ * fVar213) * fVar236 +
                    fVar238 * (auVar139._0_4_ * fVar213 + fVar239 * auVar188._0_4_) +
                    auVar277._0_4_ * (fVar239 * auVar150._0_4_ + fVar213 * auVar264._0_4_);
          auVar99 = ZEXT416((uint)fVar215);
          if (((fVar191 <= fVar215) &&
              (fVar239 = *(float *)(ray + k * 4 + 0x80), fVar215 <= fVar239)) &&
             (pGVar8 = (context->scene->geometries).items[uVar71].ptr,
             (pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) != 0)) {
            local_1e8 = vshufps_avx(auVar265,auVar265,0x55);
            auVar296._8_4_ = 0x3f800000;
            auVar296._0_8_ = 0x3f8000003f800000;
            auVar296._12_4_ = 0x3f800000;
            auVar216 = vsubps_avx(auVar296,local_1e8);
            fVar252 = local_1e8._0_4_;
            fVar253 = local_1e8._4_4_;
            fVar337 = local_1e8._8_4_;
            fVar343 = local_1e8._12_4_;
            fVar351 = auVar216._0_4_;
            fVar352 = auVar216._4_4_;
            fVar353 = auVar216._8_4_;
            fVar355 = auVar216._12_4_;
            auVar313._0_4_ = fVar252 * fVar316 + fVar351 * auVar309._0_4_;
            auVar313._4_4_ = fVar253 * fVar212 + fVar352 * auVar309._4_4_;
            auVar313._8_4_ = fVar337 * fVar287 + fVar353 * auVar309._8_4_;
            auVar313._12_4_ = fVar343 * fVar329 + fVar355 * auVar309._12_4_;
            auVar323._0_4_ = fVar252 * auVar332._0_4_ + fVar351 * fVar315;
            auVar323._4_4_ = fVar253 * auVar332._4_4_ + fVar352 * fVar328;
            auVar323._8_4_ = fVar337 * auVar332._8_4_ + fVar353 * fVar263;
            auVar323._12_4_ = fVar343 * auVar332._12_4_ + fVar355 * fVar300;
            auVar334._0_4_ = fVar252 * fVar326 + fVar351 * auVar318._0_4_;
            auVar334._4_4_ = fVar253 * fVar262 + fVar352 * auVar318._4_4_;
            auVar334._8_4_ = fVar337 * fVar118 + fVar353 * auVar318._8_4_;
            auVar334._12_4_ = fVar343 * fVar335 + fVar355 * auVar318._12_4_;
            auVar297._0_4_ = fVar252 * fVar327 + fVar351 * auVar371._0_4_;
            auVar297._4_4_ = fVar253 * fVar214 + fVar352 * auVar371._4_4_;
            auVar297._8_4_ = fVar337 * fVar119 + fVar353 * auVar371._8_4_;
            auVar297._12_4_ = fVar343 * fVar336 + fVar355 * auVar371._12_4_;
            auVar138 = vsubps_avx(auVar323,auVar313);
            auVar174 = vsubps_avx(auVar334,auVar323);
            auVar139 = vsubps_avx(auVar297,auVar334);
            local_1f8 = vshufps_avx(auVar265,auVar265,0);
            fVar343 = local_1f8._0_4_;
            fVar351 = local_1f8._4_4_;
            fVar352 = local_1f8._8_4_;
            fVar353 = local_1f8._12_4_;
            auVar216 = vshufps_avx(ZEXT416((uint)fVar251),ZEXT416((uint)fVar251),0);
            fVar251 = auVar216._0_4_;
            fVar252 = auVar216._4_4_;
            fVar253 = auVar216._8_4_;
            fVar337 = auVar216._12_4_;
            auVar216 = vshufps_avx(auVar277,auVar277,0);
            local_368 = auVar192._0_4_;
            fStack_364 = auVar192._4_4_;
            fStack_360 = auVar192._8_4_;
            fStack_35c = auVar192._12_4_;
            auVar188 = vshufps_avx(ZEXT416((uint)fVar238),ZEXT416((uint)fVar238),0);
            local_358 = auVar159._0_4_;
            fStack_354 = auVar159._4_4_;
            fStack_350 = auVar159._8_4_;
            fStack_34c = auVar159._12_4_;
            auVar150 = vshufps_avx(ZEXT416((uint)fVar236),ZEXT416((uint)fVar236),0);
            local_348 = auVar158._0_4_;
            fStack_344 = auVar158._4_4_;
            fStack_340 = auVar158._8_4_;
            fStack_33c = auVar158._12_4_;
            auVar260._0_4_ =
                 (fVar251 * (fVar251 * auVar138._0_4_ + fVar343 * auVar174._0_4_) +
                 fVar343 * (fVar251 * auVar174._0_4_ + fVar343 * auVar139._0_4_)) * 3.0;
            auVar260._4_4_ =
                 (fVar252 * (fVar252 * auVar138._4_4_ + fVar351 * auVar174._4_4_) +
                 fVar351 * (fVar252 * auVar174._4_4_ + fVar351 * auVar139._4_4_)) * 3.0;
            auVar260._8_4_ =
                 (fVar253 * (fVar253 * auVar138._8_4_ + fVar352 * auVar174._8_4_) +
                 fVar352 * (fVar253 * auVar174._8_4_ + fVar352 * auVar139._8_4_)) * 3.0;
            auVar260._12_4_ =
                 (fVar337 * (fVar337 * auVar138._12_4_ + fVar353 * auVar174._12_4_) +
                 fVar353 * (fVar337 * auVar174._12_4_ + fVar353 * auVar139._12_4_)) * 3.0;
            auVar138 = vshufps_avx(ZEXT416((uint)fVar237),ZEXT416((uint)fVar237),0);
            local_338 = auVar157._0_4_;
            fStack_334 = auVar157._4_4_;
            fStack_330 = auVar157._8_4_;
            fStack_32c = auVar157._12_4_;
            auVar232._0_4_ =
                 auVar138._0_4_ * local_338 +
                 auVar150._0_4_ * local_348 +
                 auVar216._0_4_ * local_368 + auVar188._0_4_ * local_358;
            auVar232._4_4_ =
                 auVar138._4_4_ * fStack_334 +
                 auVar150._4_4_ * fStack_344 +
                 auVar216._4_4_ * fStack_364 + auVar188._4_4_ * fStack_354;
            auVar232._8_4_ =
                 auVar138._8_4_ * fStack_330 +
                 auVar150._8_4_ * fStack_340 +
                 auVar216._8_4_ * fStack_360 + auVar188._8_4_ * fStack_350;
            auVar232._12_4_ =
                 auVar138._12_4_ * fStack_32c +
                 auVar150._12_4_ * fStack_33c +
                 auVar216._12_4_ * fStack_35c + auVar188._12_4_ * fStack_34c;
            auVar216 = vshufps_avx(auVar260,auVar260,0xc9);
            auVar248._0_4_ = auVar232._0_4_ * auVar216._0_4_;
            auVar248._4_4_ = auVar232._4_4_ * auVar216._4_4_;
            auVar248._8_4_ = auVar232._8_4_ * auVar216._8_4_;
            auVar248._12_4_ = auVar232._12_4_ * auVar216._12_4_;
            auVar216 = vshufps_avx(auVar232,auVar232,0xc9);
            auVar233._0_4_ = auVar260._0_4_ * auVar216._0_4_;
            auVar233._4_4_ = auVar260._4_4_ * auVar216._4_4_;
            auVar233._8_4_ = auVar260._8_4_ * auVar216._8_4_;
            auVar233._12_4_ = auVar260._12_4_ * auVar216._12_4_;
            auVar216 = vsubps_avx(auVar233,auVar248);
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              *(float *)(ray + k * 4 + 0x80) = fVar215;
              uVar4 = vextractps_avx(auVar216,1);
              *(undefined4 *)(ray + k * 4 + 0xc0) = uVar4;
              uVar4 = vextractps_avx(auVar216,2);
              *(undefined4 *)(ray + k * 4 + 0xd0) = uVar4;
              *(int *)(ray + k * 4 + 0xe0) = auVar216._0_4_;
              *(float *)(ray + k * 4 + 0xf0) = fVar211;
              *(float *)(ray + k * 4 + 0x100) = fVar213;
              *(uint *)(ray + k * 4 + 0x110) = uVar7;
              *(uint *)(ray + k * 4 + 0x120) = uVar71;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
            }
            else {
              auVar188 = vshufps_avx(auVar216,auVar216,0x55);
              auVar150 = vshufps_avx(auVar216,auVar216,0xaa);
              local_208 = vshufps_avx(auVar216,auVar216,0);
              local_228[0] = (RTCHitN)auVar188[0];
              local_228[1] = (RTCHitN)auVar188[1];
              local_228[2] = (RTCHitN)auVar188[2];
              local_228[3] = (RTCHitN)auVar188[3];
              local_228[4] = (RTCHitN)auVar188[4];
              local_228[5] = (RTCHitN)auVar188[5];
              local_228[6] = (RTCHitN)auVar188[6];
              local_228[7] = (RTCHitN)auVar188[7];
              local_228[8] = (RTCHitN)auVar188[8];
              local_228[9] = (RTCHitN)auVar188[9];
              local_228[10] = (RTCHitN)auVar188[10];
              local_228[0xb] = (RTCHitN)auVar188[0xb];
              local_228[0xc] = (RTCHitN)auVar188[0xc];
              local_228[0xd] = (RTCHitN)auVar188[0xd];
              local_228[0xe] = (RTCHitN)auVar188[0xe];
              local_228[0xf] = (RTCHitN)auVar188[0xf];
              local_218 = auVar150;
              local_398 = auVar125._0_8_;
              uStack_390 = auVar125._8_8_;
              local_1d8 = local_398;
              uStack_1d0 = uStack_390;
              local_1c8 = auVar89;
              vcmpps_avx(ZEXT1632(auVar89),ZEXT1632(auVar89),0xf);
              uStack_1b4 = context->user->instID[0];
              local_1b8 = uStack_1b4;
              uStack_1b0 = uStack_1b4;
              uStack_1ac = uStack_1b4;
              uStack_1a8 = context->user->instPrimID[0];
              uStack_1a4 = uStack_1a8;
              uStack_1a0 = uStack_1a8;
              uStack_19c = uStack_1a8;
              *(float *)(ray + k * 4 + 0x80) = fVar215;
              local_448 = *local_438;
              args.valid = (int *)local_448;
              args.geometryUserPtr = pGVar8->userPtr;
              args.context = context->user;
              args.hit = local_228;
              args.N = 4;
              args.ray = (RTCRayN *)ray;
              if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar8->intersectionFilterN)(&args);
                auVar325._8_56_ = extraout_var;
                auVar325._0_8_ = extraout_XMM1_Qa;
                auVar99 = auVar325._0_16_;
              }
              if (local_448 == (undefined1  [16])0x0) {
                auVar216 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                auVar99 = vpcmpeqd_avx(auVar99,auVar99);
                auVar216 = auVar216 ^ auVar99;
              }
              else {
                p_Var11 = context->args->filter;
                auVar99 = vpcmpeqd_avx(auVar150,auVar150);
                if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar8->field_8).field_0x2 & 0x40) != 0))))
                {
                  (*p_Var11)(&args);
                  auVar99 = vpcmpeqd_avx(auVar99,auVar99);
                }
                auVar188 = vpcmpeqd_avx(local_448,_DAT_01f45a50);
                auVar216 = auVar188 ^ auVar99;
                if (local_448 != (undefined1  [16])0x0) {
                  auVar188 = auVar188 ^ auVar99;
                  auVar99 = vmaskmovps_avx(auVar188,*(undefined1 (*) [16])args.hit);
                  *(undefined1 (*) [16])(args.ray + 0xc0) = auVar99;
                  auVar99 = vmaskmovps_avx(auVar188,*(undefined1 (*) [16])(args.hit + 0x10));
                  *(undefined1 (*) [16])(args.ray + 0xd0) = auVar99;
                  auVar99 = vmaskmovps_avx(auVar188,*(undefined1 (*) [16])(args.hit + 0x20));
                  *(undefined1 (*) [16])(args.ray + 0xe0) = auVar99;
                  auVar99 = vmaskmovps_avx(auVar188,*(undefined1 (*) [16])(args.hit + 0x30));
                  *(undefined1 (*) [16])(args.ray + 0xf0) = auVar99;
                  auVar99 = vmaskmovps_avx(auVar188,*(undefined1 (*) [16])(args.hit + 0x40));
                  *(undefined1 (*) [16])(args.ray + 0x100) = auVar99;
                  auVar99 = vmaskmovps_avx(auVar188,*(undefined1 (*) [16])(args.hit + 0x50));
                  *(undefined1 (*) [16])(args.ray + 0x110) = auVar99;
                  auVar99 = vmaskmovps_avx(auVar188,*(undefined1 (*) [16])(args.hit + 0x60));
                  *(undefined1 (*) [16])(args.ray + 0x120) = auVar99;
                  auVar99 = vmaskmovps_avx(auVar188,*(undefined1 (*) [16])(args.hit + 0x70));
                  *(undefined1 (*) [16])(args.ray + 0x130) = auVar99;
                  auVar99 = vmaskmovps_avx(auVar188,*(undefined1 (*) [16])(args.hit + 0x80));
                  *(undefined1 (*) [16])(args.ray + 0x140) = auVar99;
                }
              }
              auVar110._8_8_ = 0x100000001;
              auVar110._0_8_ = 0x100000001;
              if ((auVar110 & auVar216) == (undefined1  [16])0x0) {
                *(float *)(ray + k * 4 + 0x80) = fVar239;
              }
            }
          }
        }
      }
      goto LAB_00918539;
    }
    auVar99 = vinsertps_avx(ZEXT416((uint)fVar215),ZEXT416((uint)fVar211),0x10);
    auVar373 = ZEXT1664(auVar99);
    auVar325 = ZEXT1664(auVar259);
  } while( true );
}

Assistant:

static __forceinline void intersect_hn(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedHermiteCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }